

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx::CurveNiMBIntersectorK<4,4>::
     intersect_t<embree::avx::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,4,8>,embree::avx::Intersect1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  undefined1 (*pauVar7) [28];
  undefined1 (*pauVar8) [28];
  Primitive PVar9;
  undefined4 uVar10;
  Geometry *pGVar11;
  __int_type_conflict _Var12;
  long lVar13;
  RTCFilterFunctionN p_Var14;
  uint uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [16];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [28];
  undefined1 auVar125 [28];
  undefined1 auVar126 [28];
  undefined1 auVar127 [28];
  undefined1 auVar128 [24];
  uint uVar129;
  uint uVar130;
  ulong uVar131;
  uint uVar132;
  ulong uVar133;
  long lVar134;
  long lVar135;
  uint uVar136;
  long lVar137;
  undefined4 uVar138;
  undefined8 unaff_R13;
  undefined1 auVar139 [8];
  float fVar140;
  float fVar159;
  float fVar161;
  vint4 ai;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  float fVar141;
  undefined1 auVar147 [16];
  float fVar164;
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  float fVar160;
  float fVar162;
  float fVar163;
  float fVar165;
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  float fVar166;
  float fVar180;
  float fVar181;
  float fVar183;
  undefined1 auVar168 [16];
  float fVar167;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  float fVar182;
  float fVar184;
  float fVar185;
  float fVar186;
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [64];
  float fVar187;
  float fVar201;
  float fVar203;
  vint4 bi_2;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  float fVar188;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  float fVar202;
  float fVar204;
  float fVar205;
  float fVar206;
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  float fVar219;
  vint4 bi;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar210 [16];
  float fVar221;
  float fVar222;
  float fVar225;
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  float fVar220;
  float fVar223;
  float fVar226;
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  float fVar224;
  undefined1 auVar218 [32];
  float fVar227;
  float fVar240;
  float fVar241;
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [32];
  float fVar242;
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  float fVar243;
  undefined1 auVar238 [32];
  undefined1 auVar239 [64];
  vint4 ai_1;
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  vint4 bi_1;
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  float fVar256;
  undefined1 auVar255 [32];
  float fVar257;
  float fVar258;
  float fVar259;
  float fVar265;
  float fVar267;
  float fVar268;
  vint4 ai_2;
  undefined1 auVar260 [16];
  float fVar270;
  undefined1 auVar261 [16];
  float fVar266;
  float fVar272;
  float fVar273;
  float fVar274;
  float fVar275;
  float fVar276;
  float fVar277;
  float fVar278;
  undefined1 auVar263 [32];
  float fVar269;
  float fVar271;
  float fVar279;
  undefined1 auVar264 [32];
  float fVar280;
  float fVar288;
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  float fVar292;
  float fVar295;
  undefined1 auVar284 [32];
  float fVar289;
  float fVar291;
  float fVar293;
  undefined1 auVar285 [32];
  float fVar281;
  float fVar290;
  float fVar294;
  float fVar296;
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  float fVar297;
  float fVar298;
  float fVar299;
  float fVar300;
  float fVar307;
  float fVar310;
  float fVar312;
  undefined1 auVar301 [16];
  float fVar313;
  undefined1 auVar302 [16];
  float fVar308;
  float fVar309;
  float fVar311;
  float fVar314;
  float fVar315;
  float fVar316;
  float fVar317;
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  undefined1 auVar318 [16];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar322 [64];
  float fVar323;
  float fVar330;
  float fVar331;
  float fVar332;
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  float fVar333;
  float fVar334;
  float fVar335;
  float fVar336;
  float fVar337;
  float fVar338;
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  float fVar339;
  float fVar349;
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar344 [32];
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  float fVar350;
  float fVar353;
  float fVar354;
  undefined1 auVar351 [16];
  float fVar355;
  undefined1 auVar352 [32];
  float fVar356;
  float fVar357;
  float fVar360;
  float fVar361;
  float fVar362;
  float fVar363;
  float fVar364;
  float fVar365;
  undefined1 auVar359 [32];
  float fVar366;
  float fVar367;
  float fVar371;
  float fVar372;
  float fVar373;
  float fVar374;
  undefined1 auVar369 [32];
  undefined1 auVar370 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined8 uStack_838;
  undefined1 local_830 [16];
  uint local_820;
  undefined4 uStack_81c;
  undefined4 uStack_818;
  undefined4 uStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  undefined1 local_780 [8];
  undefined8 uStack_778;
  undefined1 local_770 [8];
  undefined8 uStack_768;
  undefined1 local_760 [8];
  undefined8 uStack_758;
  RTCFilterFunctionNArguments local_750;
  undefined1 local_720 [8];
  undefined1 auStack_718 [8];
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [16];
  undefined1 auStack_6f0 [16];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  ulong local_6a0;
  undefined8 uStack_698;
  undefined1 (*local_690) [16];
  Precalculations *local_688;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  undefined1 auStack_670 [8];
  float fStack_668;
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  undefined1 auStack_5f0 [8];
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5d0 [16];
  undefined1 local_5c0 [32];
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  LinearSpace3fa *local_530;
  Primitive *local_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined1 local_500 [32];
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  float local_480;
  float fStack_47c;
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  RTCHitN local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  undefined4 local_3b0;
  undefined4 uStack_3ac;
  undefined4 uStack_3a8;
  undefined4 uStack_3a4;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined1 local_390 [16];
  uint local_380;
  uint uStack_37c;
  uint uStack_378;
  uint uStack_374;
  uint uStack_370;
  uint uStack_36c;
  uint uStack_368;
  uint uStack_364;
  undefined1 local_360 [8];
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined1 local_340 [8];
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [32];
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  undefined1 local_260 [32];
  uint local_240;
  uint local_23c;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined1 local_180 [32];
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [8];
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  undefined1 auVar262 [16];
  undefined1 auVar343 [16];
  undefined1 auVar348 [64];
  undefined1 auVar358 [16];
  undefined1 auVar368 [16];
  
  PVar9 = prim[1];
  uVar131 = (ulong)(byte)PVar9;
  auVar196 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar131 * 4 + 6)));
  lVar137 = uVar131 * 0x25;
  auVar212 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar131 * 5 + 6)));
  auVar283 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar131 * 6 + 6)));
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar131 * 0xf + 6)));
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar9 * 0x10 + 6)));
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar131 * 0x11 + 6)));
  auVar142 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar131 * 0x1a + 6)));
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar131 * 0x1b + 6)));
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar131 * 0x1c + 6)));
  auVar170 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar170 = vinsertps_avx(auVar170,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar195 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar195 = vinsertps_avx(auVar195,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar170 = vsubps_avx(auVar170,*(undefined1 (*) [16])(prim + lVar137 + 6));
  fVar323 = *(float *)(prim + lVar137 + 0x12);
  auVar228._0_4_ = fVar323 * auVar170._0_4_;
  auVar228._4_4_ = fVar323 * auVar170._4_4_;
  auVar228._8_4_ = fVar323 * auVar170._8_4_;
  auVar228._12_4_ = fVar323 * auVar170._12_4_;
  auVar324._0_4_ = fVar323 * auVar195._0_4_;
  auVar324._4_4_ = fVar323 * auVar195._4_4_;
  auVar324._8_4_ = fVar323 * auVar195._8_4_;
  auVar324._12_4_ = fVar323 * auVar195._12_4_;
  auVar233 = vcvtdq2ps_avx(auVar212);
  auVar283 = vcvtdq2ps_avx(auVar283);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar170 = vshufps_avx(auVar324,auVar324,0x55);
  auVar195 = vshufps_avx(auVar324,auVar324,0xaa);
  fVar257 = auVar195._0_4_;
  fVar265 = auVar195._4_4_;
  fVar268 = auVar195._8_4_;
  fVar270 = auVar195._12_4_;
  fVar166 = auVar170._0_4_;
  fVar219 = auVar170._4_4_;
  fVar181 = auVar170._8_4_;
  fVar183 = auVar170._12_4_;
  auVar16 = vcvtdq2ps_avx(auVar196);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar170 = vshufps_avx(auVar324,auVar324,0);
  fVar323 = auVar170._0_4_;
  fVar330 = auVar170._4_4_;
  fVar331 = auVar170._8_4_;
  fVar333 = auVar170._12_4_;
  auVar301._0_4_ = fVar323 * auVar16._0_4_ + fVar166 * auVar233._0_4_ + fVar257 * auVar283._0_4_;
  auVar301._4_4_ = fVar330 * auVar16._4_4_ + fVar219 * auVar233._4_4_ + fVar265 * auVar283._4_4_;
  auVar301._8_4_ = fVar331 * auVar16._8_4_ + fVar181 * auVar233._8_4_ + fVar268 * auVar283._8_4_;
  auVar301._12_4_ = fVar333 * auVar16._12_4_ + fVar183 * auVar233._12_4_ + fVar270 * auVar283._12_4_
  ;
  auVar189._0_4_ = fVar323 * auVar19._0_4_ + fVar257 * auVar21._0_4_ + fVar166 * auVar20._0_4_;
  auVar189._4_4_ = fVar330 * auVar19._4_4_ + fVar265 * auVar21._4_4_ + fVar219 * auVar20._4_4_;
  auVar189._8_4_ = fVar331 * auVar19._8_4_ + fVar268 * auVar21._8_4_ + fVar181 * auVar20._8_4_;
  auVar189._12_4_ = fVar333 * auVar19._12_4_ + fVar270 * auVar21._12_4_ + fVar183 * auVar20._12_4_;
  auVar170._8_8_ = 0;
  auVar170._0_8_ = *(ulong *)(prim + uVar131 * 7 + 6);
  auVar143 = vpmovsxwd_avx(auVar170);
  auVar170 = vcvtdq2ps_avx(auVar142);
  auVar325._0_4_ = fVar166 * auVar22._0_4_ + fVar257 * auVar23._0_4_ + fVar323 * auVar170._0_4_;
  auVar325._4_4_ = fVar219 * auVar22._4_4_ + fVar265 * auVar23._4_4_ + fVar330 * auVar170._4_4_;
  auVar325._8_4_ = fVar181 * auVar22._8_4_ + fVar268 * auVar23._8_4_ + fVar331 * auVar170._8_4_;
  auVar325._12_4_ = fVar183 * auVar22._12_4_ + fVar270 * auVar23._12_4_ + fVar333 * auVar170._12_4_;
  auVar195 = vshufps_avx(auVar228,auVar228,0xaa);
  fVar257 = auVar195._0_4_;
  fVar265 = auVar195._4_4_;
  fVar268 = auVar195._8_4_;
  fVar270 = auVar195._12_4_;
  auVar195 = vshufps_avx(auVar228,auVar228,0x55);
  fVar323 = auVar195._0_4_;
  fVar331 = auVar195._4_4_;
  fVar166 = auVar195._8_4_;
  fVar181 = auVar195._12_4_;
  auVar195._8_8_ = 0;
  auVar195._0_8_ = *(ulong *)(prim + uVar131 * 0xb + 6);
  auVar142 = vpmovsxwd_avx(auVar195);
  auVar196._8_8_ = 0;
  auVar196._0_8_ = *(ulong *)(prim + uVar131 * 9 + 6);
  auVar144 = vpmovsxwd_avx(auVar196);
  auVar212._8_8_ = 0;
  auVar212._0_8_ = *(ulong *)(prim + uVar131 * 0xd + 6);
  auVar212 = vpmovsxwd_avx(auVar212);
  auVar195 = vshufps_avx(auVar228,auVar228,0);
  fVar330 = auVar195._0_4_;
  fVar333 = auVar195._4_4_;
  fVar219 = auVar195._8_4_;
  fVar183 = auVar195._12_4_;
  auVar318._0_4_ = auVar233._0_4_ * fVar323 + fVar257 * auVar283._0_4_ + auVar16._0_4_ * fVar330;
  auVar318._4_4_ = auVar233._4_4_ * fVar331 + fVar265 * auVar283._4_4_ + auVar16._4_4_ * fVar333;
  auVar318._8_4_ = auVar233._8_4_ * fVar166 + fVar268 * auVar283._8_4_ + auVar16._8_4_ * fVar219;
  auVar318._12_4_ = auVar233._12_4_ * fVar181 + fVar270 * auVar283._12_4_ + auVar16._12_4_ * fVar183
  ;
  auVar282._0_4_ = auVar21._0_4_ * fVar257 + fVar323 * auVar20._0_4_ + auVar19._0_4_ * fVar330;
  auVar282._4_4_ = auVar21._4_4_ * fVar265 + fVar331 * auVar20._4_4_ + auVar19._4_4_ * fVar333;
  auVar282._8_4_ = auVar21._8_4_ * fVar268 + fVar166 * auVar20._8_4_ + auVar19._8_4_ * fVar219;
  auVar282._12_4_ = auVar21._12_4_ * fVar270 + fVar181 * auVar20._12_4_ + auVar19._12_4_ * fVar183;
  auVar229._0_4_ = fVar323 * auVar22._0_4_ + fVar257 * auVar23._0_4_ + auVar170._0_4_ * fVar330;
  auVar229._4_4_ = fVar331 * auVar22._4_4_ + fVar265 * auVar23._4_4_ + auVar170._4_4_ * fVar333;
  auVar229._8_4_ = fVar166 * auVar22._8_4_ + fVar268 * auVar23._8_4_ + auVar170._8_4_ * fVar219;
  auVar229._12_4_ = fVar181 * auVar22._12_4_ + fVar270 * auVar23._12_4_ + auVar170._12_4_ * fVar183;
  auVar351._8_4_ = 0x7fffffff;
  auVar351._0_8_ = 0x7fffffff7fffffff;
  auVar351._12_4_ = 0x7fffffff;
  auVar170 = vandps_avx(auVar301,auVar351);
  auVar340._8_4_ = 0x219392ef;
  auVar340._0_8_ = 0x219392ef219392ef;
  auVar340._12_4_ = 0x219392ef;
  auVar170 = vcmpps_avx(auVar170,auVar340,1);
  auVar195 = vblendvps_avx(auVar301,auVar340,auVar170);
  auVar170 = vandps_avx(auVar351,auVar189);
  auVar170 = vcmpps_avx(auVar170,auVar340,1);
  auVar196 = vblendvps_avx(auVar189,auVar340,auVar170);
  auVar170 = vandps_avx(auVar325,auVar351);
  auVar170 = vcmpps_avx(auVar170,auVar340,1);
  auVar170 = vblendvps_avx(auVar325,auVar340,auVar170);
  auVar233 = vrcpps_avx(auVar195);
  fVar257 = auVar233._0_4_;
  auVar260._0_4_ = fVar257 * auVar195._0_4_;
  fVar265 = auVar233._4_4_;
  auVar260._4_4_ = fVar265 * auVar195._4_4_;
  fVar268 = auVar233._8_4_;
  auVar260._8_4_ = fVar268 * auVar195._8_4_;
  fVar270 = auVar233._12_4_;
  auVar260._12_4_ = fVar270 * auVar195._12_4_;
  auVar341._8_4_ = 0x3f800000;
  auVar341._0_8_ = 0x3f8000003f800000;
  auVar341._12_4_ = 0x3f800000;
  auVar195 = vsubps_avx(auVar341,auVar260);
  fVar257 = fVar257 + fVar257 * auVar195._0_4_;
  fVar265 = fVar265 + fVar265 * auVar195._4_4_;
  fVar268 = fVar268 + fVar268 * auVar195._8_4_;
  fVar270 = fVar270 + fVar270 * auVar195._12_4_;
  auVar195 = vrcpps_avx(auVar196);
  fVar297 = auVar195._0_4_;
  auVar190._0_4_ = fVar297 * auVar196._0_4_;
  fVar307 = auVar195._4_4_;
  auVar190._4_4_ = fVar307 * auVar196._4_4_;
  fVar310 = auVar195._8_4_;
  auVar190._8_4_ = fVar310 * auVar196._8_4_;
  fVar313 = auVar195._12_4_;
  auVar190._12_4_ = fVar313 * auVar196._12_4_;
  auVar195 = vsubps_avx(auVar341,auVar190);
  fVar297 = fVar297 + fVar297 * auVar195._0_4_;
  fVar307 = fVar307 + fVar307 * auVar195._4_4_;
  fVar310 = fVar310 + fVar310 * auVar195._8_4_;
  fVar313 = fVar313 + fVar313 * auVar195._12_4_;
  auVar195 = vrcpps_avx(auVar170);
  fVar323 = auVar195._0_4_;
  auVar326._0_4_ = auVar170._0_4_ * fVar323;
  fVar330 = auVar195._4_4_;
  auVar326._4_4_ = auVar170._4_4_ * fVar330;
  fVar331 = auVar195._8_4_;
  auVar326._8_4_ = auVar170._8_4_ * fVar331;
  fVar333 = auVar195._12_4_;
  auVar326._12_4_ = auVar170._12_4_ * fVar333;
  auVar170 = vsubps_avx(auVar341,auVar326);
  fVar323 = auVar170._0_4_ * fVar323 + fVar323;
  fVar330 = auVar170._4_4_ * fVar330 + fVar330;
  fVar331 = auVar170._8_4_ * fVar331 + fVar331;
  fVar333 = auVar170._12_4_ * fVar333 + fVar333;
  auVar196 = vpermilps_avx(ZEXT416((uint)((*(float *)(ray + k * 4 + 0x70) -
                                          *(float *)(prim + lVar137 + 0x16)) *
                                         *(float *)(prim + lVar137 + 0x1a))),0);
  auVar170 = vcvtdq2ps_avx(auVar143);
  auVar195 = vcvtdq2ps_avx(auVar142);
  auVar195 = vsubps_avx(auVar195,auVar170);
  fVar166 = auVar196._0_4_;
  fVar219 = auVar196._4_4_;
  fVar181 = auVar196._8_4_;
  fVar183 = auVar196._12_4_;
  auVar142._0_4_ = fVar166 * auVar195._0_4_ + auVar170._0_4_;
  auVar142._4_4_ = fVar219 * auVar195._4_4_ + auVar170._4_4_;
  auVar142._8_4_ = fVar181 * auVar195._8_4_ + auVar170._8_4_;
  auVar142._12_4_ = fVar183 * auVar195._12_4_ + auVar170._12_4_;
  auVar170 = vcvtdq2ps_avx(auVar144);
  auVar195 = vcvtdq2ps_avx(auVar212);
  auVar195 = vsubps_avx(auVar195,auVar170);
  auVar207._0_4_ = fVar166 * auVar195._0_4_ + auVar170._0_4_;
  auVar207._4_4_ = fVar219 * auVar195._4_4_ + auVar170._4_4_;
  auVar207._8_4_ = fVar181 * auVar195._8_4_ + auVar170._8_4_;
  auVar207._12_4_ = fVar183 * auVar195._12_4_ + auVar170._12_4_;
  auVar233._8_8_ = 0;
  auVar233._0_8_ = *(ulong *)(prim + uVar131 * 0x12 + 6);
  auVar170 = vpmovsxwd_avx(auVar233);
  auVar170 = vcvtdq2ps_avx(auVar170);
  auVar283._8_8_ = 0;
  auVar283._0_8_ = *(ulong *)(prim + uVar131 * 0x16 + 6);
  auVar195 = vpmovsxwd_avx(auVar283);
  auVar195 = vcvtdq2ps_avx(auVar195);
  auVar195 = vsubps_avx(auVar195,auVar170);
  auVar244._0_4_ = fVar166 * auVar195._0_4_ + auVar170._0_4_;
  auVar244._4_4_ = fVar219 * auVar195._4_4_ + auVar170._4_4_;
  auVar244._8_4_ = fVar181 * auVar195._8_4_ + auVar170._8_4_;
  auVar244._12_4_ = fVar183 * auVar195._12_4_ + auVar170._12_4_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar131 * 0x14 + 6);
  auVar170 = vpmovsxwd_avx(auVar20);
  auVar170 = vcvtdq2ps_avx(auVar170);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar131 * 0x18 + 6);
  auVar195 = vpmovsxwd_avx(auVar21);
  auVar195 = vcvtdq2ps_avx(auVar195);
  auVar196 = vsubps_avx(auVar195,auVar170);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar131 * 0x1d + 6);
  auVar195 = vpmovsxwd_avx(auVar16);
  auVar249._0_4_ = auVar196._0_4_ * fVar166 + auVar170._0_4_;
  auVar249._4_4_ = auVar196._4_4_ * fVar219 + auVar170._4_4_;
  auVar249._8_4_ = auVar196._8_4_ * fVar181 + auVar170._8_4_;
  auVar249._12_4_ = auVar196._12_4_ * fVar183 + auVar170._12_4_;
  auVar170 = vcvtdq2ps_avx(auVar195);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar131 * 0x21 + 6);
  auVar195 = vpmovsxwd_avx(auVar19);
  auVar195 = vcvtdq2ps_avx(auVar195);
  auVar195 = vsubps_avx(auVar195,auVar170);
  auVar342._0_4_ = auVar195._0_4_ * fVar166 + auVar170._0_4_;
  auVar342._4_4_ = auVar195._4_4_ * fVar219 + auVar170._4_4_;
  auVar342._8_4_ = auVar195._8_4_ * fVar181 + auVar170._8_4_;
  auVar342._12_4_ = auVar195._12_4_ * fVar183 + auVar170._12_4_;
  auVar348 = ZEXT1664(auVar342);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar131 * 0x1f + 6);
  auVar170 = vpmovsxwd_avx(auVar22);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar131 * 0x23 + 6);
  auVar195 = vpmovsxwd_avx(auVar23);
  auVar170 = vcvtdq2ps_avx(auVar170);
  auVar195 = vcvtdq2ps_avx(auVar195);
  auVar195 = vsubps_avx(auVar195,auVar170);
  auVar191._0_4_ = auVar170._0_4_ + auVar195._0_4_ * fVar166;
  auVar191._4_4_ = auVar170._4_4_ + auVar195._4_4_ * fVar219;
  auVar191._8_4_ = auVar170._8_4_ + auVar195._8_4_ * fVar181;
  auVar191._12_4_ = auVar170._12_4_ + auVar195._12_4_ * fVar183;
  auVar170 = vsubps_avx(auVar142,auVar318);
  auVar143._0_4_ = fVar257 * auVar170._0_4_;
  auVar143._4_4_ = fVar265 * auVar170._4_4_;
  auVar143._8_4_ = fVar268 * auVar170._8_4_;
  auVar143._12_4_ = fVar270 * auVar170._12_4_;
  auVar170 = vsubps_avx(auVar207,auVar318);
  auVar208._0_4_ = fVar257 * auVar170._0_4_;
  auVar208._4_4_ = fVar265 * auVar170._4_4_;
  auVar208._8_4_ = fVar268 * auVar170._8_4_;
  auVar208._12_4_ = fVar270 * auVar170._12_4_;
  auVar170 = vsubps_avx(auVar244,auVar282);
  auVar245._0_4_ = fVar297 * auVar170._0_4_;
  auVar245._4_4_ = fVar307 * auVar170._4_4_;
  auVar245._8_4_ = fVar310 * auVar170._8_4_;
  auVar245._12_4_ = fVar313 * auVar170._12_4_;
  auVar170 = vsubps_avx(auVar249,auVar282);
  auVar250._0_4_ = fVar297 * auVar170._0_4_;
  auVar250._4_4_ = fVar307 * auVar170._4_4_;
  auVar250._8_4_ = fVar310 * auVar170._8_4_;
  auVar250._12_4_ = fVar313 * auVar170._12_4_;
  auVar170 = vsubps_avx(auVar342,auVar229);
  auVar261._0_4_ = fVar323 * auVar170._0_4_;
  auVar261._4_4_ = fVar330 * auVar170._4_4_;
  auVar261._8_4_ = fVar331 * auVar170._8_4_;
  auVar261._12_4_ = fVar333 * auVar170._12_4_;
  auVar170 = vsubps_avx(auVar191,auVar229);
  auVar192._0_4_ = fVar323 * auVar170._0_4_;
  auVar192._4_4_ = fVar330 * auVar170._4_4_;
  auVar192._8_4_ = fVar331 * auVar170._8_4_;
  auVar192._12_4_ = fVar333 * auVar170._12_4_;
  auVar170 = vpminsd_avx(auVar143,auVar208);
  auVar195 = vpminsd_avx(auVar245,auVar250);
  auVar170 = vmaxps_avx(auVar170,auVar195);
  auVar195 = vpminsd_avx(auVar261,auVar192);
  uVar138 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar302._4_4_ = uVar138;
  auVar302._0_4_ = uVar138;
  auVar302._8_4_ = uVar138;
  auVar302._12_4_ = uVar138;
  auVar195 = vmaxps_avx(auVar195,auVar302);
  auVar170 = vmaxps_avx(auVar170,auVar195);
  local_2b0._0_4_ = auVar170._0_4_ * 0.99999964;
  local_2b0._4_4_ = auVar170._4_4_ * 0.99999964;
  local_2b0._8_4_ = auVar170._8_4_ * 0.99999964;
  local_2b0._12_4_ = auVar170._12_4_ * 0.99999964;
  auVar170 = vpmaxsd_avx(auVar143,auVar208);
  auVar195 = vpmaxsd_avx(auVar245,auVar250);
  auVar170 = vminps_avx(auVar170,auVar195);
  auVar195 = vpmaxsd_avx(auVar261,auVar192);
  uVar138 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar209._4_4_ = uVar138;
  auVar209._0_4_ = uVar138;
  auVar209._8_4_ = uVar138;
  auVar209._12_4_ = uVar138;
  auVar195 = vminps_avx(auVar195,auVar209);
  auVar170 = vminps_avx(auVar170,auVar195);
  auVar144._0_4_ = auVar170._0_4_ * 1.0000004;
  auVar144._4_4_ = auVar170._4_4_ * 1.0000004;
  auVar144._8_4_ = auVar170._8_4_ * 1.0000004;
  auVar144._12_4_ = auVar170._12_4_ * 1.0000004;
  auVar170 = vpshufd_avx(ZEXT116((byte)PVar9),0);
  auVar195 = vpcmpgtd_avx(auVar170,_DAT_01f4ad30);
  auVar170 = vcmpps_avx(local_2b0,auVar144,2);
  auVar170 = vandps_avx(auVar170,auVar195);
  uVar138 = vmovmskps_avx(auVar170);
  uVar131 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),uVar138);
  local_530 = pre->ray_space + k;
  local_520 = mm_lookupmask_ps._16_8_;
  uStack_518 = mm_lookupmask_ps._24_8_;
  uStack_510 = mm_lookupmask_ps._16_8_;
  uStack_508 = mm_lookupmask_ps._24_8_;
  local_690 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_688 = pre;
  local_528 = prim;
  do {
    if (uVar131 == 0) {
      return;
    }
    auVar153 = auVar348._0_32_;
    lVar137 = 0;
    if (uVar131 != 0) {
      for (; (uVar131 >> lVar137 & 1) == 0; lVar137 = lVar137 + 1) {
      }
    }
    uVar132 = *(uint *)(local_528 + 2);
    uVar130 = *(uint *)(local_528 + lVar137 * 4 + 6);
    auVar139 = (undefined1  [8])CONCAT44(0,uVar130);
    pGVar11 = (context->scene->geometries).items[CONCAT44(0,uVar132)].ptr;
    uVar133 = (ulong)*(uint *)(*(long *)&pGVar11->field_0x58 +
                              (long)auVar139 *
                              pGVar11[1].super_RefCount.refCounter.
                              super___atomic_base<unsigned_long>._M_i);
    fVar323 = (pGVar11->time_range).lower;
    fVar323 = pGVar11->fnumTimeSegments *
              ((*(float *)(ray + k * 4 + 0x70) - fVar323) / ((pGVar11->time_range).upper - fVar323))
    ;
    auVar170 = vroundss_avx(ZEXT416((uint)fVar323),ZEXT416((uint)fVar323),9);
    auVar170 = vminss_avx(auVar170,ZEXT416((uint)(pGVar11->fnumTimeSegments + -1.0)));
    auVar170 = vmaxss_avx(ZEXT816(0) << 0x20,auVar170);
    fVar323 = fVar323 - auVar170._0_4_;
    _Var12 = pGVar11[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar135 = (long)(int)auVar170._0_4_ * 0x38;
    lVar137 = *(long *)(_Var12 + 0x10 + lVar135);
    lVar134 = *(long *)(_Var12 + 0x38 + lVar135);
    lVar13 = *(long *)(_Var12 + 0x48 + lVar135);
    auVar170 = vshufps_avx(ZEXT416((uint)fVar323),ZEXT416((uint)fVar323),0);
    pfVar1 = (float *)(lVar134 + uVar133 * lVar13);
    fVar166 = auVar170._0_4_;
    fVar219 = auVar170._4_4_;
    fVar181 = auVar170._8_4_;
    fVar183 = auVar170._12_4_;
    pfVar2 = (float *)(lVar134 + (uVar133 + 1) * lVar13);
    pfVar3 = (float *)(lVar134 + (uVar133 + 2) * lVar13);
    pfVar4 = (float *)(lVar134 + lVar13 * (uVar133 + 3));
    lVar134 = *(long *)(_Var12 + lVar135);
    auVar170 = vshufps_avx(ZEXT416((uint)(1.0 - fVar323)),ZEXT416((uint)(1.0 - fVar323)),0);
    pfVar5 = (float *)(lVar134 + lVar137 * uVar133);
    fVar323 = auVar170._0_4_;
    fVar330 = auVar170._4_4_;
    fVar331 = auVar170._8_4_;
    fVar333 = auVar170._12_4_;
    pfVar6 = (float *)(lVar134 + lVar137 * (uVar133 + 1));
    fVar258 = fVar166 * *pfVar1 + fVar323 * *pfVar5;
    fVar266 = fVar219 * pfVar1[1] + fVar330 * pfVar5[1];
    auVar262._0_8_ = CONCAT44(fVar266,fVar258);
    auVar262._8_4_ = fVar181 * pfVar1[2] + fVar331 * pfVar5[2];
    auVar262._12_4_ = fVar183 * pfVar1[3] + fVar333 * pfVar5[3];
    fVar356 = fVar323 * *pfVar6 + fVar166 * *pfVar2;
    fVar360 = fVar330 * pfVar6[1] + fVar219 * pfVar2[1];
    auVar358._0_8_ = CONCAT44(fVar360,fVar356);
    auVar358._8_4_ = fVar331 * pfVar6[2] + fVar181 * pfVar2[2];
    auVar358._12_4_ = fVar333 * pfVar6[3] + fVar183 * pfVar2[3];
    pfVar1 = (float *)(lVar134 + lVar137 * (uVar133 + 2));
    fVar366 = fVar323 * *pfVar1 + fVar166 * *pfVar3;
    fVar371 = fVar330 * pfVar1[1] + fVar219 * pfVar3[1];
    auVar368._0_8_ = CONCAT44(fVar371,fVar366);
    auVar368._8_4_ = fVar331 * pfVar1[2] + fVar181 * pfVar3[2];
    auVar368._12_4_ = fVar333 * pfVar1[3] + fVar183 * pfVar3[3];
    pfVar1 = (float *)(lVar134 + lVar137 * (uVar133 + 3));
    fVar339 = fVar323 * *pfVar1 + fVar166 * *pfVar4;
    fVar349 = fVar330 * pfVar1[1] + fVar219 * pfVar4[1];
    auVar343._0_8_ = CONCAT44(fVar349,fVar339);
    auVar343._8_4_ = fVar331 * pfVar1[2] + fVar181 * pfVar4[2];
    auVar343._12_4_ = fVar333 * pfVar1[3] + fVar183 * pfVar4[3];
    uVar136 = (uint)pGVar11[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar170 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                             0x1c);
    auVar212 = vinsertps_avx(auVar170,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
    auVar196 = vsubps_avx(auVar262,auVar212);
    auVar170 = vshufps_avx(auVar196,auVar196,0);
    auVar195 = vshufps_avx(auVar196,auVar196,0x55);
    auVar196 = vshufps_avx(auVar196,auVar196,0xaa);
    fVar323 = (local_530->vx).field_0.m128[0];
    fVar330 = (local_530->vx).field_0.m128[1];
    fVar331 = (local_530->vx).field_0.m128[2];
    fVar333 = (local_530->vx).field_0.m128[3];
    fVar166 = (local_530->vy).field_0.m128[0];
    fVar219 = (local_530->vy).field_0.m128[1];
    fVar181 = (local_530->vy).field_0.m128[2];
    fVar183 = (local_530->vy).field_0.m128[3];
    fVar257 = (local_530->vz).field_0.m128[0];
    fVar265 = (local_530->vz).field_0.m128[1];
    fVar268 = (local_530->vz).field_0.m128[2];
    fVar270 = (local_530->vz).field_0.m128[3];
    auVar230._0_4_ = auVar170._0_4_ * fVar323 + auVar195._0_4_ * fVar166 + fVar257 * auVar196._0_4_;
    auVar230._4_4_ = auVar170._4_4_ * fVar330 + auVar195._4_4_ * fVar219 + fVar265 * auVar196._4_4_;
    auVar230._8_4_ = auVar170._8_4_ * fVar331 + auVar195._8_4_ * fVar181 + fVar268 * auVar196._8_4_;
    auVar230._12_4_ =
         auVar170._12_4_ * fVar333 + auVar195._12_4_ * fVar183 + fVar270 * auVar196._12_4_;
    auVar170 = vblendps_avx(auVar230,auVar262,8);
    auVar233 = vsubps_avx(auVar358,auVar212);
    auVar195 = vshufps_avx(auVar233,auVar233,0);
    auVar196 = vshufps_avx(auVar233,auVar233,0x55);
    auVar233 = vshufps_avx(auVar233,auVar233,0xaa);
    auVar231._0_8_ =
         CONCAT44(auVar195._4_4_ * fVar330 + auVar196._4_4_ * fVar219 + fVar265 * auVar233._4_4_,
                  auVar195._0_4_ * fVar323 + auVar196._0_4_ * fVar166 + fVar257 * auVar233._0_4_);
    auVar231._8_4_ = auVar195._8_4_ * fVar331 + auVar196._8_4_ * fVar181 + fVar268 * auVar233._8_4_;
    auVar231._12_4_ =
         auVar195._12_4_ * fVar333 + auVar196._12_4_ * fVar183 + fVar270 * auVar233._12_4_;
    auVar195 = vblendps_avx(auVar231,auVar358,8);
    auVar283 = vsubps_avx(auVar368,auVar212);
    auVar196 = vshufps_avx(auVar283,auVar283,0);
    auVar233 = vshufps_avx(auVar283,auVar283,0x55);
    auVar283 = vshufps_avx(auVar283,auVar283,0xaa);
    auVar232._0_4_ = auVar196._0_4_ * fVar323 + auVar233._0_4_ * fVar166 + auVar283._0_4_ * fVar257;
    auVar232._4_4_ = auVar196._4_4_ * fVar330 + auVar233._4_4_ * fVar219 + auVar283._4_4_ * fVar265;
    auVar232._8_4_ = auVar196._8_4_ * fVar331 + auVar233._8_4_ * fVar181 + auVar283._8_4_ * fVar268;
    auVar232._12_4_ =
         auVar196._12_4_ * fVar333 + auVar233._12_4_ * fVar183 + auVar283._12_4_ * fVar270;
    auVar196 = vblendps_avx(auVar232,auVar368,8);
    auVar283 = vsubps_avx(auVar343,auVar212);
    auVar212 = vshufps_avx(auVar283,auVar283,0);
    auVar233 = vshufps_avx(auVar283,auVar283,0x55);
    auVar283 = vshufps_avx(auVar283,auVar283,0xaa);
    auVar168._0_4_ = auVar212._0_4_ * fVar323 + auVar233._0_4_ * fVar166 + fVar257 * auVar283._0_4_;
    auVar168._4_4_ = auVar212._4_4_ * fVar330 + auVar233._4_4_ * fVar219 + fVar265 * auVar283._4_4_;
    auVar168._8_4_ = auVar212._8_4_ * fVar331 + auVar233._8_4_ * fVar181 + fVar268 * auVar283._8_4_;
    auVar168._12_4_ =
         auVar212._12_4_ * fVar333 + auVar233._12_4_ * fVar183 + fVar270 * auVar283._12_4_;
    auVar212 = vblendps_avx(auVar168,auVar343,8);
    auVar210._8_4_ = 0x7fffffff;
    auVar210._0_8_ = 0x7fffffff7fffffff;
    auVar210._12_4_ = 0x7fffffff;
    auVar170 = vandps_avx(auVar170,auVar210);
    auVar195 = vandps_avx(auVar195,auVar210);
    auVar233 = vmaxps_avx(auVar170,auVar195);
    auVar170 = vandps_avx(auVar196,auVar210);
    auVar195 = vandps_avx(auVar212,auVar210);
    auVar170 = vmaxps_avx(auVar170,auVar195);
    auVar170 = vmaxps_avx(auVar233,auVar170);
    auVar195 = vmovshdup_avx(auVar170);
    auVar195 = vmaxss_avx(auVar195,auVar170);
    auVar170 = vshufpd_avx(auVar170,auVar170,1);
    auVar170 = vmaxss_avx(auVar170,auVar195);
    lVar137 = (long)(int)uVar136 * 0x44;
    fVar335 = *(float *)(catmullrom_basis0 + lVar137 + 0x908);
    fVar269 = *(float *)(catmullrom_basis0 + lVar137 + 0x90c);
    fVar337 = *(float *)(catmullrom_basis0 + lVar137 + 0x910);
    fVar336 = *(float *)(catmullrom_basis0 + lVar137 + 0x914);
    fVar338 = *(float *)(catmullrom_basis0 + lVar137 + 0x918);
    fVar271 = *(float *)(catmullrom_basis0 + lVar137 + 0x91c);
    fVar280 = *(float *)(catmullrom_basis0 + lVar137 + 0x920);
    auVar195 = vshufps_avx(auVar232,auVar232,0);
    auVar196 = vshufps_avx(auVar232,auVar232,0x55);
    register0x00001290 = auVar196;
    _local_800 = auVar196;
    fVar268 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar137 + 0xd8c);
    fVar270 = *(float *)(catmullrom_basis0 + lVar137 + 0xd90);
    fVar310 = *(float *)(catmullrom_basis0 + lVar137 + 0xd94);
    fVar313 = *(float *)(catmullrom_basis0 + lVar137 + 0xd98);
    fVar364 = *(float *)(catmullrom_basis0 + lVar137 + 0xd9c);
    fVar365 = *(float *)(catmullrom_basis0 + lVar137 + 0xda0);
    fVar332 = *(float *)(catmullrom_basis0 + lVar137 + 0xda4);
    auVar124 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar137 + 0xd8c);
    auVar212 = vshufps_avx(auVar168,auVar168,0);
    register0x00001550 = auVar212;
    _local_420 = auVar212;
    fVar273 = auVar212._0_4_;
    fVar275 = auVar212._4_4_;
    fVar277 = auVar212._8_4_;
    fVar300 = auVar212._12_4_;
    fVar167 = auVar195._0_4_;
    fVar180 = auVar195._4_4_;
    fVar182 = auVar195._8_4_;
    fVar184 = auVar195._12_4_;
    auVar195 = vshufps_avx(auVar168,auVar168,0x55);
    register0x00001350 = auVar195;
    _local_660 = auVar195;
    fVar323 = auVar195._0_4_;
    fVar166 = auVar195._4_4_;
    fVar257 = auVar195._8_4_;
    fVar297 = auVar195._12_4_;
    fVar187 = auVar196._0_4_;
    fVar201 = auVar196._4_4_;
    fVar203 = auVar196._8_4_;
    fVar205 = auVar196._12_4_;
    auVar195 = vshufps_avx(auVar368,auVar368,0xff);
    register0x00001310 = auVar195;
    _local_80 = auVar195;
    auVar196 = vshufps_avx(auVar343,auVar343,0xff);
    register0x000013d0 = auVar196;
    _local_140 = auVar196;
    fVar330 = auVar196._0_4_;
    fVar333 = auVar196._4_4_;
    fVar181 = auVar196._8_4_;
    fVar183 = auVar196._12_4_;
    fVar224 = auVar195._0_4_;
    fVar334 = auVar195._4_4_;
    fVar185 = auVar195._8_4_;
    auVar112._8_4_ = auVar231._8_4_;
    auVar112._0_8_ = auVar231._0_8_;
    auVar112._12_4_ = auVar231._12_4_;
    auVar196 = vshufps_avx(auVar112,auVar112,0);
    register0x000015d0 = auVar196;
    _local_7a0 = auVar196;
    fVar281 = *(float *)(catmullrom_basis0 + lVar137 + 0x484);
    fVar220 = *(float *)(catmullrom_basis0 + lVar137 + 0x488);
    fVar272 = *(float *)(catmullrom_basis0 + lVar137 + 0x48c);
    fVar289 = *(float *)(catmullrom_basis0 + lVar137 + 0x490);
    fVar290 = *(float *)(catmullrom_basis0 + lVar137 + 0x494);
    fVar221 = *(float *)(catmullrom_basis0 + lVar137 + 0x498);
    fVar274 = *(float *)(catmullrom_basis0 + lVar137 + 0x49c);
    fVar367 = auVar196._0_4_;
    fVar372 = auVar196._4_4_;
    fVar373 = auVar196._8_4_;
    fVar374 = auVar196._12_4_;
    auVar196 = vshufps_avx(auVar112,auVar112,0x55);
    register0x00001210 = auVar196;
    _local_2e0 = auVar196;
    fVar331 = auVar196._0_4_;
    fVar219 = auVar196._4_4_;
    fVar265 = auVar196._8_4_;
    fVar307 = auVar196._12_4_;
    auVar196 = vshufps_avx(auVar358,auVar358,0xff);
    register0x00001590 = auVar196;
    _local_160 = auVar196;
    fVar312 = auVar196._0_4_;
    fVar315 = auVar196._4_4_;
    fVar316 = auVar196._8_4_;
    fVar317 = auVar196._12_4_;
    auVar196 = vshufps_avx(auVar230,auVar230,0);
    register0x00001490 = auVar196;
    _local_a0 = auVar196;
    fVar293 = *(float *)(catmullrom_basis0 + lVar137);
    fVar294 = *(float *)(catmullrom_basis0 + lVar137 + 4);
    fVar223 = *(float *)(catmullrom_basis0 + lVar137 + 8);
    fVar276 = *(float *)(catmullrom_basis0 + lVar137 + 0xc);
    fStack_470 = *(float *)(catmullrom_basis0 + lVar137 + 0x10);
    fStack_46c = *(float *)(catmullrom_basis0 + lVar137 + 0x14);
    fStack_468 = *(float *)(catmullrom_basis0 + lVar137 + 0x18);
    fStack_464 = *(float *)(catmullrom_basis0 + lVar137 + 0x1c);
    fVar267 = auVar196._0_4_;
    fStack_43c = auVar196._4_4_;
    fStack_438 = auVar196._8_4_;
    fStack_434 = auVar196._12_4_;
    auVar327._0_4_ = fVar267 * fVar293 + fVar367 * fVar281 + fVar167 * fVar335 + fVar273 * fVar268;
    auVar327._4_4_ =
         fStack_43c * fVar294 + fVar372 * fVar220 + fVar180 * fVar269 + fVar275 * fVar270;
    auVar327._8_4_ =
         fStack_438 * fVar223 + fVar373 * fVar272 + fVar182 * fVar337 + fVar277 * fVar310;
    auVar327._12_4_ =
         fStack_434 * fVar276 + fVar374 * fVar289 + fVar184 * fVar336 + fVar300 * fVar313;
    auVar327._16_4_ =
         fVar267 * fStack_470 + fVar367 * fVar290 + fVar167 * fVar338 + fVar273 * fVar364;
    auVar327._20_4_ =
         fStack_43c * fStack_46c + fVar372 * fVar221 + fVar180 * fVar271 + fVar275 * fVar365;
    auVar327._24_4_ =
         fStack_438 * fStack_468 + fVar373 * fVar274 + fVar182 * fVar280 + fVar277 * fVar332;
    auVar327._28_4_ = fVar184 + 0.0 + 0.0 + 0.0;
    auVar212 = vshufps_avx(auVar230,auVar230,0x55);
    register0x00001290 = auVar212;
    _local_6c0 = auVar212;
    fVar188 = auVar212._0_4_;
    fVar202 = auVar212._4_4_;
    fVar204 = auVar212._8_4_;
    fVar206 = auVar212._12_4_;
    auVar284._0_4_ = fVar188 * fVar293 + fVar281 * fVar331 + fVar187 * fVar335 + fVar268 * fVar323;
    auVar284._4_4_ = fVar202 * fVar294 + fVar220 * fVar219 + fVar201 * fVar269 + fVar270 * fVar166;
    auVar284._8_4_ = fVar204 * fVar223 + fVar272 * fVar265 + fVar203 * fVar337 + fVar310 * fVar257;
    auVar284._12_4_ = fVar206 * fVar276 + fVar289 * fVar307 + fVar205 * fVar336 + fVar313 * fVar297;
    auVar284._16_4_ =
         fVar188 * fStack_470 + fVar290 * fVar331 + fVar187 * fVar338 + fVar364 * fVar323;
    auVar284._20_4_ =
         fVar202 * fStack_46c + fVar221 * fVar219 + fVar201 * fVar271 + fVar365 * fVar166;
    auVar284._24_4_ =
         fVar204 * fStack_468 + fVar274 * fVar265 + fVar203 * fVar280 + fVar332 * fVar257;
    auVar284._28_4_ = fVar307 + fVar205 + 0.0 + 0.0;
    auVar212 = vpermilps_avx(auVar262,0xff);
    register0x00001450 = auVar212;
    _local_c0 = auVar212;
    fVar298 = auVar212._0_4_;
    fVar308 = auVar212._4_4_;
    fVar259 = auVar212._8_4_;
    auVar148._0_4_ = fVar312 * fVar281 + fVar224 * fVar335 + fVar268 * fVar330 + fVar298 * fVar293;
    auVar148._4_4_ = fVar315 * fVar220 + fVar334 * fVar269 + fVar270 * fVar333 + fVar308 * fVar294;
    auVar148._8_4_ = fVar316 * fVar272 + fVar185 * fVar337 + fVar310 * fVar181 + fVar259 * fVar223;
    auVar148._12_4_ =
         fVar317 * fVar289 + auVar195._12_4_ * fVar336 + fVar313 * fVar183 +
         auVar212._12_4_ * fVar276;
    auVar148._16_4_ =
         fVar312 * fVar290 + fVar224 * fVar338 + fVar364 * fVar330 + fVar298 * fStack_470;
    auVar148._20_4_ =
         fVar315 * fVar221 + fVar334 * fVar271 + fVar365 * fVar333 + fVar308 * fStack_46c;
    auVar148._24_4_ =
         fVar316 * fVar274 + fVar185 * fVar280 + fVar332 * fVar181 + fVar259 * fStack_468;
    auVar148._28_4_ = 0;
    fVar295 = *(float *)(catmullrom_basis1 + lVar137 + 0x908);
    fVar296 = *(float *)(catmullrom_basis1 + lVar137 + 0x90c);
    fVar226 = *(float *)(catmullrom_basis1 + lVar137 + 0x910);
    fVar140 = *(float *)(catmullrom_basis1 + lVar137 + 0x914);
    fVar159 = *(float *)(catmullrom_basis1 + lVar137 + 0x918);
    fVar161 = *(float *)(catmullrom_basis1 + lVar137 + 0x91c);
    fVar186 = *(float *)(catmullrom_basis1 + lVar137 + 0x920);
    fVar268 = *(float *)*(undefined1 (*) [28])(catmullrom_basis1 + lVar137 + 0xd8c);
    fVar270 = *(float *)(catmullrom_basis1 + lVar137 + 0xd90);
    fVar310 = *(float *)(catmullrom_basis1 + lVar137 + 0xd94);
    fVar313 = *(float *)(catmullrom_basis1 + lVar137 + 0xd98);
    fVar364 = *(float *)(catmullrom_basis1 + lVar137 + 0xd9c);
    fVar365 = *(float *)(catmullrom_basis1 + lVar137 + 0xda0);
    fVar332 = *(float *)(catmullrom_basis1 + lVar137 + 0xda4);
    auVar125 = *(undefined1 (*) [28])(catmullrom_basis1 + lVar137 + 0xd8c);
    fVar164 = *(float *)(catmullrom_basis1 + lVar137 + 0x484);
    fVar141 = *(float *)(catmullrom_basis1 + lVar137 + 0x488);
    fVar160 = *(float *)(catmullrom_basis1 + lVar137 + 0x48c);
    fVar162 = *(float *)(catmullrom_basis1 + lVar137 + 0x490);
    fVar163 = *(float *)(catmullrom_basis1 + lVar137 + 0x494);
    fVar243 = *(float *)(catmullrom_basis1 + lVar137 + 0x498);
    fVar165 = *(float *)(catmullrom_basis1 + lVar137 + 0x49c);
    fVar256 = *(float *)(catmullrom_basis1 + lVar137);
    fVar222 = *(float *)(catmullrom_basis1 + lVar137 + 4);
    fVar225 = *(float *)(catmullrom_basis1 + lVar137 + 8);
    fVar279 = *(float *)(catmullrom_basis1 + lVar137 + 0xc);
    fVar288 = *(float *)(catmullrom_basis1 + lVar137 + 0x10);
    fVar291 = *(float *)(catmullrom_basis1 + lVar137 + 0x14);
    fVar292 = *(float *)(catmullrom_basis1 + lVar137 + 0x18);
    auVar234._0_4_ = fVar267 * fVar256 + fVar367 * fVar164 + fVar295 * fVar167 + fVar273 * fVar268;
    auVar234._4_4_ =
         fStack_43c * fVar222 + fVar372 * fVar141 + fVar296 * fVar180 + fVar275 * fVar270;
    auVar234._8_4_ =
         fStack_438 * fVar225 + fVar373 * fVar160 + fVar226 * fVar182 + fVar277 * fVar310;
    auVar234._12_4_ =
         fStack_434 * fVar279 + fVar374 * fVar162 + fVar140 * fVar184 + fVar300 * fVar313;
    auVar234._16_4_ = fVar267 * fVar288 + fVar367 * fVar163 + fVar159 * fVar167 + fVar273 * fVar364;
    auVar234._20_4_ =
         fStack_43c * fVar291 + fVar372 * fVar243 + fVar161 * fVar180 + fVar275 * fVar365;
    auVar234._24_4_ =
         fStack_438 * fVar292 + fVar373 * fVar165 + fVar186 * fVar182 + fVar277 * fVar332;
    auVar234._28_4_ = fVar317 + fVar300 + 0.0;
    auVar213._0_4_ = fVar188 * fVar256 + fVar331 * fVar164 + fVar295 * fVar187 + fVar268 * fVar323;
    auVar213._4_4_ = fVar202 * fVar222 + fVar219 * fVar141 + fVar296 * fVar201 + fVar270 * fVar166;
    auVar213._8_4_ = fVar204 * fVar225 + fVar265 * fVar160 + fVar226 * fVar203 + fVar310 * fVar257;
    auVar213._12_4_ = fVar206 * fVar279 + fVar307 * fVar162 + fVar140 * fVar205 + fVar313 * fVar297;
    auVar213._16_4_ = fVar188 * fVar288 + fVar331 * fVar163 + fVar159 * fVar187 + fVar364 * fVar323;
    auVar213._20_4_ = fVar202 * fVar291 + fVar219 * fVar243 + fVar161 * fVar201 + fVar365 * fVar166;
    auVar213._24_4_ = fVar204 * fVar292 + fVar265 * fVar165 + fVar186 * fVar203 + fVar332 * fVar257;
    auVar213._28_4_ = fVar206 + fVar300 + 0.0;
    auVar246._0_4_ = fVar312 * fVar164 + fVar224 * fVar295 + fVar268 * fVar330 + fVar298 * fVar256;
    auVar246._4_4_ = fVar315 * fVar141 + fVar334 * fVar296 + fVar270 * fVar333 + fVar308 * fVar222;
    auVar246._8_4_ = fVar316 * fVar160 + fVar185 * fVar226 + fVar310 * fVar181 + fVar259 * fVar225;
    auVar246._12_4_ =
         fVar317 * fVar162 + auVar195._12_4_ * fVar140 + fVar313 * fVar183 +
         auVar212._12_4_ * fVar279;
    auVar246._16_4_ = fVar312 * fVar163 + fVar224 * fVar159 + fVar364 * fVar330 + fVar298 * fVar288;
    auVar246._20_4_ = fVar315 * fVar243 + fVar334 * fVar161 + fVar365 * fVar333 + fVar308 * fVar291;
    auVar246._24_4_ = fVar316 * fVar165 + fVar185 * fVar186 + fVar332 * fVar181 + fVar259 * fVar292;
    auVar246._28_4_ = fVar300 + fVar183 + 0.0 + fVar206;
    auVar24 = vsubps_avx(auVar234,auVar327);
    auVar25 = vsubps_avx(auVar213,auVar284);
    fVar330 = auVar24._0_4_;
    fVar181 = auVar24._4_4_;
    auVar17._4_4_ = auVar284._4_4_ * fVar181;
    auVar17._0_4_ = auVar284._0_4_ * fVar330;
    fVar268 = auVar24._8_4_;
    auVar17._8_4_ = auVar284._8_4_ * fVar268;
    fVar310 = auVar24._12_4_;
    auVar17._12_4_ = auVar284._12_4_ * fVar310;
    fVar364 = auVar24._16_4_;
    auVar17._16_4_ = auVar284._16_4_ * fVar364;
    fVar332 = auVar24._20_4_;
    auVar17._20_4_ = auVar284._20_4_ * fVar332;
    fVar334 = auVar24._24_4_;
    auVar17._24_4_ = auVar284._24_4_ * fVar334;
    auVar17._28_4_ = fVar206;
    fVar333 = auVar25._0_4_;
    fVar183 = auVar25._4_4_;
    auVar26._4_4_ = auVar327._4_4_ * fVar183;
    auVar26._0_4_ = auVar327._0_4_ * fVar333;
    fVar270 = auVar25._8_4_;
    auVar26._8_4_ = auVar327._8_4_ * fVar270;
    fVar313 = auVar25._12_4_;
    auVar26._12_4_ = auVar327._12_4_ * fVar313;
    fVar365 = auVar25._16_4_;
    auVar26._16_4_ = auVar327._16_4_ * fVar365;
    fVar224 = auVar25._20_4_;
    auVar26._20_4_ = auVar327._20_4_ * fVar224;
    fVar185 = auVar25._24_4_;
    auVar26._24_4_ = auVar327._24_4_ * fVar185;
    auVar26._28_4_ = auVar213._28_4_;
    auVar26 = vsubps_avx(auVar17,auVar26);
    auVar17 = vmaxps_avx(auVar148,auVar246);
    auVar32._4_4_ = auVar17._4_4_ * auVar17._4_4_ * (fVar181 * fVar181 + fVar183 * fVar183);
    auVar32._0_4_ = auVar17._0_4_ * auVar17._0_4_ * (fVar330 * fVar330 + fVar333 * fVar333);
    auVar32._8_4_ = auVar17._8_4_ * auVar17._8_4_ * (fVar268 * fVar268 + fVar270 * fVar270);
    auVar32._12_4_ = auVar17._12_4_ * auVar17._12_4_ * (fVar310 * fVar310 + fVar313 * fVar313);
    auVar32._16_4_ = auVar17._16_4_ * auVar17._16_4_ * (fVar364 * fVar364 + fVar365 * fVar365);
    auVar32._20_4_ = auVar17._20_4_ * auVar17._20_4_ * (fVar332 * fVar332 + fVar224 * fVar224);
    auVar32._24_4_ = auVar17._24_4_ * auVar17._24_4_ * (fVar334 * fVar334 + fVar185 * fVar185);
    auVar32._28_4_ = auVar234._28_4_ + auVar213._28_4_;
    auVar18._4_4_ = auVar26._4_4_ * auVar26._4_4_;
    auVar18._0_4_ = auVar26._0_4_ * auVar26._0_4_;
    auVar18._8_4_ = auVar26._8_4_ * auVar26._8_4_;
    auVar18._12_4_ = auVar26._12_4_ * auVar26._12_4_;
    auVar18._16_4_ = auVar26._16_4_ * auVar26._16_4_;
    auVar18._20_4_ = auVar26._20_4_ * auVar26._20_4_;
    auVar18._24_4_ = auVar26._24_4_ * auVar26._24_4_;
    auVar18._28_4_ = auVar26._28_4_;
    auVar17 = vcmpps_avx(auVar18,auVar32,2);
    auVar211._0_4_ = (float)(int)uVar136;
    auVar211._4_12_ = auVar196._4_12_;
    auVar233 = ZEXT416((uint)(auVar170._0_4_ * 4.7683716e-07));
    local_6e0._0_16_ = auVar233;
    auVar170 = vshufps_avx(auVar211,auVar211,0);
    auVar214._16_16_ = auVar170;
    auVar214._0_16_ = auVar170;
    auVar26 = vcmpps_avx(_DAT_01f7b060,auVar214,1);
    auVar170 = vpermilps_avx(auVar230,0xaa);
    register0x00001450 = auVar170;
    _local_4e0 = auVar170;
    auVar113._8_4_ = auVar231._8_4_;
    auVar113._0_8_ = auVar231._0_8_;
    auVar113._12_4_ = auVar231._12_4_;
    auVar195 = vpermilps_avx(auVar113,0xaa);
    register0x00001550 = auVar195;
    _local_e0 = auVar195;
    auVar196 = vpermilps_avx(auVar232,0xaa);
    register0x00001590 = auVar196;
    _local_100 = auVar196;
    auVar212 = vpermilps_avx(auVar168,0xaa);
    register0x00001310 = auVar212;
    _local_7e0 = auVar212;
    auVar239 = ZEXT3264(_local_7e0);
    auVar32 = auVar26 & auVar17;
    local_820 = *(uint *)(ray + k * 4 + 0x30);
    uStack_81c = 0;
    uStack_818 = 0;
    uStack_814 = 0;
    uStack_698 = auVar168._8_8_;
    local_6a0 = CONCAT44(0,uVar132);
    auVar283 = ZEXT416(uVar132);
    local_5d0 = ZEXT416(uVar130);
    uStack_838 = auVar262._8_8_;
    fVar330 = fVar323;
    fVar333 = fVar166;
    fVar181 = fVar257;
    fVar183 = fVar297;
    fVar268 = fVar367;
    fVar270 = fVar372;
    fVar310 = fVar373;
    fVar313 = fVar188;
    fVar364 = fVar202;
    fVar365 = fVar204;
    _local_780 = auVar343;
    _local_770 = auVar368;
    _local_760 = auVar358;
    local_440 = auVar211._0_4_;
    if ((((((((auVar32 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar32 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar32 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar32 >> 0x7f,0) == '\0') &&
          (auVar32 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar32 >> 0xbf,0) == '\0') &&
        (auVar32 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar32[0x1f]) {
      auVar348 = ZEXT3264(auVar153);
      auVar322 = ZEXT3264(_local_800);
LAB_0093931c:
      auVar233 = local_6e0._0_16_;
    }
    else {
      auVar283 = ZEXT416(uVar132);
      local_5c0._0_16_ = auVar283;
      local_300 = vandps_avx(auVar17,auVar26);
      fVar299 = auVar170._0_4_;
      fVar309 = auVar170._4_4_;
      fVar311 = auVar170._8_4_;
      fVar314 = auVar170._12_4_;
      fVar350 = auVar195._0_4_;
      fVar353 = auVar195._4_4_;
      fVar354 = auVar195._8_4_;
      fVar355 = auVar195._12_4_;
      fVar357 = auVar196._0_4_;
      fVar361 = auVar196._4_4_;
      fVar362 = auVar196._8_4_;
      fVar363 = auVar196._12_4_;
      local_4a0._0_4_ = auVar125._0_4_;
      local_4a0._4_4_ = auVar125._4_4_;
      fStack_498 = auVar125._8_4_;
      fStack_494 = auVar125._12_4_;
      fStack_490 = auVar125._16_4_;
      fStack_48c = auVar125._20_4_;
      fStack_488 = auVar125._24_4_;
      fVar227 = auVar212._0_4_;
      fVar240 = auVar212._4_4_;
      fVar241 = auVar212._8_4_;
      fVar242 = auVar212._12_4_;
      fVar332 = auVar26._28_4_ + *(float *)(catmullrom_basis1 + lVar137 + 0x924) + 0.0;
      local_320 = auVar24;
      local_4a0._0_4_ =
           fVar299 * fVar256 +
           fVar350 * fVar164 + fVar357 * fVar295 + fVar227 * (float)local_4a0._0_4_;
      local_4a0._4_4_ =
           fVar309 * fVar222 +
           fVar353 * fVar141 + fVar361 * fVar296 + fVar240 * (float)local_4a0._4_4_;
      fStack_498 = fVar311 * fVar225 + fVar354 * fVar160 + fVar362 * fVar226 + fVar241 * fStack_498;
      fStack_494 = fVar314 * fVar279 + fVar355 * fVar162 + fVar363 * fVar140 + fVar242 * fStack_494;
      fStack_490 = fVar299 * fVar288 + fVar350 * fVar163 + fVar357 * fVar159 + fVar227 * fStack_490;
      fStack_48c = fVar309 * fVar291 + fVar353 * fVar243 + fVar361 * fVar161 + fVar240 * fStack_48c;
      fStack_488 = fVar311 * fVar292 + fVar354 * fVar165 + fVar362 * fVar186 + fVar241 * fStack_488;
      fStack_484 = local_300._28_4_ + fVar332;
      local_620._0_4_ = auVar124._0_4_;
      local_620._4_4_ = auVar124._4_4_;
      fStack_618 = auVar124._8_4_;
      fStack_614 = auVar124._12_4_;
      fStack_610 = auVar124._16_4_;
      fStack_60c = auVar124._20_4_;
      fStack_608 = auVar124._24_4_;
      local_5a0 = fVar299 * fVar293 +
                  fVar350 * fVar281 + fVar357 * fVar335 + fVar227 * (float)local_620._0_4_;
      fStack_59c = fVar309 * fVar294 +
                   fVar353 * fVar220 + fVar361 * fVar269 + fVar240 * (float)local_620._4_4_;
      fStack_598 = fVar311 * fVar223 + fVar354 * fVar272 + fVar362 * fVar337 + fVar241 * fStack_618;
      fStack_594 = fVar314 * fVar276 + fVar355 * fVar289 + fVar363 * fVar336 + fVar242 * fStack_614;
      fStack_590 = fVar299 * fStack_470 +
                   fVar350 * fVar290 + fVar357 * fVar338 + fVar227 * fStack_610;
      fStack_58c = fVar309 * fStack_46c +
                   fVar353 * fVar221 + fVar361 * fVar271 + fVar240 * fStack_60c;
      fStack_588 = fVar311 * fStack_468 +
                   fVar354 * fVar274 + fVar362 * fVar280 + fVar241 * fStack_608;
      fStack_584 = fStack_484 + fVar332 + local_300._28_4_ + auVar26._28_4_;
      fVar332 = *(float *)(catmullrom_basis0 + lVar137 + 0x1210);
      fVar224 = *(float *)(catmullrom_basis0 + lVar137 + 0x1214);
      fVar334 = *(float *)(catmullrom_basis0 + lVar137 + 0x1218);
      fVar185 = *(float *)(catmullrom_basis0 + lVar137 + 0x121c);
      fVar335 = *(float *)(catmullrom_basis0 + lVar137 + 0x1220);
      fVar269 = *(float *)(catmullrom_basis0 + lVar137 + 0x1224);
      fVar337 = *(float *)(catmullrom_basis0 + lVar137 + 0x1228);
      fVar336 = *(float *)(catmullrom_basis0 + lVar137 + 0x1694);
      fVar338 = *(float *)(catmullrom_basis0 + lVar137 + 0x1698);
      fVar271 = *(float *)(catmullrom_basis0 + lVar137 + 0x169c);
      fVar280 = *(float *)(catmullrom_basis0 + lVar137 + 0x16a0);
      fVar281 = *(float *)(catmullrom_basis0 + lVar137 + 0x16a4);
      fVar220 = *(float *)(catmullrom_basis0 + lVar137 + 0x16a8);
      fVar272 = *(float *)(catmullrom_basis0 + lVar137 + 0x16ac);
      fVar289 = *(float *)(catmullrom_basis0 + lVar137 + 0x1b18);
      fVar290 = *(float *)(catmullrom_basis0 + lVar137 + 0x1b1c);
      fVar221 = *(float *)(catmullrom_basis0 + lVar137 + 0x1b20);
      fVar274 = *(float *)(catmullrom_basis0 + lVar137 + 0x1b24);
      fVar293 = *(float *)(catmullrom_basis0 + lVar137 + 0x1b28);
      fVar294 = *(float *)(catmullrom_basis0 + lVar137 + 0x1b2c);
      fVar223 = *(float *)(catmullrom_basis0 + lVar137 + 0x1b30);
      fVar276 = *(float *)(catmullrom_basis0 + lVar137 + 0x1f9c);
      fVar295 = *(float *)(catmullrom_basis0 + lVar137 + 0x1fa0);
      fVar296 = *(float *)(catmullrom_basis0 + lVar137 + 0x1fa4);
      fVar226 = *(float *)(catmullrom_basis0 + lVar137 + 0x1fa8);
      fVar140 = *(float *)(catmullrom_basis0 + lVar137 + 0x1fac);
      fVar159 = *(float *)(catmullrom_basis0 + lVar137 + 0x1fb0);
      fVar161 = *(float *)(catmullrom_basis0 + lVar137 + 0x1fb4);
      fVar186 = *(float *)(catmullrom_basis0 + lVar137 + 0x1b34) +
                *(float *)(catmullrom_basis0 + lVar137 + 0x1fb8);
      fVar278 = *(float *)(catmullrom_basis0 + lVar137 + 0x16b0) + fVar186;
      auVar251._0_4_ = fVar188 * fVar332 + fVar331 * fVar336 + fVar187 * fVar289 + fVar323 * fVar276
      ;
      auVar251._4_4_ = fVar202 * fVar224 + fVar219 * fVar338 + fVar201 * fVar290 + fVar166 * fVar295
      ;
      auVar251._8_4_ = fVar204 * fVar334 + fVar265 * fVar271 + fVar203 * fVar221 + fVar257 * fVar296
      ;
      auVar251._12_4_ =
           fVar206 * fVar185 + fVar307 * fVar280 + fVar205 * fVar274 + fVar297 * fVar226;
      auVar251._16_4_ =
           fVar188 * fVar335 + fVar331 * fVar281 + fVar187 * fVar293 + fVar323 * fVar140;
      auVar251._20_4_ =
           fVar202 * fVar269 + fVar219 * fVar220 + fVar201 * fVar294 + fVar166 * fVar159;
      auVar251._24_4_ =
           fVar204 * fVar337 + fVar265 * fVar272 + fVar203 * fVar223 + fVar257 * fVar161;
      auVar251._28_4_ =
           fVar186 + fVar314 + *(float *)(catmullrom_basis1 + lVar137 + 0x4a0) +
                     fVar314 + *(float *)(catmullrom_basis1 + lVar137 + 0x1c);
      local_480 = fVar299 * fVar332 + fVar350 * fVar336 + fVar357 * fVar289 + fVar227 * fVar276;
      fStack_47c = fVar309 * fVar224 + fVar353 * fVar338 + fVar361 * fVar290 + fVar240 * fVar295;
      fStack_478 = fVar311 * fVar334 + fVar354 * fVar271 + fVar362 * fVar221 + fVar241 * fVar296;
      fStack_474 = fVar314 * fVar185 + fVar355 * fVar280 + fVar363 * fVar274 + fVar242 * fVar226;
      fStack_470 = fVar299 * fVar335 + fVar350 * fVar281 + fVar357 * fVar293 + fVar227 * fVar140;
      fStack_46c = fVar309 * fVar269 + fVar353 * fVar220 + fVar361 * fVar294 + fVar240 * fVar159;
      fStack_468 = fVar311 * fVar337 + fVar354 * fVar272 + fVar362 * fVar223 + fVar241 * fVar161;
      fStack_464 = *(float *)(catmullrom_basis0 + lVar137 + 0x122c) + fVar278;
      fVar186 = *(float *)(catmullrom_basis1 + lVar137 + 0x1b18);
      fVar164 = *(float *)(catmullrom_basis1 + lVar137 + 0x1b1c);
      fVar141 = *(float *)(catmullrom_basis1 + lVar137 + 0x1b20);
      fVar160 = *(float *)(catmullrom_basis1 + lVar137 + 0x1b24);
      fVar162 = *(float *)(catmullrom_basis1 + lVar137 + 0x1b28);
      fVar163 = *(float *)(catmullrom_basis1 + lVar137 + 0x1b2c);
      fVar243 = *(float *)(catmullrom_basis1 + lVar137 + 0x1b30);
      fVar165 = *(float *)(catmullrom_basis1 + lVar137 + 0x1f9c);
      fVar256 = *(float *)(catmullrom_basis1 + lVar137 + 0x1fa0);
      fVar222 = *(float *)(catmullrom_basis1 + lVar137 + 0x1fa4);
      fVar225 = *(float *)(catmullrom_basis1 + lVar137 + 0x1fa8);
      fVar279 = *(float *)(catmullrom_basis1 + lVar137 + 0x1fac);
      fVar288 = *(float *)(catmullrom_basis1 + lVar137 + 0x1fb0);
      fVar291 = *(float *)(catmullrom_basis1 + lVar137 + 0x1fb4);
      fVar292 = *(float *)(catmullrom_basis1 + lVar137 + 0x1694);
      fVar298 = *(float *)(catmullrom_basis1 + lVar137 + 0x1698);
      fVar308 = *(float *)(catmullrom_basis1 + lVar137 + 0x169c);
      fVar259 = *(float *)(catmullrom_basis1 + lVar137 + 0x16a0);
      fVar312 = *(float *)(catmullrom_basis1 + lVar137 + 0x16a4);
      fVar315 = *(float *)(catmullrom_basis1 + lVar137 + 0x16a8);
      fVar316 = *(float *)(catmullrom_basis1 + lVar137 + 0x16ac);
      fVar317 = *(float *)(catmullrom_basis1 + lVar137 + 0x1210);
      fVar106 = *(float *)(catmullrom_basis1 + lVar137 + 0x1214);
      fVar107 = *(float *)(catmullrom_basis1 + lVar137 + 0x1218);
      fVar108 = *(float *)(catmullrom_basis1 + lVar137 + 0x121c);
      fVar109 = *(float *)(catmullrom_basis1 + lVar137 + 0x1220);
      fVar110 = *(float *)(catmullrom_basis1 + lVar137 + 0x1224);
      fVar111 = *(float *)(catmullrom_basis1 + lVar137 + 0x1228);
      auVar263._0_4_ = fVar267 * fVar317 + fVar367 * fVar292 + fVar167 * fVar186 + fVar273 * fVar165
      ;
      auVar263._4_4_ =
           fStack_43c * fVar106 + fVar372 * fVar298 + fVar180 * fVar164 + fVar275 * fVar256;
      auVar263._8_4_ =
           fStack_438 * fVar107 + fVar373 * fVar308 + fVar182 * fVar141 + fVar277 * fVar222;
      auVar263._12_4_ =
           fStack_434 * fVar108 + fVar374 * fVar259 + fVar184 * fVar160 + fVar300 * fVar225;
      auVar263._16_4_ =
           fVar267 * fVar109 + fVar367 * fVar312 + fVar167 * fVar162 + fVar273 * fVar279;
      auVar263._20_4_ =
           fStack_43c * fVar110 + fVar372 * fVar315 + fVar180 * fVar163 + fVar275 * fVar288;
      auVar263._24_4_ =
           fStack_438 * fVar111 + fVar373 * fVar316 + fVar182 * fVar243 + fVar277 * fVar291;
      auVar263._28_4_ = fVar300 + fVar300 + fVar314 + fVar278;
      auVar303._0_4_ = fVar188 * fVar317 + fVar331 * fVar292 + fVar187 * fVar186 + fVar323 * fVar165
      ;
      auVar303._4_4_ = fVar202 * fVar106 + fVar219 * fVar298 + fVar201 * fVar164 + fVar166 * fVar256
      ;
      auVar303._8_4_ = fVar204 * fVar107 + fVar265 * fVar308 + fVar203 * fVar141 + fVar257 * fVar222
      ;
      auVar303._12_4_ =
           fVar206 * fVar108 + fVar307 * fVar259 + fVar205 * fVar160 + fVar297 * fVar225;
      auVar303._16_4_ =
           fVar188 * fVar109 + fVar331 * fVar312 + fVar187 * fVar162 + fVar323 * fVar279;
      auVar303._20_4_ =
           fVar202 * fVar110 + fVar219 * fVar315 + fVar201 * fVar163 + fVar166 * fVar288;
      auVar303._24_4_ =
           fVar204 * fVar111 + fVar265 * fVar316 + fVar203 * fVar243 + fVar257 * fVar291;
      auVar303._28_4_ = fVar300 + fVar300 + fVar300 + fVar314;
      auVar199._0_4_ = fVar299 * fVar317 + fVar350 * fVar292 + fVar357 * fVar186 + fVar165 * fVar227
      ;
      auVar199._4_4_ = fVar309 * fVar106 + fVar353 * fVar298 + fVar361 * fVar164 + fVar256 * fVar240
      ;
      auVar199._8_4_ = fVar311 * fVar107 + fVar354 * fVar308 + fVar362 * fVar141 + fVar222 * fVar241
      ;
      auVar199._12_4_ =
           fVar314 * fVar108 + fVar355 * fVar259 + fVar363 * fVar160 + fVar225 * fVar242;
      auVar199._16_4_ =
           fVar299 * fVar109 + fVar350 * fVar312 + fVar357 * fVar162 + fVar279 * fVar227;
      auVar199._20_4_ =
           fVar309 * fVar110 + fVar353 * fVar315 + fVar361 * fVar163 + fVar288 * fVar240;
      auVar199._24_4_ =
           fVar311 * fVar111 + fVar354 * fVar316 + fVar362 * fVar243 + fVar291 * fVar241;
      auVar199._28_4_ =
           *(float *)(catmullrom_basis1 + lVar137 + 0x122c) +
           *(float *)(catmullrom_basis1 + lVar137 + 0x16b0) +
           *(float *)(catmullrom_basis1 + lVar137 + 0x1b34) +
           *(float *)(catmullrom_basis1 + lVar137 + 0x1fb8);
      auVar235._8_4_ = 0x7fffffff;
      auVar235._0_8_ = 0x7fffffff7fffffff;
      auVar235._12_4_ = 0x7fffffff;
      auVar235._16_4_ = 0x7fffffff;
      auVar235._20_4_ = 0x7fffffff;
      auVar235._24_4_ = 0x7fffffff;
      auVar235._28_4_ = 0x7fffffff;
      auVar116._4_4_ =
           fStack_43c * fVar224 + fVar372 * fVar338 + fVar180 * fVar290 + fVar275 * fVar295;
      auVar116._0_4_ = fVar267 * fVar332 + fVar367 * fVar336 + fVar167 * fVar289 + fVar273 * fVar276
      ;
      auVar116._8_4_ =
           fStack_438 * fVar334 + fVar373 * fVar271 + fVar182 * fVar221 + fVar277 * fVar296;
      auVar116._12_4_ =
           fStack_434 * fVar185 + fVar374 * fVar280 + fVar184 * fVar274 + fVar300 * fVar226;
      auVar116._16_4_ =
           fVar267 * fVar335 + fVar367 * fVar281 + fVar167 * fVar293 + fVar273 * fVar140;
      auVar116._20_4_ =
           fStack_43c * fVar269 + fVar372 * fVar220 + fVar180 * fVar294 + fVar275 * fVar159;
      auVar116._24_4_ =
           fStack_438 * fVar337 + fVar373 * fVar272 + fVar182 * fVar223 + fVar277 * fVar161;
      auVar116._28_4_ =
           *(float *)(catmullrom_basis0 + lVar137 + 0x16b0) +
           *(float *)(catmullrom_basis0 + lVar137 + 0x1fb8) +
           fVar314 + *(float *)(catmullrom_basis1 + lVar137 + 0x4a0);
      auVar17 = vandps_avx(auVar116,auVar235);
      auVar26 = vandps_avx(auVar251,auVar235);
      auVar26 = vmaxps_avx(auVar17,auVar26);
      auVar122._4_4_ = fStack_47c;
      auVar122._0_4_ = local_480;
      auVar122._8_4_ = fStack_478;
      auVar122._12_4_ = fStack_474;
      auVar122._16_4_ = fStack_470;
      auVar122._20_4_ = fStack_46c;
      auVar122._24_4_ = fStack_468;
      auVar122._28_4_ = fStack_464;
      auVar17 = vandps_avx(auVar235,auVar122);
      auVar17 = vmaxps_avx(auVar26,auVar17);
      auVar170 = vpermilps_avx(auVar233,0);
      auVar252._16_16_ = auVar170;
      auVar252._0_16_ = auVar170;
      auVar17 = vcmpps_avx(auVar17,auVar252,1);
      auVar32 = vblendvps_avx(auVar116,auVar24,auVar17);
      auVar18 = vblendvps_avx(auVar251,auVar25,auVar17);
      auVar17 = vandps_avx(auVar263,auVar235);
      auVar26 = vandps_avx(auVar303,auVar235);
      auVar214 = vmaxps_avx(auVar17,auVar26);
      auVar17 = vandps_avx(auVar199,auVar235);
      auVar17 = vmaxps_avx(auVar214,auVar17);
      auVar214 = vcmpps_avx(auVar17,auVar252,1);
      auVar17 = vblendvps_avx(auVar263,auVar24,auVar214);
      auVar24 = vblendvps_avx(auVar303,auVar25,auVar214);
      fVar140 = auVar32._0_4_;
      fVar159 = auVar32._4_4_;
      fVar161 = auVar32._8_4_;
      fVar186 = auVar32._12_4_;
      fVar164 = auVar32._16_4_;
      fVar141 = auVar32._20_4_;
      fVar160 = auVar32._24_4_;
      fVar162 = auVar17._0_4_;
      fVar163 = auVar17._4_4_;
      fVar243 = auVar17._8_4_;
      fVar165 = auVar17._12_4_;
      fVar256 = auVar17._16_4_;
      fVar222 = auVar17._20_4_;
      fVar225 = auVar17._24_4_;
      fVar279 = -auVar17._28_4_;
      fVar331 = auVar18._0_4_;
      fVar224 = auVar18._4_4_;
      fVar269 = auVar18._8_4_;
      fVar271 = auVar18._12_4_;
      fVar272 = auVar18._16_4_;
      fVar274 = auVar18._20_4_;
      fVar276 = auVar18._24_4_;
      auVar149._0_4_ = fVar331 * fVar331 + fVar140 * fVar140;
      auVar149._4_4_ = fVar224 * fVar224 + fVar159 * fVar159;
      auVar149._8_4_ = fVar269 * fVar269 + fVar161 * fVar161;
      auVar149._12_4_ = fVar271 * fVar271 + fVar186 * fVar186;
      auVar149._16_4_ = fVar272 * fVar272 + fVar164 * fVar164;
      auVar149._20_4_ = fVar274 * fVar274 + fVar141 * fVar141;
      auVar149._24_4_ = fVar276 * fVar276 + fVar160 * fVar160;
      auVar149._28_4_ = auVar303._28_4_ + auVar32._28_4_;
      auVar25 = vrsqrtps_avx(auVar149);
      fVar219 = auVar25._0_4_;
      fVar265 = auVar25._4_4_;
      auVar31._4_4_ = fVar265 * 1.5;
      auVar31._0_4_ = fVar219 * 1.5;
      fVar332 = auVar25._8_4_;
      auVar31._8_4_ = fVar332 * 1.5;
      fVar334 = auVar25._12_4_;
      auVar31._12_4_ = fVar334 * 1.5;
      fVar185 = auVar25._16_4_;
      auVar31._16_4_ = fVar185 * 1.5;
      fVar335 = auVar25._20_4_;
      auVar31._20_4_ = fVar335 * 1.5;
      fVar337 = auVar25._24_4_;
      fStack_624 = auVar26._28_4_;
      auVar31._24_4_ = fVar337 * 1.5;
      auVar31._28_4_ = fStack_624;
      auVar25._4_4_ = fVar265 * fVar265 * fVar265 * auVar149._4_4_ * 0.5;
      auVar25._0_4_ = fVar219 * fVar219 * fVar219 * auVar149._0_4_ * 0.5;
      auVar25._8_4_ = fVar332 * fVar332 * fVar332 * auVar149._8_4_ * 0.5;
      auVar25._12_4_ = fVar334 * fVar334 * fVar334 * auVar149._12_4_ * 0.5;
      auVar25._16_4_ = fVar185 * fVar185 * fVar185 * auVar149._16_4_ * 0.5;
      auVar25._20_4_ = fVar335 * fVar335 * fVar335 * auVar149._20_4_ * 0.5;
      auVar25._24_4_ = fVar337 * fVar337 * fVar337 * auVar149._24_4_ * 0.5;
      auVar25._28_4_ = auVar149._28_4_;
      auVar26 = vsubps_avx(auVar31,auVar25);
      fVar219 = auVar26._0_4_;
      fVar334 = auVar26._4_4_;
      fVar337 = auVar26._8_4_;
      fVar280 = auVar26._12_4_;
      fVar289 = auVar26._16_4_;
      fVar293 = auVar26._20_4_;
      fVar295 = auVar26._24_4_;
      fVar265 = auVar24._0_4_;
      fVar185 = auVar24._4_4_;
      fVar336 = auVar24._8_4_;
      fVar281 = auVar24._12_4_;
      fVar290 = auVar24._16_4_;
      fVar294 = auVar24._20_4_;
      fVar296 = auVar24._24_4_;
      auVar150._0_4_ = fVar265 * fVar265 + fVar162 * fVar162;
      auVar150._4_4_ = fVar185 * fVar185 + fVar163 * fVar163;
      auVar150._8_4_ = fVar336 * fVar336 + fVar243 * fVar243;
      auVar150._12_4_ = fVar281 * fVar281 + fVar165 * fVar165;
      auVar150._16_4_ = fVar290 * fVar290 + fVar256 * fVar256;
      auVar150._20_4_ = fVar294 * fVar294 + fVar222 * fVar222;
      auVar150._24_4_ = fVar296 * fVar296 + fVar225 * fVar225;
      auVar150._28_4_ = auVar17._28_4_ + auVar26._28_4_;
      auVar17 = vrsqrtps_avx(auVar150);
      fVar332 = auVar17._0_4_;
      fVar335 = auVar17._4_4_;
      auVar27._4_4_ = fVar335 * 1.5;
      auVar27._0_4_ = fVar332 * 1.5;
      fVar338 = auVar17._8_4_;
      auVar27._8_4_ = fVar338 * 1.5;
      fVar220 = auVar17._12_4_;
      auVar27._12_4_ = fVar220 * 1.5;
      fVar221 = auVar17._16_4_;
      auVar27._16_4_ = fVar221 * 1.5;
      fVar223 = auVar17._20_4_;
      auVar27._20_4_ = fVar223 * 1.5;
      fVar226 = auVar17._24_4_;
      auVar27._24_4_ = fVar226 * 1.5;
      auVar27._28_4_ = fStack_624;
      auVar28._4_4_ = fVar335 * fVar335 * fVar335 * auVar150._4_4_ * 0.5;
      auVar28._0_4_ = fVar332 * fVar332 * fVar332 * auVar150._0_4_ * 0.5;
      auVar28._8_4_ = fVar338 * fVar338 * fVar338 * auVar150._8_4_ * 0.5;
      auVar28._12_4_ = fVar220 * fVar220 * fVar220 * auVar150._12_4_ * 0.5;
      auVar28._16_4_ = fVar221 * fVar221 * fVar221 * auVar150._16_4_ * 0.5;
      auVar28._20_4_ = fVar223 * fVar223 * fVar223 * auVar150._20_4_ * 0.5;
      auVar28._24_4_ = fVar226 * fVar226 * fVar226 * auVar150._24_4_ * 0.5;
      auVar28._28_4_ = auVar150._28_4_;
      auVar17 = vsubps_avx(auVar27,auVar28);
      fVar332 = auVar17._0_4_;
      fVar335 = auVar17._4_4_;
      fVar338 = auVar17._8_4_;
      fVar220 = auVar17._12_4_;
      fVar221 = auVar17._16_4_;
      fVar223 = auVar17._20_4_;
      fVar226 = auVar17._24_4_;
      fVar331 = auVar148._0_4_ * fVar331 * fVar219;
      fVar224 = auVar148._4_4_ * fVar224 * fVar334;
      auVar29._4_4_ = fVar224;
      auVar29._0_4_ = fVar331;
      fVar269 = auVar148._8_4_ * fVar269 * fVar337;
      auVar29._8_4_ = fVar269;
      fVar271 = auVar148._12_4_ * fVar271 * fVar280;
      auVar29._12_4_ = fVar271;
      fVar272 = auVar148._16_4_ * fVar272 * fVar289;
      auVar29._16_4_ = fVar272;
      fVar274 = auVar148._20_4_ * fVar274 * fVar293;
      auVar29._20_4_ = fVar274;
      fVar276 = auVar148._24_4_ * fVar276 * fVar295;
      auVar29._24_4_ = fVar276;
      auVar29._28_4_ = fVar279;
      local_620._4_4_ = auVar327._4_4_ + fVar224;
      local_620._0_4_ = auVar327._0_4_ + fVar331;
      fStack_618 = auVar327._8_4_ + fVar269;
      fStack_614 = auVar327._12_4_ + fVar271;
      fStack_610 = auVar327._16_4_ + fVar272;
      fStack_60c = auVar327._20_4_ + fVar274;
      fStack_608 = auVar327._24_4_ + fVar276;
      fStack_604 = auVar327._28_4_ + fVar279;
      local_640 = auVar148._0_4_ * fVar219 * -fVar140;
      fStack_63c = auVar148._4_4_ * fVar334 * -fVar159;
      auVar30._4_4_ = fStack_63c;
      auVar30._0_4_ = local_640;
      fStack_638 = auVar148._8_4_ * fVar337 * -fVar161;
      auVar30._8_4_ = fStack_638;
      fStack_634 = auVar148._12_4_ * fVar280 * -fVar186;
      auVar30._12_4_ = fStack_634;
      fStack_630 = auVar148._16_4_ * fVar289 * -fVar164;
      auVar30._16_4_ = fStack_630;
      fStack_62c = auVar148._20_4_ * fVar293 * -fVar141;
      auVar30._20_4_ = fStack_62c;
      fStack_628 = auVar148._24_4_ * fVar295 * -fVar160;
      auVar30._24_4_ = fStack_628;
      auVar30._28_4_ = fStack_624;
      local_640 = local_640 + auVar284._0_4_;
      fStack_63c = fStack_63c + auVar284._4_4_;
      fStack_638 = fStack_638 + auVar284._8_4_;
      fStack_634 = fStack_634 + auVar284._12_4_;
      fStack_630 = fStack_630 + auVar284._16_4_;
      fStack_62c = fStack_62c + auVar284._20_4_;
      fStack_628 = fStack_628 + auVar284._24_4_;
      fStack_624 = fStack_624 + auVar284._28_4_;
      fVar331 = auVar148._0_4_ * fVar219 * 0.0;
      fVar219 = auVar148._4_4_ * fVar334 * 0.0;
      auVar33._4_4_ = fVar219;
      auVar33._0_4_ = fVar331;
      fVar224 = auVar148._8_4_ * fVar337 * 0.0;
      auVar33._8_4_ = fVar224;
      fVar334 = auVar148._12_4_ * fVar280 * 0.0;
      auVar33._12_4_ = fVar334;
      fVar269 = auVar148._16_4_ * fVar289 * 0.0;
      auVar33._16_4_ = fVar269;
      fVar337 = auVar148._20_4_ * fVar293 * 0.0;
      auVar33._20_4_ = fVar337;
      fVar271 = auVar148._24_4_ * fVar295 * 0.0;
      auVar33._24_4_ = fVar271;
      auVar33._28_4_ = fVar297;
      auVar119._4_4_ = fStack_59c;
      auVar119._0_4_ = local_5a0;
      auVar119._8_4_ = fStack_598;
      auVar119._12_4_ = fStack_594;
      auVar119._16_4_ = fStack_590;
      auVar119._20_4_ = fStack_58c;
      auVar119._24_4_ = fStack_588;
      auVar119._28_4_ = fStack_584;
      auVar253._0_4_ = fVar331 + local_5a0;
      auVar253._4_4_ = fVar219 + fStack_59c;
      auVar253._8_4_ = fVar224 + fStack_598;
      auVar253._12_4_ = fVar334 + fStack_594;
      auVar253._16_4_ = fVar269 + fStack_590;
      auVar253._20_4_ = fVar337 + fStack_58c;
      auVar253._24_4_ = fVar271 + fStack_588;
      auVar253._28_4_ = fVar297 + fStack_584;
      fVar331 = auVar246._0_4_ * fVar265 * fVar332;
      fVar219 = auVar246._4_4_ * fVar185 * fVar335;
      auVar34._4_4_ = fVar219;
      auVar34._0_4_ = fVar331;
      fVar265 = auVar246._8_4_ * fVar336 * fVar338;
      auVar34._8_4_ = fVar265;
      fVar224 = auVar246._12_4_ * fVar281 * fVar220;
      auVar34._12_4_ = fVar224;
      fVar334 = auVar246._16_4_ * fVar290 * fVar221;
      auVar34._16_4_ = fVar334;
      fVar185 = auVar246._20_4_ * fVar294 * fVar223;
      auVar34._20_4_ = fVar185;
      fVar269 = auVar246._24_4_ * fVar296 * fVar226;
      auVar34._24_4_ = fVar269;
      auVar34._28_4_ = auVar24._28_4_;
      auVar214 = vsubps_avx(auVar327,auVar29);
      auVar304._0_4_ = auVar234._0_4_ + fVar331;
      auVar304._4_4_ = auVar234._4_4_ + fVar219;
      auVar304._8_4_ = auVar234._8_4_ + fVar265;
      auVar304._12_4_ = auVar234._12_4_ + fVar224;
      auVar304._16_4_ = auVar234._16_4_ + fVar334;
      auVar304._20_4_ = auVar234._20_4_ + fVar185;
      auVar304._24_4_ = auVar234._24_4_ + fVar269;
      auVar304._28_4_ = auVar234._28_4_ + auVar24._28_4_;
      fVar331 = auVar246._0_4_ * fVar332 * -fVar162;
      fVar219 = auVar246._4_4_ * fVar335 * -fVar163;
      auVar24._4_4_ = fVar219;
      auVar24._0_4_ = fVar331;
      fVar265 = auVar246._8_4_ * fVar338 * -fVar243;
      auVar24._8_4_ = fVar265;
      fVar224 = auVar246._12_4_ * fVar220 * -fVar165;
      auVar24._12_4_ = fVar224;
      fVar334 = auVar246._16_4_ * fVar221 * -fVar256;
      auVar24._16_4_ = fVar334;
      fVar185 = auVar246._20_4_ * fVar223 * -fVar222;
      auVar24._20_4_ = fVar185;
      fVar269 = auVar246._24_4_ * fVar226 * -fVar225;
      auVar24._24_4_ = fVar269;
      auVar24._28_4_ = fVar355;
      auVar284 = vsubps_avx(auVar284,auVar30);
      auVar319._0_4_ = fVar331 + auVar213._0_4_;
      auVar319._4_4_ = fVar219 + auVar213._4_4_;
      auVar319._8_4_ = fVar265 + auVar213._8_4_;
      auVar319._12_4_ = fVar224 + auVar213._12_4_;
      auVar319._16_4_ = fVar334 + auVar213._16_4_;
      auVar319._20_4_ = fVar185 + auVar213._20_4_;
      auVar319._24_4_ = fVar269 + auVar213._24_4_;
      auVar319._28_4_ = fVar355 + auVar213._28_4_;
      fVar331 = auVar246._0_4_ * fVar332 * 0.0;
      fVar219 = auVar246._4_4_ * fVar335 * 0.0;
      auVar35._4_4_ = fVar219;
      auVar35._0_4_ = fVar331;
      fVar265 = auVar246._8_4_ * fVar338 * 0.0;
      auVar35._8_4_ = fVar265;
      fVar332 = auVar246._12_4_ * fVar220 * 0.0;
      auVar35._12_4_ = fVar332;
      fVar224 = auVar246._16_4_ * fVar221 * 0.0;
      auVar35._16_4_ = fVar224;
      fVar334 = auVar246._20_4_ * fVar223 * 0.0;
      auVar35._20_4_ = fVar334;
      fVar185 = auVar246._24_4_ * fVar226 * 0.0;
      auVar35._24_4_ = fVar185;
      auVar35._28_4_ = 0x3f000000;
      auVar27 = vsubps_avx(auVar119,auVar33);
      auVar359._0_4_ = fVar331 + (float)local_4a0._0_4_;
      auVar359._4_4_ = fVar219 + (float)local_4a0._4_4_;
      auVar359._8_4_ = fVar265 + fStack_498;
      auVar359._12_4_ = fVar332 + fStack_494;
      auVar359._16_4_ = fVar224 + fStack_490;
      auVar359._20_4_ = fVar334 + fStack_48c;
      auVar359._24_4_ = fVar185 + fStack_488;
      auVar359._28_4_ = fStack_484 + 0.5;
      auVar17 = vsubps_avx(auVar234,auVar34);
      auVar26 = vsubps_avx(auVar213,auVar24);
      auVar28 = vsubps_avx(_local_4a0,auVar35);
      auVar24 = vsubps_avx(auVar319,auVar284);
      auVar25 = vsubps_avx(auVar359,auVar27);
      auVar36._4_4_ = auVar27._4_4_ * auVar24._4_4_;
      auVar36._0_4_ = auVar27._0_4_ * auVar24._0_4_;
      auVar36._8_4_ = auVar27._8_4_ * auVar24._8_4_;
      auVar36._12_4_ = auVar27._12_4_ * auVar24._12_4_;
      auVar36._16_4_ = auVar27._16_4_ * auVar24._16_4_;
      auVar36._20_4_ = auVar27._20_4_ * auVar24._20_4_;
      auVar36._24_4_ = auVar27._24_4_ * auVar24._24_4_;
      auVar36._28_4_ = fVar307;
      auVar37._4_4_ = auVar284._4_4_ * auVar25._4_4_;
      auVar37._0_4_ = auVar284._0_4_ * auVar25._0_4_;
      auVar37._8_4_ = auVar284._8_4_ * auVar25._8_4_;
      auVar37._12_4_ = auVar284._12_4_ * auVar25._12_4_;
      auVar37._16_4_ = auVar284._16_4_ * auVar25._16_4_;
      auVar37._20_4_ = auVar284._20_4_ * auVar25._20_4_;
      auVar37._24_4_ = auVar284._24_4_ * auVar25._24_4_;
      auVar37._28_4_ = auVar213._28_4_;
      auVar32 = vsubps_avx(auVar37,auVar36);
      auVar38._4_4_ = auVar214._4_4_ * auVar25._4_4_;
      auVar38._0_4_ = auVar214._0_4_ * auVar25._0_4_;
      auVar38._8_4_ = auVar214._8_4_ * auVar25._8_4_;
      auVar38._12_4_ = auVar214._12_4_ * auVar25._12_4_;
      auVar38._16_4_ = auVar214._16_4_ * auVar25._16_4_;
      auVar38._20_4_ = auVar214._20_4_ * auVar25._20_4_;
      auVar38._24_4_ = auVar214._24_4_ * auVar25._24_4_;
      auVar38._28_4_ = auVar25._28_4_;
      auVar18 = vsubps_avx(auVar304,auVar214);
      auVar39._4_4_ = auVar27._4_4_ * auVar18._4_4_;
      auVar39._0_4_ = auVar27._0_4_ * auVar18._0_4_;
      auVar39._8_4_ = auVar27._8_4_ * auVar18._8_4_;
      auVar39._12_4_ = auVar27._12_4_ * auVar18._12_4_;
      auVar39._16_4_ = auVar27._16_4_ * auVar18._16_4_;
      auVar39._20_4_ = auVar27._20_4_ * auVar18._20_4_;
      auVar39._24_4_ = auVar27._24_4_ * auVar18._24_4_;
      auVar39._28_4_ = auVar234._28_4_;
      auVar234 = vsubps_avx(auVar39,auVar38);
      auVar40._4_4_ = auVar18._4_4_ * auVar284._4_4_;
      auVar40._0_4_ = auVar18._0_4_ * auVar284._0_4_;
      auVar40._8_4_ = auVar18._8_4_ * auVar284._8_4_;
      auVar40._12_4_ = auVar18._12_4_ * auVar284._12_4_;
      auVar40._16_4_ = auVar18._16_4_ * auVar284._16_4_;
      auVar40._20_4_ = auVar18._20_4_ * auVar284._20_4_;
      auVar40._24_4_ = auVar18._24_4_ * auVar284._24_4_;
      auVar40._28_4_ = auVar25._28_4_;
      auVar41._4_4_ = auVar214._4_4_ * auVar24._4_4_;
      auVar41._0_4_ = auVar214._0_4_ * auVar24._0_4_;
      auVar41._8_4_ = auVar214._8_4_ * auVar24._8_4_;
      auVar41._12_4_ = auVar214._12_4_ * auVar24._12_4_;
      auVar41._16_4_ = auVar214._16_4_ * auVar24._16_4_;
      auVar41._20_4_ = auVar214._20_4_ * auVar24._20_4_;
      auVar41._24_4_ = auVar214._24_4_ * auVar24._24_4_;
      auVar41._28_4_ = auVar24._28_4_;
      auVar24 = vsubps_avx(auVar41,auVar40);
      auVar151._0_4_ = auVar32._0_4_ * 0.0 + auVar24._0_4_ + auVar234._0_4_ * 0.0;
      auVar151._4_4_ = auVar32._4_4_ * 0.0 + auVar24._4_4_ + auVar234._4_4_ * 0.0;
      auVar151._8_4_ = auVar32._8_4_ * 0.0 + auVar24._8_4_ + auVar234._8_4_ * 0.0;
      auVar151._12_4_ = auVar32._12_4_ * 0.0 + auVar24._12_4_ + auVar234._12_4_ * 0.0;
      auVar151._16_4_ = auVar32._16_4_ * 0.0 + auVar24._16_4_ + auVar234._16_4_ * 0.0;
      auVar151._20_4_ = auVar32._20_4_ * 0.0 + auVar24._20_4_ + auVar234._20_4_ * 0.0;
      auVar151._24_4_ = auVar32._24_4_ * 0.0 + auVar24._24_4_ + auVar234._24_4_ * 0.0;
      auVar151._28_4_ = auVar24._28_4_ + auVar24._28_4_ + auVar234._28_4_;
      auVar31 = vcmpps_avx(auVar151,ZEXT432(0) << 0x20,2);
      auVar17 = vblendvps_avx(auVar17,_local_620,auVar31);
      auVar117._4_4_ = fStack_63c;
      auVar117._0_4_ = local_640;
      auVar117._8_4_ = fStack_638;
      auVar117._12_4_ = fStack_634;
      auVar117._16_4_ = fStack_630;
      auVar117._20_4_ = fStack_62c;
      auVar117._24_4_ = fStack_628;
      auVar117._28_4_ = fStack_624;
      auVar26 = vblendvps_avx(auVar26,auVar117,auVar31);
      auVar24 = vblendvps_avx(auVar28,auVar253,auVar31);
      auVar25 = vblendvps_avx(auVar214,auVar304,auVar31);
      auVar32 = vblendvps_avx(auVar284,auVar319,auVar31);
      auVar18 = vblendvps_avx(auVar27,auVar359,auVar31);
      auVar214 = vblendvps_avx(auVar304,auVar214,auVar31);
      auVar234 = vblendvps_avx(auVar319,auVar284,auVar31);
      auVar170 = vpackssdw_avx(local_300._0_16_,local_300._16_16_);
      _auStack_5f0 = auVar327._16_16_;
      auVar284 = vblendvps_avx(auVar359,auVar27,auVar31);
      auVar214 = vsubps_avx(auVar214,auVar17);
      auVar327 = vsubps_avx(auVar234,auVar26);
      auVar284 = vsubps_avx(auVar284,auVar24);
      auVar27 = vsubps_avx(auVar26,auVar32);
      fVar331 = auVar327._0_4_;
      fVar160 = auVar24._0_4_;
      fVar224 = auVar327._4_4_;
      fVar162 = auVar24._4_4_;
      auVar42._4_4_ = fVar162 * fVar224;
      auVar42._0_4_ = fVar160 * fVar331;
      fVar337 = auVar327._8_4_;
      fVar163 = auVar24._8_4_;
      auVar42._8_4_ = fVar163 * fVar337;
      fVar281 = auVar327._12_4_;
      fVar243 = auVar24._12_4_;
      auVar42._12_4_ = fVar243 * fVar281;
      fVar221 = auVar327._16_4_;
      fVar165 = auVar24._16_4_;
      auVar42._16_4_ = fVar165 * fVar221;
      fVar276 = auVar327._20_4_;
      fVar256 = auVar24._20_4_;
      auVar42._20_4_ = fVar256 * fVar276;
      fVar159 = auVar327._24_4_;
      fVar222 = auVar24._24_4_;
      auVar42._24_4_ = fVar222 * fVar159;
      auVar42._28_4_ = auVar234._28_4_;
      fVar219 = auVar26._0_4_;
      fVar203 = auVar284._0_4_;
      fVar334 = auVar26._4_4_;
      fVar205 = auVar284._4_4_;
      auVar43._4_4_ = fVar205 * fVar334;
      auVar43._0_4_ = fVar203 * fVar219;
      fVar336 = auVar26._8_4_;
      fVar298 = auVar284._8_4_;
      auVar43._8_4_ = fVar298 * fVar336;
      fVar220 = auVar26._12_4_;
      fVar308 = auVar284._12_4_;
      auVar43._12_4_ = fVar308 * fVar220;
      fVar274 = auVar26._16_4_;
      fVar259 = auVar284._16_4_;
      auVar43._16_4_ = fVar259 * fVar274;
      fVar295 = auVar26._20_4_;
      fVar267 = auVar284._20_4_;
      auVar43._20_4_ = fVar267 * fVar295;
      fVar161 = auVar26._24_4_;
      fVar273 = auVar284._24_4_;
      uVar138 = auVar28._28_4_;
      auVar43._24_4_ = fVar273 * fVar161;
      auVar43._28_4_ = uVar138;
      auVar234 = vsubps_avx(auVar43,auVar42);
      fVar265 = auVar17._0_4_;
      fVar185 = auVar17._4_4_;
      auVar44._4_4_ = fVar205 * fVar185;
      auVar44._0_4_ = fVar203 * fVar265;
      fVar338 = auVar17._8_4_;
      auVar44._8_4_ = fVar298 * fVar338;
      fVar272 = auVar17._12_4_;
      auVar44._12_4_ = fVar308 * fVar272;
      fVar293 = auVar17._16_4_;
      auVar44._16_4_ = fVar259 * fVar293;
      fVar296 = auVar17._20_4_;
      auVar44._20_4_ = fVar267 * fVar296;
      fVar186 = auVar17._24_4_;
      auVar44._24_4_ = fVar273 * fVar186;
      auVar44._28_4_ = uVar138;
      fVar307 = auVar214._0_4_;
      fVar335 = auVar214._4_4_;
      auVar45._4_4_ = fVar162 * fVar335;
      auVar45._0_4_ = fVar160 * fVar307;
      fVar271 = auVar214._8_4_;
      auVar45._8_4_ = fVar163 * fVar271;
      fVar289 = auVar214._12_4_;
      auVar45._12_4_ = fVar243 * fVar289;
      fVar294 = auVar214._16_4_;
      auVar45._16_4_ = fVar165 * fVar294;
      fVar226 = auVar214._20_4_;
      auVar45._20_4_ = fVar256 * fVar226;
      fVar164 = auVar214._24_4_;
      auVar45._24_4_ = fVar222 * fVar164;
      auVar45._28_4_ = auVar359._28_4_;
      auVar28 = vsubps_avx(auVar45,auVar44);
      auVar46._4_4_ = fVar334 * fVar335;
      auVar46._0_4_ = fVar219 * fVar307;
      auVar46._8_4_ = fVar336 * fVar271;
      auVar46._12_4_ = fVar220 * fVar289;
      auVar46._16_4_ = fVar274 * fVar294;
      auVar46._20_4_ = fVar295 * fVar226;
      auVar46._24_4_ = fVar161 * fVar164;
      auVar46._28_4_ = uVar138;
      auVar369._0_4_ = fVar265 * fVar331;
      auVar369._4_4_ = fVar185 * fVar224;
      auVar369._8_4_ = fVar338 * fVar337;
      auVar369._12_4_ = fVar272 * fVar281;
      auVar369._16_4_ = fVar293 * fVar221;
      auVar369._20_4_ = fVar296 * fVar276;
      auVar369._24_4_ = fVar186 * fVar159;
      auVar369._28_4_ = 0;
      auVar29 = vsubps_avx(auVar369,auVar46);
      auVar30 = vsubps_avx(auVar24,auVar18);
      fVar332 = auVar29._28_4_ + auVar28._28_4_;
      auVar174._0_4_ = auVar29._0_4_ + auVar28._0_4_ * 0.0 + auVar234._0_4_ * 0.0;
      auVar174._4_4_ = auVar29._4_4_ + auVar28._4_4_ * 0.0 + auVar234._4_4_ * 0.0;
      auVar174._8_4_ = auVar29._8_4_ + auVar28._8_4_ * 0.0 + auVar234._8_4_ * 0.0;
      auVar174._12_4_ = auVar29._12_4_ + auVar28._12_4_ * 0.0 + auVar234._12_4_ * 0.0;
      auVar174._16_4_ = auVar29._16_4_ + auVar28._16_4_ * 0.0 + auVar234._16_4_ * 0.0;
      auVar174._20_4_ = auVar29._20_4_ + auVar28._20_4_ * 0.0 + auVar234._20_4_ * 0.0;
      auVar174._24_4_ = auVar29._24_4_ + auVar28._24_4_ * 0.0 + auVar234._24_4_ * 0.0;
      auVar174._28_4_ = fVar332 + auVar234._28_4_;
      fVar225 = auVar27._0_4_;
      fVar279 = auVar27._4_4_;
      auVar47._4_4_ = fVar279 * auVar18._4_4_;
      auVar47._0_4_ = fVar225 * auVar18._0_4_;
      fVar288 = auVar27._8_4_;
      auVar47._8_4_ = fVar288 * auVar18._8_4_;
      fVar291 = auVar27._12_4_;
      auVar47._12_4_ = fVar291 * auVar18._12_4_;
      fVar292 = auVar27._16_4_;
      auVar47._16_4_ = fVar292 * auVar18._16_4_;
      fVar187 = auVar27._20_4_;
      auVar47._20_4_ = fVar187 * auVar18._20_4_;
      fVar201 = auVar27._24_4_;
      auVar47._24_4_ = fVar201 * auVar18._24_4_;
      auVar47._28_4_ = fVar332;
      fVar332 = auVar30._0_4_;
      fVar269 = auVar30._4_4_;
      auVar48._4_4_ = auVar32._4_4_ * fVar269;
      auVar48._0_4_ = auVar32._0_4_ * fVar332;
      fVar280 = auVar30._8_4_;
      auVar48._8_4_ = auVar32._8_4_ * fVar280;
      fVar290 = auVar30._12_4_;
      auVar48._12_4_ = auVar32._12_4_ * fVar290;
      fVar223 = auVar30._16_4_;
      auVar48._16_4_ = auVar32._16_4_ * fVar223;
      fVar140 = auVar30._20_4_;
      auVar48._20_4_ = auVar32._20_4_ * fVar140;
      fVar141 = auVar30._24_4_;
      auVar48._24_4_ = auVar32._24_4_ * fVar141;
      auVar48._28_4_ = auVar29._28_4_;
      auVar27 = vsubps_avx(auVar48,auVar47);
      auVar28 = vsubps_avx(auVar17,auVar25);
      fVar275 = auVar28._0_4_;
      fVar277 = auVar28._4_4_;
      auVar49._4_4_ = fVar277 * auVar18._4_4_;
      auVar49._0_4_ = fVar275 * auVar18._0_4_;
      fVar300 = auVar28._8_4_;
      auVar49._8_4_ = fVar300 * auVar18._8_4_;
      fVar312 = auVar28._12_4_;
      auVar49._12_4_ = fVar312 * auVar18._12_4_;
      fVar315 = auVar28._16_4_;
      auVar49._16_4_ = fVar315 * auVar18._16_4_;
      fVar316 = auVar28._20_4_;
      auVar49._20_4_ = fVar316 * auVar18._20_4_;
      fVar317 = auVar28._24_4_;
      auVar49._24_4_ = fVar317 * auVar18._24_4_;
      auVar49._28_4_ = auVar18._28_4_;
      auVar50._4_4_ = auVar25._4_4_ * fVar269;
      auVar50._0_4_ = auVar25._0_4_ * fVar332;
      auVar50._8_4_ = auVar25._8_4_ * fVar280;
      auVar50._12_4_ = auVar25._12_4_ * fVar290;
      auVar50._16_4_ = auVar25._16_4_ * fVar223;
      auVar50._20_4_ = auVar25._20_4_ * fVar140;
      auVar50._24_4_ = auVar25._24_4_ * fVar141;
      auVar50._28_4_ = auVar234._28_4_;
      auVar234 = vsubps_avx(auVar49,auVar50);
      auVar51._4_4_ = auVar32._4_4_ * fVar277;
      auVar51._0_4_ = auVar32._0_4_ * fVar275;
      auVar51._8_4_ = auVar32._8_4_ * fVar300;
      auVar51._12_4_ = auVar32._12_4_ * fVar312;
      auVar51._16_4_ = auVar32._16_4_ * fVar315;
      auVar51._20_4_ = auVar32._20_4_ * fVar316;
      auVar51._24_4_ = auVar32._24_4_ * fVar317;
      auVar51._28_4_ = auVar18._28_4_;
      auVar52._4_4_ = auVar25._4_4_ * fVar279;
      auVar52._0_4_ = auVar25._0_4_ * fVar225;
      auVar52._8_4_ = auVar25._8_4_ * fVar288;
      auVar52._12_4_ = auVar25._12_4_ * fVar291;
      auVar52._16_4_ = auVar25._16_4_ * fVar292;
      auVar52._20_4_ = auVar25._20_4_ * fVar187;
      auVar52._24_4_ = auVar25._24_4_ * fVar201;
      auVar52._28_4_ = auVar25._28_4_;
      auVar25 = vsubps_avx(auVar52,auVar51);
      auVar236._0_4_ = auVar27._0_4_ * 0.0 + auVar25._0_4_ + auVar234._0_4_ * 0.0;
      auVar236._4_4_ = auVar27._4_4_ * 0.0 + auVar25._4_4_ + auVar234._4_4_ * 0.0;
      auVar236._8_4_ = auVar27._8_4_ * 0.0 + auVar25._8_4_ + auVar234._8_4_ * 0.0;
      auVar236._12_4_ = auVar27._12_4_ * 0.0 + auVar25._12_4_ + auVar234._12_4_ * 0.0;
      auVar236._16_4_ = auVar27._16_4_ * 0.0 + auVar25._16_4_ + auVar234._16_4_ * 0.0;
      auVar236._20_4_ = auVar27._20_4_ * 0.0 + auVar25._20_4_ + auVar234._20_4_ * 0.0;
      auVar236._24_4_ = auVar27._24_4_ * 0.0 + auVar25._24_4_ + auVar234._24_4_ * 0.0;
      auVar236._28_4_ = auVar25._28_4_ + auVar25._28_4_ + auVar234._28_4_;
      auVar25 = vmaxps_avx(auVar174,auVar236);
      auVar25 = vcmpps_avx(auVar25,ZEXT832(0) << 0x20,2);
      auVar195 = vpackssdw_avx(auVar25._0_16_,auVar25._16_16_);
      auVar170 = vpand_avx(auVar195,auVar170);
      auVar195 = vpmovsxwd_avx(auVar170);
      auVar196 = vpunpckhwd_avx(auVar170,auVar170);
      auVar215._16_16_ = auVar196;
      auVar215._0_16_ = auVar195;
      if ((((((((auVar215 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar215 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar215 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar215 >> 0x7f,0) == '\0') &&
            (auVar215 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB161(auVar196 >> 0x3f,0) == '\0') &&
          (auVar215 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar196[0xf]
         ) {
LAB_0093aecb:
        auVar239 = ZEXT3264(CONCAT824(uStack_508,
                                      CONCAT816(uStack_510,CONCAT88(uStack_518,local_520))));
        auVar348 = ZEXT3264(auVar153);
      }
      else {
        auVar53._4_4_ = fVar269 * fVar224;
        auVar53._0_4_ = fVar332 * fVar331;
        auVar53._8_4_ = fVar280 * fVar337;
        auVar53._12_4_ = fVar290 * fVar281;
        auVar53._16_4_ = fVar223 * fVar221;
        auVar53._20_4_ = fVar140 * fVar276;
        auVar53._24_4_ = fVar141 * fVar159;
        auVar53._28_4_ = auVar196._12_4_;
        auVar344._0_4_ = fVar225 * fVar203;
        auVar344._4_4_ = fVar279 * fVar205;
        auVar344._8_4_ = fVar288 * fVar298;
        auVar344._12_4_ = fVar291 * fVar308;
        auVar344._16_4_ = fVar292 * fVar259;
        auVar344._20_4_ = fVar187 * fVar267;
        auVar344._24_4_ = fVar201 * fVar273;
        auVar344._28_4_ = 0;
        auVar25 = vsubps_avx(auVar344,auVar53);
        auVar54._4_4_ = fVar277 * fVar205;
        auVar54._0_4_ = fVar275 * fVar203;
        auVar54._8_4_ = fVar300 * fVar298;
        auVar54._12_4_ = fVar312 * fVar308;
        auVar54._16_4_ = fVar315 * fVar259;
        auVar54._20_4_ = fVar316 * fVar267;
        auVar54._24_4_ = fVar317 * fVar273;
        auVar54._28_4_ = auVar284._28_4_;
        auVar55._4_4_ = fVar269 * fVar335;
        auVar55._0_4_ = fVar332 * fVar307;
        auVar55._8_4_ = fVar280 * fVar271;
        auVar55._12_4_ = fVar290 * fVar289;
        auVar55._16_4_ = fVar223 * fVar294;
        auVar55._20_4_ = fVar140 * fVar226;
        auVar55._24_4_ = fVar141 * fVar164;
        auVar55._28_4_ = auVar30._28_4_;
        auVar18 = vsubps_avx(auVar55,auVar54);
        auVar56._4_4_ = fVar279 * fVar335;
        auVar56._0_4_ = fVar225 * fVar307;
        auVar56._8_4_ = fVar288 * fVar271;
        auVar56._12_4_ = fVar291 * fVar289;
        auVar56._16_4_ = fVar292 * fVar294;
        auVar56._20_4_ = fVar187 * fVar226;
        auVar56._24_4_ = fVar201 * fVar164;
        auVar56._28_4_ = auVar174._28_4_;
        auVar57._4_4_ = fVar277 * fVar224;
        auVar57._0_4_ = fVar275 * fVar331;
        auVar57._8_4_ = fVar300 * fVar337;
        auVar57._12_4_ = fVar312 * fVar281;
        auVar57._16_4_ = fVar315 * fVar221;
        auVar57._20_4_ = fVar316 * fVar276;
        auVar57._24_4_ = fVar317 * fVar159;
        auVar57._28_4_ = auVar327._28_4_;
        auVar234 = vsubps_avx(auVar57,auVar56);
        auVar264._0_4_ = auVar25._0_4_ * 0.0 + auVar234._0_4_ + auVar18._0_4_ * 0.0;
        auVar264._4_4_ = auVar25._4_4_ * 0.0 + auVar234._4_4_ + auVar18._4_4_ * 0.0;
        auVar264._8_4_ = auVar25._8_4_ * 0.0 + auVar234._8_4_ + auVar18._8_4_ * 0.0;
        auVar264._12_4_ = auVar25._12_4_ * 0.0 + auVar234._12_4_ + auVar18._12_4_ * 0.0;
        auVar264._16_4_ = auVar25._16_4_ * 0.0 + auVar234._16_4_ + auVar18._16_4_ * 0.0;
        auVar264._20_4_ = auVar25._20_4_ * 0.0 + auVar234._20_4_ + auVar18._20_4_ * 0.0;
        auVar264._24_4_ = auVar25._24_4_ * 0.0 + auVar234._24_4_ + auVar18._24_4_ * 0.0;
        auVar264._28_4_ = auVar327._28_4_ + auVar234._28_4_ + auVar174._28_4_;
        auVar32 = vrcpps_avx(auVar264);
        fVar331 = auVar32._0_4_;
        fVar307 = auVar32._4_4_;
        auVar58._4_4_ = auVar264._4_4_ * fVar307;
        auVar58._0_4_ = auVar264._0_4_ * fVar331;
        fVar332 = auVar32._8_4_;
        auVar58._8_4_ = auVar264._8_4_ * fVar332;
        fVar224 = auVar32._12_4_;
        auVar58._12_4_ = auVar264._12_4_ * fVar224;
        fVar335 = auVar32._16_4_;
        auVar58._16_4_ = auVar264._16_4_ * fVar335;
        fVar269 = auVar32._20_4_;
        auVar58._20_4_ = auVar264._20_4_ * fVar269;
        fVar337 = auVar32._24_4_;
        auVar58._24_4_ = auVar264._24_4_ * fVar337;
        auVar58._28_4_ = auVar30._28_4_;
        auVar345._8_4_ = 0x3f800000;
        auVar345._0_8_ = 0x3f8000003f800000;
        auVar345._12_4_ = 0x3f800000;
        auVar345._16_4_ = 0x3f800000;
        auVar345._20_4_ = 0x3f800000;
        auVar345._24_4_ = 0x3f800000;
        auVar345._28_4_ = 0x3f800000;
        auVar284 = vsubps_avx(auVar345,auVar58);
        fVar331 = auVar284._0_4_ * fVar331 + fVar331;
        fVar307 = auVar284._4_4_ * fVar307 + fVar307;
        fVar332 = auVar284._8_4_ * fVar332 + fVar332;
        fVar224 = auVar284._12_4_ * fVar224 + fVar224;
        fVar335 = auVar284._16_4_ * fVar335 + fVar335;
        fVar269 = auVar284._20_4_ * fVar269 + fVar269;
        fVar337 = auVar284._24_4_ * fVar337 + fVar337;
        auVar59._4_4_ =
             (auVar25._4_4_ * fVar185 + auVar18._4_4_ * fVar334 + auVar234._4_4_ * fVar162) *
             fVar307;
        auVar59._0_4_ =
             (auVar25._0_4_ * fVar265 + auVar18._0_4_ * fVar219 + auVar234._0_4_ * fVar160) *
             fVar331;
        auVar59._8_4_ =
             (auVar25._8_4_ * fVar338 + auVar18._8_4_ * fVar336 + auVar234._8_4_ * fVar163) *
             fVar332;
        auVar59._12_4_ =
             (auVar25._12_4_ * fVar272 + auVar18._12_4_ * fVar220 + auVar234._12_4_ * fVar243) *
             fVar224;
        auVar59._16_4_ =
             (auVar25._16_4_ * fVar293 + auVar18._16_4_ * fVar274 + auVar234._16_4_ * fVar165) *
             fVar335;
        auVar59._20_4_ =
             (auVar25._20_4_ * fVar296 + auVar18._20_4_ * fVar295 + auVar234._20_4_ * fVar256) *
             fVar269;
        auVar59._24_4_ =
             (auVar25._24_4_ * fVar186 + auVar18._24_4_ * fVar161 + auVar234._24_4_ * fVar222) *
             fVar337;
        auVar59._28_4_ = auVar214._28_4_ + auVar24._28_4_;
        auVar195 = vpermilps_avx(ZEXT416(local_820),0);
        auVar152._16_16_ = auVar195;
        auVar152._0_16_ = auVar195;
        auVar24 = vcmpps_avx(auVar152,auVar59,2);
        uVar138 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar216._4_4_ = uVar138;
        auVar216._0_4_ = uVar138;
        auVar216._8_4_ = uVar138;
        auVar216._12_4_ = uVar138;
        auVar216._16_4_ = uVar138;
        auVar216._20_4_ = uVar138;
        auVar216._24_4_ = uVar138;
        auVar216._28_4_ = uVar138;
        auVar25 = vcmpps_avx(auVar59,auVar216,2);
        auVar24 = vandps_avx(auVar25,auVar24);
        auVar195 = vpackssdw_avx(auVar24._0_16_,auVar24._16_16_);
        auVar170 = vpand_avx(auVar170,auVar195);
        auVar195 = vpmovsxwd_avx(auVar170);
        auVar196 = vpshufd_avx(auVar170,0xee);
        auVar196 = vpmovsxwd_avx(auVar196);
        auVar217._16_16_ = auVar196;
        auVar217._0_16_ = auVar195;
        if ((((((((auVar217 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar217 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar217 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar217 >> 0x7f,0) == '\0') &&
              (auVar217 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar196 >> 0x3f,0) == '\0') &&
            (auVar217 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar196[0xf]) goto LAB_0093aecb;
        auVar24 = vcmpps_avx(ZEXT832(0) << 0x20,auVar264,4);
        auVar195 = vpackssdw_avx(auVar24._0_16_,auVar24._16_16_);
        auVar170 = vpand_avx(auVar170,auVar195);
        auVar195 = vpmovsxwd_avx(auVar170);
        auVar170 = vpunpckhwd_avx(auVar170,auVar170);
        auVar254._16_16_ = auVar170;
        auVar254._0_16_ = auVar195;
        auVar239 = ZEXT3264(CONCAT824(uStack_508,
                                      CONCAT816(uStack_510,CONCAT88(uStack_518,local_520))));
        auVar348 = ZEXT3264(auVar153);
        if ((((((((auVar254 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar254 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar254 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar254 >> 0x7f,0) != '\0') ||
              (auVar254 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB161(auVar170 >> 0x3f,0) != '\0') ||
            (auVar254 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar170[0xf] < '\0') {
          auVar60._4_4_ = auVar174._4_4_ * fVar307;
          auVar60._0_4_ = auVar174._0_4_ * fVar331;
          auVar60._8_4_ = auVar174._8_4_ * fVar332;
          auVar60._12_4_ = auVar174._12_4_ * fVar224;
          auVar60._16_4_ = auVar174._16_4_ * fVar335;
          auVar60._20_4_ = auVar174._20_4_ * fVar269;
          auVar60._24_4_ = auVar174._24_4_ * fVar337;
          auVar60._28_4_ = SUB84(uStack_508,4);
          auVar61._4_4_ = auVar236._4_4_ * fVar307;
          auVar61._0_4_ = auVar236._0_4_ * fVar331;
          auVar61._8_4_ = auVar236._8_4_ * fVar332;
          auVar61._12_4_ = auVar236._12_4_ * fVar224;
          auVar61._16_4_ = auVar236._16_4_ * fVar335;
          auVar61._20_4_ = auVar236._20_4_ * fVar269;
          auVar61._24_4_ = auVar236._24_4_ * fVar337;
          auVar61._28_4_ = auVar284._28_4_ + auVar32._28_4_;
          auVar237._8_4_ = 0x3f800000;
          auVar237._0_8_ = 0x3f8000003f800000;
          auVar237._12_4_ = 0x3f800000;
          auVar237._16_4_ = 0x3f800000;
          auVar237._20_4_ = 0x3f800000;
          auVar237._24_4_ = 0x3f800000;
          auVar237._28_4_ = 0x3f800000;
          auVar153 = vsubps_avx(auVar237,auVar60);
          auVar153 = vblendvps_avx(auVar153,auVar60,auVar31);
          auVar348 = ZEXT3264(auVar153);
          auVar153 = vsubps_avx(auVar237,auVar61);
          _local_340 = vblendvps_avx(auVar153,auVar61,auVar31);
          auVar239 = ZEXT3264(auVar254);
          local_460 = auVar59;
        }
      }
      auVar322 = ZEXT3264(_local_800);
      auVar153 = auVar239._0_32_;
      if ((((((((auVar153 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar153 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar153 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar153 >> 0x7f,0) == '\0') &&
            (auVar239 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
           SUB321(auVar153 >> 0xbf,0) == '\0') &&
          (auVar239 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
          -1 < auVar239[0x1f]) {
        auVar239 = ZEXT3264(_local_7e0);
      }
      else {
        auVar24 = vsubps_avx(auVar246,auVar148);
        fVar219 = auVar148._0_4_ + auVar348._0_4_ * auVar24._0_4_;
        fVar265 = auVar148._4_4_ + auVar348._4_4_ * auVar24._4_4_;
        fVar307 = auVar148._8_4_ + auVar348._8_4_ * auVar24._8_4_;
        fVar332 = auVar148._12_4_ + auVar348._12_4_ * auVar24._12_4_;
        fVar224 = auVar148._16_4_ + auVar348._16_4_ * auVar24._16_4_;
        fVar334 = auVar148._20_4_ + auVar348._20_4_ * auVar24._20_4_;
        fVar185 = auVar148._24_4_ + auVar348._24_4_ * auVar24._24_4_;
        fVar335 = auVar24._28_4_ + 0.0;
        fVar331 = *(float *)((long)local_688->ray_space + k * 4 + -0x10);
        auVar62._4_4_ = (fVar265 + fVar265) * fVar331;
        auVar62._0_4_ = (fVar219 + fVar219) * fVar331;
        auVar62._8_4_ = (fVar307 + fVar307) * fVar331;
        auVar62._12_4_ = (fVar332 + fVar332) * fVar331;
        auVar62._16_4_ = (fVar224 + fVar224) * fVar331;
        auVar62._20_4_ = (fVar334 + fVar334) * fVar331;
        auVar62._24_4_ = (fVar185 + fVar185) * fVar331;
        auVar62._28_4_ = fVar335 + fVar335;
        auVar24 = vcmpps_avx(local_460,auVar62,6);
        auVar25 = auVar153 & auVar24;
        if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar25 >> 0x7f,0) != '\0') ||
              (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar25 >> 0xbf,0) != '\0') ||
            (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar25[0x1f] < '\0') {
          local_340._0_4_ = (float)local_340._0_4_ + (float)local_340._0_4_ + -1.0;
          local_340._4_4_ = (float)local_340._4_4_ + (float)local_340._4_4_ + -1.0;
          uStack_338._0_4_ = (float)uStack_338 + (float)uStack_338 + -1.0;
          uStack_338._4_4_ = uStack_338._4_4_ + uStack_338._4_4_ + -1.0;
          uStack_330._0_4_ = (float)uStack_330 + (float)uStack_330 + -1.0;
          uStack_330._4_4_ = uStack_330._4_4_ + uStack_330._4_4_ + -1.0;
          uStack_328._0_4_ = (float)uStack_328 + (float)uStack_328 + -1.0;
          uStack_328._4_4_ = uStack_328._4_4_ + uStack_328._4_4_ + -1.0;
          local_7c0 = auVar348._0_32_;
          local_2a0 = local_7c0;
          auVar128 = _local_340;
          auVar25 = _local_340;
          local_280 = (float)local_340._0_4_;
          fStack_27c = (float)local_340._4_4_;
          fStack_278 = (float)uStack_338;
          fStack_274 = uStack_338._4_4_;
          fStack_270 = (float)uStack_330;
          fStack_26c = uStack_330._4_4_;
          fStack_268 = (float)uStack_328;
          fStack_264 = uStack_328._4_4_;
          local_260 = local_460;
          local_240 = 0;
          local_23c = uVar136;
          local_230 = auVar262._0_8_;
          uStack_228 = uStack_838;
          uStack_758 = auVar358._8_8_;
          local_220 = auVar358._0_8_;
          uStack_218 = uStack_758;
          uStack_768 = auVar368._8_8_;
          local_210 = auVar368._0_8_;
          uStack_208 = uStack_768;
          uStack_778 = auVar343._8_8_;
          local_200 = auVar343._0_8_;
          uStack_1f8 = uStack_778;
          auVar239 = ZEXT3264(_local_7e0);
          _local_340 = auVar25;
          if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
            local_560 = vandps_avx(auVar24,auVar153);
            auVar193._0_4_ = 1.0 / auVar211._0_4_;
            auVar193._4_12_ = SUB6012((undefined1  [60])0x0,0);
            auVar170 = vshufps_avx(auVar193,auVar193,0);
            local_1c0[0] = auVar170._0_4_ * (auVar348._0_4_ + 0.0);
            local_1c0[1] = auVar170._4_4_ * (auVar348._4_4_ + 1.0);
            local_1c0[2] = auVar170._8_4_ * (auVar348._8_4_ + 2.0);
            local_1c0[3] = auVar170._12_4_ * (auVar348._12_4_ + 3.0);
            fStack_1b0 = auVar170._0_4_ * (auVar348._16_4_ + 4.0);
            fStack_1ac = auVar170._4_4_ * (auVar348._20_4_ + 5.0);
            fStack_1a8 = auVar170._8_4_ * (auVar348._24_4_ + 6.0);
            fStack_1a4 = auVar348._28_4_ + 7.0;
            uStack_330 = auVar128._16_8_;
            uStack_328 = auVar25._24_8_;
            local_1a0 = local_340;
            uStack_198 = uStack_338;
            uStack_190 = uStack_330;
            uStack_188 = uStack_328;
            local_180 = local_460;
            auVar153._8_4_ = 0x7f800000;
            auVar153._0_8_ = 0x7f8000007f800000;
            auVar153._12_4_ = 0x7f800000;
            auVar153._16_4_ = 0x7f800000;
            auVar153._20_4_ = 0x7f800000;
            auVar153._24_4_ = 0x7f800000;
            auVar153._28_4_ = 0x7f800000;
            auVar153 = vblendvps_avx(auVar153,local_460,local_560);
            auVar24 = vshufps_avx(auVar153,auVar153,0xb1);
            auVar24 = vminps_avx(auVar153,auVar24);
            auVar25 = vshufpd_avx(auVar24,auVar24,5);
            auVar24 = vminps_avx(auVar24,auVar25);
            auVar25 = vperm2f128_avx(auVar24,auVar24,1);
            auVar24 = vminps_avx(auVar24,auVar25);
            auVar24 = vcmpps_avx(auVar153,auVar24,0);
            auVar25 = local_560 & auVar24;
            auVar153 = local_560;
            if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar25 >> 0x7f,0) != '\0') ||
                  (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar25 >> 0xbf,0) != '\0') ||
                (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar25[0x1f] < '\0') {
              auVar153 = vandps_avx(auVar24,local_560);
            }
            uVar129 = vmovmskps_avx(auVar153);
            uVar15 = 0;
            if (uVar129 != 0) {
              for (; (uVar129 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
              }
            }
            uVar133 = (ulong)uVar15;
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              fVar323 = local_1c0[uVar133];
              fVar331 = 1.0 - fVar323;
              fVar330 = fVar323 * 3.0;
              auVar170 = ZEXT416((uint)((fVar331 * -2.0 * fVar323 + fVar323 * fVar323) * 0.5));
              auVar170 = vshufps_avx(auVar170,auVar170,0);
              auVar195 = ZEXT416((uint)(((fVar331 + fVar331) * (fVar330 + 2.0) +
                                        fVar331 * fVar331 * -3.0) * 0.5));
              auVar195 = vshufps_avx(auVar195,auVar195,0);
              auVar239 = ZEXT3264(_local_7e0);
              auVar196 = ZEXT416((uint)(((fVar323 + fVar323) * (fVar330 + -5.0) + fVar323 * fVar330)
                                       * 0.5));
              auVar196 = vshufps_avx(auVar196,auVar196,0);
              uVar138 = *(undefined4 *)((long)&local_1a0 + uVar133 * 4);
              auVar212 = ZEXT416((uint)((fVar323 * (fVar331 + fVar331) - fVar331 * fVar331) * 0.5));
              auVar212 = vshufps_avx(auVar212,auVar212,0);
              auVar169._0_4_ =
                   auVar212._0_4_ * fVar258 +
                   auVar196._0_4_ * fVar356 + auVar170._0_4_ * fVar339 + auVar195._0_4_ * fVar366;
              auVar169._4_4_ =
                   auVar212._4_4_ * fVar266 +
                   auVar196._4_4_ * fVar360 + auVar170._4_4_ * fVar349 + auVar195._4_4_ * fVar371;
              auVar169._8_4_ =
                   auVar212._8_4_ * auVar262._8_4_ +
                   auVar196._8_4_ * auVar358._8_4_ +
                   auVar170._8_4_ * auVar343._8_4_ + auVar195._8_4_ * auVar368._8_4_;
              auVar169._12_4_ =
                   auVar212._12_4_ * auVar262._12_4_ +
                   auVar196._12_4_ * auVar358._12_4_ +
                   auVar170._12_4_ * auVar343._12_4_ + auVar195._12_4_ * auVar368._12_4_;
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_180 + uVar133 * 4);
              *(float *)(ray + k * 4 + 0xc0) = auVar169._0_4_;
              uVar10 = vextractps_avx(auVar169,1);
              *(undefined4 *)(ray + k * 4 + 0xd0) = uVar10;
              uVar10 = vextractps_avx(auVar169,2);
              *(undefined4 *)(ray + k * 4 + 0xe0) = uVar10;
              *(float *)(ray + k * 4 + 0xf0) = fVar323;
              *(undefined4 *)(ray + k * 4 + 0x100) = uVar138;
              *(uint *)(ray + k * 4 + 0x110) = uVar130;
              *(uint *)(ray + k * 4 + 0x120) = uVar132;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
            }
            else {
              _local_600 = vpshufd_avx(auVar283,0);
              local_580._0_16_ = vpermilps_avx(local_5d0,0);
              local_580._16_16_ = auVar17._16_16_;
              _auStack_670 = auVar26._16_16_;
              _local_680 = *local_690;
              auStack_6f0 = auVar246._16_16_;
              local_700 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
              _auStack_718 = auVar213._8_24_;
              local_720 = auVar139;
              while( true ) {
                local_3c0 = local_1c0[uVar133];
                local_3b0 = *(undefined4 *)((long)&local_1a0 + uVar133 * 4);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_180 + uVar133 * 4);
                fVar330 = 1.0 - local_3c0;
                fVar323 = local_3c0 * 3.0;
                auVar170 = ZEXT416((uint)((fVar330 * -2.0 * local_3c0 + local_3c0 * local_3c0) * 0.5
                                         ));
                auVar170 = vshufps_avx(auVar170,auVar170,0);
                auVar195 = ZEXT416((uint)(((fVar330 + fVar330) * (fVar323 + 2.0) +
                                          fVar330 * fVar330 * -3.0) * 0.5));
                auVar195 = vshufps_avx(auVar195,auVar195,0);
                auVar196 = ZEXT416((uint)(((local_3c0 + local_3c0) * (fVar323 + -5.0) +
                                          local_3c0 * fVar323) * 0.5));
                auVar196 = vshufps_avx(auVar196,auVar196,0);
                local_750.context = context->user;
                auVar212 = ZEXT416((uint)((local_3c0 * (fVar330 + fVar330) - fVar330 * fVar330) *
                                         0.5));
                auVar212 = vshufps_avx(auVar212,auVar212,0);
                auVar198._0_4_ =
                     auVar212._0_4_ * fVar258 +
                     auVar196._0_4_ * (float)local_760._0_4_ +
                     auVar170._0_4_ * (float)local_780._0_4_ +
                     auVar195._0_4_ * (float)local_770._0_4_;
                auVar198._4_4_ =
                     auVar212._4_4_ * fVar266 +
                     auVar196._4_4_ * (float)local_760._4_4_ +
                     auVar170._4_4_ * (float)local_780._4_4_ +
                     auVar195._4_4_ * (float)local_770._4_4_;
                auVar198._8_4_ =
                     auVar212._8_4_ * auVar262._8_4_ +
                     auVar196._8_4_ * (float)uStack_758 +
                     auVar170._8_4_ * (float)uStack_778 + auVar195._8_4_ * (float)uStack_768;
                auVar198._12_4_ =
                     auVar212._12_4_ * auVar262._12_4_ +
                     auVar196._12_4_ * uStack_758._4_4_ +
                     auVar170._12_4_ * uStack_778._4_4_ + auVar195._12_4_ * uStack_768._4_4_;
                auVar170 = vshufps_avx(auVar198,auVar198,0);
                local_3f0[0] = (RTCHitN)auVar170[0];
                local_3f0[1] = (RTCHitN)auVar170[1];
                local_3f0[2] = (RTCHitN)auVar170[2];
                local_3f0[3] = (RTCHitN)auVar170[3];
                local_3f0[4] = (RTCHitN)auVar170[4];
                local_3f0[5] = (RTCHitN)auVar170[5];
                local_3f0[6] = (RTCHitN)auVar170[6];
                local_3f0[7] = (RTCHitN)auVar170[7];
                local_3f0[8] = (RTCHitN)auVar170[8];
                local_3f0[9] = (RTCHitN)auVar170[9];
                local_3f0[10] = (RTCHitN)auVar170[10];
                local_3f0[0xb] = (RTCHitN)auVar170[0xb];
                local_3f0[0xc] = (RTCHitN)auVar170[0xc];
                local_3f0[0xd] = (RTCHitN)auVar170[0xd];
                local_3f0[0xe] = (RTCHitN)auVar170[0xe];
                local_3f0[0xf] = (RTCHitN)auVar170[0xf];
                auVar170 = vshufps_avx(auVar198,auVar198,0x55);
                local_3e0 = auVar170;
                local_3d0 = vshufps_avx(auVar198,auVar198,0xaa);
                fStack_3bc = local_3c0;
                fStack_3b8 = local_3c0;
                fStack_3b4 = local_3c0;
                uStack_3ac = local_3b0;
                uStack_3a8 = local_3b0;
                uStack_3a4 = local_3b0;
                local_3a0 = local_580._0_8_;
                uStack_398 = local_580._8_8_;
                local_390 = _local_600;
                vcmpps_avx(ZEXT1632(_local_600),ZEXT1632(_local_600),0xf);
                uStack_37c = (local_750.context)->instID[0];
                local_380 = uStack_37c;
                uStack_378 = uStack_37c;
                uStack_374 = uStack_37c;
                uStack_370 = (local_750.context)->instPrimID[0];
                uStack_36c = uStack_370;
                uStack_368 = uStack_370;
                uStack_364 = uStack_370;
                local_830 = _local_680;
                local_750.valid = (int *)local_830;
                local_750.geometryUserPtr = pGVar11->userPtr;
                local_750.hit = local_3f0;
                local_750.N = 4;
                local_750.ray = (RTCRayN *)ray;
                if (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar11->intersectionFilterN)(&local_750);
                  auVar322 = ZEXT3264(_local_800);
                  auVar348 = ZEXT3264(local_7c0);
                  auVar139 = local_720;
                  fVar367 = (float)local_7a0._0_4_;
                  fVar372 = (float)local_7a0._4_4_;
                  fVar373 = fStack_798;
                  fVar374 = fStack_794;
                  fVar268 = fStack_790;
                  fVar270 = fStack_78c;
                  fVar310 = fStack_788;
                  fVar188 = (float)local_6c0._0_4_;
                  fVar202 = (float)local_6c0._4_4_;
                  fVar204 = fStack_6b8;
                  fVar206 = fStack_6b4;
                  fVar313 = fStack_6b0;
                  fVar364 = fStack_6ac;
                  fVar365 = fStack_6a8;
                }
                if (local_830 == (undefined1  [16])0x0) {
                  auVar170 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                  auVar170 = auVar170 ^ _DAT_01f46b70;
                  auVar239 = ZEXT3264(_local_7e0);
                  auVar283 = local_5c0._0_16_;
                }
                else {
                  p_Var14 = context->args->filter;
                  auVar239 = ZEXT3264(_local_7e0);
                  if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar11->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    (*p_Var14)(&local_750);
                    auVar239 = ZEXT3264(_local_7e0);
                    auVar322 = ZEXT3264(_local_800);
                    auVar348 = ZEXT3264(local_7c0);
                    auVar139 = local_720;
                    fVar367 = (float)local_7a0._0_4_;
                    fVar372 = (float)local_7a0._4_4_;
                    fVar373 = fStack_798;
                    fVar374 = fStack_794;
                    fVar268 = fStack_790;
                    fVar270 = fStack_78c;
                    fVar310 = fStack_788;
                    fVar188 = (float)local_6c0._0_4_;
                    fVar202 = (float)local_6c0._4_4_;
                    fVar204 = fStack_6b8;
                    fVar206 = fStack_6b4;
                    fVar313 = fStack_6b0;
                    fVar364 = fStack_6ac;
                    fVar365 = fStack_6a8;
                  }
                  auVar195 = vpcmpeqd_avx(local_830,_DAT_01f45a50);
                  auVar196 = vpcmpeqd_avx(auVar170,auVar170);
                  auVar170 = auVar195 ^ auVar196;
                  auVar283 = local_5c0._0_16_;
                  if (local_830 != (undefined1  [16])0x0) {
                    auVar195 = auVar195 ^ auVar196;
                    auVar196 = vmaskmovps_avx(auVar195,*(undefined1 (*) [16])local_750.hit);
                    *(undefined1 (*) [16])(local_750.ray + 0xc0) = auVar196;
                    auVar196 = vmaskmovps_avx(auVar195,*(undefined1 (*) [16])(local_750.hit + 0x10))
                    ;
                    *(undefined1 (*) [16])(local_750.ray + 0xd0) = auVar196;
                    auVar196 = vmaskmovps_avx(auVar195,*(undefined1 (*) [16])(local_750.hit + 0x20))
                    ;
                    *(undefined1 (*) [16])(local_750.ray + 0xe0) = auVar196;
                    auVar196 = vmaskmovps_avx(auVar195,*(undefined1 (*) [16])(local_750.hit + 0x30))
                    ;
                    *(undefined1 (*) [16])(local_750.ray + 0xf0) = auVar196;
                    auVar196 = vmaskmovps_avx(auVar195,*(undefined1 (*) [16])(local_750.hit + 0x40))
                    ;
                    *(undefined1 (*) [16])(local_750.ray + 0x100) = auVar196;
                    auVar196 = vmaskmovps_avx(auVar195,*(undefined1 (*) [16])(local_750.hit + 0x50))
                    ;
                    *(undefined1 (*) [16])(local_750.ray + 0x110) = auVar196;
                    auVar196 = vmaskmovps_avx(auVar195,*(undefined1 (*) [16])(local_750.hit + 0x60))
                    ;
                    *(undefined1 (*) [16])(local_750.ray + 0x120) = auVar196;
                    auVar196 = vmaskmovps_avx(auVar195,*(undefined1 (*) [16])(local_750.hit + 0x70))
                    ;
                    *(undefined1 (*) [16])(local_750.ray + 0x130) = auVar196;
                    auVar195 = vmaskmovps_avx(auVar195,*(undefined1 (*) [16])(local_750.hit + 0x80))
                    ;
                    *(undefined1 (*) [16])(local_750.ray + 0x140) = auVar195;
                  }
                }
                auVar153 = local_460;
                auVar173._8_8_ = 0x100000001;
                auVar173._0_8_ = 0x100000001;
                if ((auVar173 & auVar170) == (undefined1  [16])0x0) {
                  *(int *)(ray + k * 4 + 0x80) = local_700._0_4_;
                  auVar170 = local_700;
                }
                else {
                  auVar170 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                }
                *(undefined4 *)(local_560 + uVar133 * 4) = 0;
                local_700 = auVar170;
                auVar170 = vshufps_avx(auVar170,auVar170,0);
                auVar158._16_16_ = auVar170;
                auVar158._0_16_ = auVar170;
                auVar26 = vcmpps_avx(auVar153,auVar158,2);
                auVar17 = vandps_avx(auVar26,local_560);
                local_560 = local_560 & auVar26;
                if ((((((((local_560 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (local_560 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (local_560 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(local_560 >> 0x7f,0) == '\0') &&
                      (local_560 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(local_560 >> 0xbf,0) == '\0') &&
                    (local_560 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < local_560[0x1f]) break;
                auVar178._8_4_ = 0x7f800000;
                auVar178._0_8_ = 0x7f8000007f800000;
                auVar178._12_4_ = 0x7f800000;
                auVar178._16_4_ = 0x7f800000;
                auVar178._20_4_ = 0x7f800000;
                auVar178._24_4_ = 0x7f800000;
                auVar178._28_4_ = 0x7f800000;
                auVar153 = vblendvps_avx(auVar178,auVar153,auVar17);
                auVar26 = vshufps_avx(auVar153,auVar153,0xb1);
                auVar26 = vminps_avx(auVar153,auVar26);
                auVar24 = vshufpd_avx(auVar26,auVar26,5);
                auVar26 = vminps_avx(auVar26,auVar24);
                auVar24 = vperm2f128_avx(auVar26,auVar26,1);
                auVar26 = vminps_avx(auVar26,auVar24);
                auVar26 = vcmpps_avx(auVar153,auVar26,0);
                auVar24 = auVar17 & auVar26;
                auVar153 = auVar17;
                if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar24 >> 0x7f,0) != '\0') ||
                      (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar24 >> 0xbf,0) != '\0') ||
                    (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar24[0x1f] < '\0') {
                  auVar153 = vandps_avx(auVar26,auVar17);
                }
                uVar130 = vmovmskps_avx(auVar153);
                uVar132 = 0;
                if (uVar130 != 0) {
                  for (; (uVar130 >> uVar132 & 1) == 0; uVar132 = uVar132 + 1) {
                  }
                }
                uVar133 = (ulong)uVar132;
                local_560 = auVar17;
              }
            }
          }
          fVar323 = (float)local_660._0_4_;
          fVar166 = (float)local_660._4_4_;
          fVar257 = fStack_658;
          fVar297 = fStack_654;
          fVar330 = fStack_650;
          fVar333 = fStack_64c;
          fVar181 = fStack_648;
          fVar183 = fStack_644;
          goto LAB_0093931c;
        }
        auVar239 = ZEXT3264(_local_7e0);
      }
    }
    auVar179 = ZEXT3264(local_500);
    if (8 < (int)uVar136) {
      auVar170 = vpshufd_avx(ZEXT416(uVar136),0);
      local_480 = auVar170._0_4_;
      fStack_47c = auVar170._4_4_;
      fStack_478 = auVar170._8_4_;
      fStack_474 = auVar170._12_4_;
      auVar170 = vshufps_avx(auVar233,auVar233,0);
      local_5c0._16_16_ = auVar170;
      local_5c0._0_16_ = auVar170;
      auVar114._4_4_ = uStack_81c;
      auVar114._0_4_ = local_820;
      auVar114._8_4_ = uStack_818;
      auVar114._12_4_ = uStack_814;
      auVar170 = vpermilps_avx(auVar114,0);
      local_300._16_16_ = auVar170;
      local_300._0_16_ = auVar170;
      auVar146._0_4_ = 1.0 / local_440;
      auVar146._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar170 = vshufps_avx(auVar146,auVar146,0);
      register0x00001210 = auVar170;
      _local_120 = auVar170;
      auVar170 = vpshufd_avx(auVar283,0);
      local_320._0_16_ = auVar170;
      local_5d0 = vpermilps_avx(local_5d0,0);
      local_7c0 = auVar348._0_32_;
      _local_7e0 = auVar239._0_32_;
      local_700._0_8_ = (long)(int)uVar136;
      for (lVar134 = 8; local_500 = auVar179._0_32_, lVar134 < (long)local_700._0_8_;
          lVar134 = lVar134 + 8) {
        pauVar7 = (undefined1 (*) [28])(catmullrom_basis0 + lVar134 * 4 + lVar137);
        fVar331 = *(float *)*pauVar7;
        fVar219 = *(float *)(*pauVar7 + 4);
        fVar265 = *(float *)(*pauVar7 + 8);
        fVar307 = *(float *)(*pauVar7 + 0xc);
        fVar332 = *(float *)(*pauVar7 + 0x10);
        fVar224 = *(float *)(*pauVar7 + 0x14);
        fVar334 = *(float *)(*pauVar7 + 0x18);
        auVar126 = *pauVar7;
        pauVar8 = (undefined1 (*) [28])(lVar137 + 0x22047f0 + lVar134 * 4);
        fVar185 = *(float *)*pauVar8;
        fVar335 = *(float *)(*pauVar8 + 4);
        fVar269 = *(float *)(*pauVar8 + 8);
        fVar337 = *(float *)(*pauVar8 + 0xc);
        fVar336 = *(float *)(*pauVar8 + 0x10);
        fVar338 = *(float *)(*pauVar8 + 0x14);
        fVar271 = *(float *)(*pauVar8 + 0x18);
        auVar125 = *pauVar8;
        pauVar8 = (undefined1 (*) [28])(lVar137 + 0x2204c74 + lVar134 * 4);
        fVar280 = *(float *)*pauVar8;
        fVar281 = *(float *)(*pauVar8 + 4);
        fVar220 = *(float *)(*pauVar8 + 8);
        fVar272 = *(float *)(*pauVar8 + 0xc);
        fVar289 = *(float *)(*pauVar8 + 0x10);
        fVar290 = *(float *)(*pauVar8 + 0x14);
        fVar221 = *(float *)(*pauVar8 + 0x18);
        auVar124 = *pauVar8;
        pfVar1 = (float *)(lVar137 + 0x22050f8 + lVar134 * 4);
        fVar274 = *pfVar1;
        fVar293 = pfVar1[1];
        fVar294 = pfVar1[2];
        fVar223 = pfVar1[3];
        fVar276 = pfVar1[4];
        fVar295 = pfVar1[5];
        fVar296 = pfVar1[6];
        fVar226 = pfVar1[7];
        fVar243 = fVar226 + fVar226 + fVar183;
        local_860._0_4_ =
             (float)local_a0._0_4_ * fVar331 +
             fVar367 * fVar185 + fVar167 * fVar280 + (float)local_420._0_4_ * fVar274;
        local_860._4_4_ =
             (float)local_a0._4_4_ * fVar219 +
             fVar372 * fVar335 + fVar180 * fVar281 + (float)local_420._4_4_ * fVar293;
        fStack_858 = fStack_98 * fVar265 +
                     fVar373 * fVar269 + fVar182 * fVar220 + fStack_418 * fVar294;
        fStack_854 = fStack_94 * fVar307 +
                     fVar374 * fVar337 + fVar184 * fVar272 + fStack_414 * fVar223;
        fStack_850 = fStack_90 * fVar332 +
                     fVar268 * fVar336 + fVar167 * fVar289 + fStack_410 * fVar276;
        fStack_84c = fStack_8c * fVar224 +
                     fVar270 * fVar338 + fVar180 * fVar290 + fStack_40c * fVar295;
        fStack_848 = fStack_88 * fVar334 +
                     fVar310 * fVar271 + fVar182 * fVar221 + fStack_408 * fVar296;
        fStack_844 = fVar226 + fVar183 + fVar226 + fVar226 + fStack_404;
        local_6e0._0_4_ =
             fVar188 * fVar331 +
             fVar185 * (float)local_2e0._0_4_ + auVar322._0_4_ * fVar280 + fVar323 * fVar274;
        local_6e0._4_4_ =
             fVar202 * fVar219 +
             fVar335 * (float)local_2e0._4_4_ + auVar322._4_4_ * fVar281 + fVar166 * fVar293;
        local_6e0._8_4_ =
             fVar204 * fVar265 + fVar269 * fStack_2d8 + auVar322._8_4_ * fVar220 + fVar257 * fVar294
        ;
        local_6e0._12_4_ =
             fVar206 * fVar307 +
             fVar337 * fStack_2d4 + auVar322._12_4_ * fVar272 + fVar297 * fVar223;
        local_6e0._16_4_ =
             fVar313 * fVar332 +
             fVar336 * fStack_2d0 + auVar322._16_4_ * fVar289 + fVar330 * fVar276;
        local_6e0._20_4_ =
             fVar364 * fVar224 +
             fVar338 * fStack_2cc + auVar322._20_4_ * fVar290 + fVar333 * fVar295;
        local_6e0._24_4_ =
             fVar365 * fVar334 +
             fVar271 * fStack_2c8 + auVar322._24_4_ * fVar221 + fVar181 * fVar296;
        local_6e0._28_4_ = fStack_844 + fVar226 + fVar226 + auVar239._28_4_;
        fVar141 = (float)local_c0._0_4_ * fVar331 +
                  fVar185 * (float)local_160._0_4_ +
                  (float)local_80._0_4_ * fVar280 + fVar274 * (float)local_140._0_4_;
        fVar160 = (float)local_c0._4_4_ * fVar219 +
                  fVar335 * (float)local_160._4_4_ +
                  (float)local_80._4_4_ * fVar281 + fVar293 * (float)local_140._4_4_;
        fVar162 = fStack_b8 * fVar265 +
                  fVar269 * fStack_158 + fStack_78 * fVar220 + fVar294 * fStack_138;
        fVar163 = fStack_b4 * fVar307 +
                  fVar337 * fStack_154 + fStack_74 * fVar272 + fVar223 * fStack_134;
        fStack_810 = fStack_b0 * fVar332 +
                     fVar336 * fStack_150 + fStack_70 * fVar289 + fVar276 * fStack_130;
        fStack_80c = fStack_ac * fVar224 +
                     fVar338 * fStack_14c + fStack_6c * fVar290 + fVar295 * fStack_12c;
        fStack_808 = fStack_a8 * fVar334 +
                     fVar271 * fStack_148 + fStack_68 * fVar221 + fVar296 * fStack_128;
        fStack_804 = fStack_844 + fVar243;
        pfVar1 = (float *)(catmullrom_basis1 + lVar134 * 4 + lVar137);
        fVar332 = *pfVar1;
        fVar224 = pfVar1[1];
        fVar334 = pfVar1[2];
        fVar185 = pfVar1[3];
        fVar335 = pfVar1[4];
        fVar269 = pfVar1[5];
        fVar337 = pfVar1[6];
        pauVar8 = (undefined1 (*) [28])(lVar137 + 0x2206c10 + lVar134 * 4);
        fVar331 = *(float *)*pauVar8;
        fVar219 = *(float *)(*pauVar8 + 4);
        fVar183 = *(float *)(*pauVar8 + 8);
        fVar265 = *(float *)(*pauVar8 + 0xc);
        fVar307 = *(float *)(*pauVar8 + 0x10);
        fVar336 = *(float *)(*pauVar8 + 0x14);
        fVar338 = *(float *)(*pauVar8 + 0x18);
        auVar127 = *pauVar8;
        pfVar1 = (float *)(lVar137 + 0x2207094 + lVar134 * 4);
        fVar271 = *pfVar1;
        fVar280 = pfVar1[1];
        fVar281 = pfVar1[2];
        fVar220 = pfVar1[3];
        fVar272 = pfVar1[4];
        fVar289 = pfVar1[5];
        fVar290 = pfVar1[6];
        pfVar2 = (float *)(lVar137 + 0x2207518 + lVar134 * 4);
        fVar221 = *pfVar2;
        fVar226 = pfVar2[1];
        fVar140 = pfVar2[2];
        fVar159 = pfVar2[3];
        fVar161 = pfVar2[4];
        fVar186 = pfVar2[5];
        fVar164 = pfVar2[6];
        fVar243 = fVar184 + fVar184 + fVar243;
        local_580._0_4_ =
             (float)local_a0._0_4_ * fVar332 +
             fVar367 * fVar331 + fVar167 * fVar271 + (float)local_420._0_4_ * fVar221;
        local_580._4_4_ =
             (float)local_a0._4_4_ * fVar224 +
             fVar372 * fVar219 + fVar180 * fVar280 + (float)local_420._4_4_ * fVar226;
        local_580._8_4_ =
             fStack_98 * fVar334 + fVar373 * fVar183 + fVar182 * fVar281 + fStack_418 * fVar140;
        local_580._12_4_ =
             fStack_94 * fVar185 + fVar374 * fVar265 + fVar184 * fVar220 + fStack_414 * fVar159;
        local_580._16_4_ =
             fStack_90 * fVar335 + fVar268 * fVar307 + fVar167 * fVar272 + fStack_410 * fVar161;
        local_580._20_4_ =
             fStack_8c * fVar269 + fVar270 * fVar336 + fVar180 * fVar289 + fStack_40c * fVar186;
        local_580._24_4_ =
             fStack_88 * fVar337 + fVar310 * fVar338 + fVar182 * fVar290 + fStack_408 * fVar164;
        local_580._28_4_ = fVar184 + pfVar2[7] + fVar243;
        auVar247._0_4_ =
             fVar188 * fVar332 +
             (float)local_2e0._0_4_ * fVar331 + auVar322._0_4_ * fVar271 + fVar323 * fVar221;
        auVar247._4_4_ =
             fVar202 * fVar224 +
             (float)local_2e0._4_4_ * fVar219 + auVar322._4_4_ * fVar280 + fVar166 * fVar226;
        auVar247._8_4_ =
             fVar204 * fVar334 + fStack_2d8 * fVar183 + auVar322._8_4_ * fVar281 + fVar257 * fVar140
        ;
        auVar247._12_4_ =
             fVar206 * fVar185 +
             fStack_2d4 * fVar265 + auVar322._12_4_ * fVar220 + fVar297 * fVar159;
        auVar247._16_4_ =
             fVar313 * fVar335 +
             fStack_2d0 * fVar307 + auVar322._16_4_ * fVar272 + fVar330 * fVar161;
        auVar247._20_4_ =
             fVar364 * fVar269 +
             fStack_2cc * fVar336 + auVar322._20_4_ * fVar289 + fVar333 * fVar186;
        auVar247._24_4_ =
             fVar365 * fVar337 +
             fStack_2c8 * fVar338 + auVar322._24_4_ * fVar290 + fVar181 * fVar164;
        auVar247._28_4_ = fVar243 + fVar184 + fVar184 + *(float *)pauVar7[1];
        auVar328._0_4_ =
             fVar331 * (float)local_160._0_4_ +
             (float)local_80._0_4_ * fVar271 + fVar221 * (float)local_140._0_4_ +
             fVar332 * (float)local_c0._0_4_;
        auVar328._4_4_ =
             fVar219 * (float)local_160._4_4_ +
             (float)local_80._4_4_ * fVar280 + fVar226 * (float)local_140._4_4_ +
             fVar224 * (float)local_c0._4_4_;
        auVar328._8_4_ =
             fVar183 * fStack_158 + fStack_78 * fVar281 + fVar140 * fStack_138 + fVar334 * fStack_b8
        ;
        auVar328._12_4_ =
             fVar265 * fStack_154 + fStack_74 * fVar220 + fVar159 * fStack_134 + fVar185 * fStack_b4
        ;
        auVar328._16_4_ =
             fVar307 * fStack_150 + fStack_70 * fVar272 + fVar161 * fStack_130 + fVar335 * fStack_b0
        ;
        auVar328._20_4_ =
             fVar336 * fStack_14c + fStack_6c * fVar289 + fVar186 * fStack_12c + fVar269 * fStack_ac
        ;
        auVar328._24_4_ =
             fVar338 * fStack_148 + fStack_68 * fVar290 + fVar164 * fStack_128 + fVar337 * fStack_a8
        ;
        auVar328._28_4_ = fVar184 + fVar184 + pfVar2[7] + fVar243;
        auVar17 = vsubps_avx(local_580,_local_860);
        auVar26 = vsubps_avx(auVar247,local_6e0);
        fVar323 = auVar17._0_4_;
        fVar331 = auVar17._4_4_;
        auVar63._4_4_ = local_6e0._4_4_ * fVar331;
        auVar63._0_4_ = (float)local_6e0._0_4_ * fVar323;
        fVar166 = auVar17._8_4_;
        auVar63._8_4_ = local_6e0._8_4_ * fVar166;
        fVar181 = auVar17._12_4_;
        auVar63._12_4_ = local_6e0._12_4_ * fVar181;
        fVar257 = auVar17._16_4_;
        auVar63._16_4_ = local_6e0._16_4_ * fVar257;
        fVar268 = auVar17._20_4_;
        auVar63._20_4_ = local_6e0._20_4_ * fVar268;
        fVar297 = auVar17._24_4_;
        auVar63._24_4_ = local_6e0._24_4_ * fVar297;
        auVar63._28_4_ = fVar243;
        fVar330 = auVar26._0_4_;
        fVar333 = auVar26._4_4_;
        auVar64._4_4_ = (float)local_860._4_4_ * fVar333;
        auVar64._0_4_ = (float)local_860._0_4_ * fVar330;
        fVar219 = auVar26._8_4_;
        auVar64._8_4_ = fStack_858 * fVar219;
        fVar183 = auVar26._12_4_;
        auVar64._12_4_ = fStack_854 * fVar183;
        fVar265 = auVar26._16_4_;
        auVar64._16_4_ = fStack_850 * fVar265;
        fVar270 = auVar26._20_4_;
        auVar64._20_4_ = fStack_84c * fVar270;
        fVar307 = auVar26._24_4_;
        auVar64._24_4_ = fStack_848 * fVar307;
        auVar64._28_4_ = auVar247._28_4_;
        auVar24 = vsubps_avx(auVar63,auVar64);
        auVar115._4_4_ = fVar160;
        auVar115._0_4_ = fVar141;
        auVar115._8_4_ = fVar162;
        auVar115._12_4_ = fVar163;
        auVar115._16_4_ = fStack_810;
        auVar115._20_4_ = fStack_80c;
        auVar115._24_4_ = fStack_808;
        auVar115._28_4_ = fStack_804;
        auVar153 = vmaxps_avx(auVar115,auVar328);
        auVar65._4_4_ = auVar153._4_4_ * auVar153._4_4_ * (fVar331 * fVar331 + fVar333 * fVar333);
        auVar65._0_4_ = auVar153._0_4_ * auVar153._0_4_ * (fVar323 * fVar323 + fVar330 * fVar330);
        auVar65._8_4_ = auVar153._8_4_ * auVar153._8_4_ * (fVar166 * fVar166 + fVar219 * fVar219);
        auVar65._12_4_ = auVar153._12_4_ * auVar153._12_4_ * (fVar181 * fVar181 + fVar183 * fVar183)
        ;
        auVar65._16_4_ = auVar153._16_4_ * auVar153._16_4_ * (fVar257 * fVar257 + fVar265 * fVar265)
        ;
        auVar65._20_4_ = auVar153._20_4_ * auVar153._20_4_ * (fVar268 * fVar268 + fVar270 * fVar270)
        ;
        auVar65._24_4_ = auVar153._24_4_ * auVar153._24_4_ * (fVar297 * fVar297 + fVar307 * fVar307)
        ;
        auVar65._28_4_ = local_580._28_4_ + auVar247._28_4_;
        auVar66._4_4_ = auVar24._4_4_ * auVar24._4_4_;
        auVar66._0_4_ = auVar24._0_4_ * auVar24._0_4_;
        auVar66._8_4_ = auVar24._8_4_ * auVar24._8_4_;
        auVar66._12_4_ = auVar24._12_4_ * auVar24._12_4_;
        auVar66._16_4_ = auVar24._16_4_ * auVar24._16_4_;
        auVar66._20_4_ = auVar24._20_4_ * auVar24._20_4_;
        auVar66._24_4_ = auVar24._24_4_ * auVar24._24_4_;
        auVar66._28_4_ = auVar24._28_4_;
        _local_4a0 = vcmpps_avx(auVar66,auVar65,2);
        auVar239 = ZEXT3264(_local_4a0);
        local_240 = (uint)lVar134;
        auVar195 = vpshufd_avx(ZEXT416(local_240),0);
        auVar170 = vpor_avx(auVar195,_DAT_01f4ad30);
        auVar195 = vpor_avx(auVar195,_DAT_01f7afa0);
        auVar121._4_4_ = fStack_47c;
        auVar121._0_4_ = local_480;
        auVar121._8_4_ = fStack_478;
        auVar121._12_4_ = fStack_474;
        auVar170 = vpcmpgtd_avx(auVar121,auVar170);
        auVar195 = vpcmpgtd_avx(auVar121,auVar195);
        auVar200._16_16_ = auVar195;
        auVar200._0_16_ = auVar170;
        auVar153 = auVar200 & _local_4a0;
        fVar323 = (float)local_660._0_4_;
        fVar166 = (float)local_660._4_4_;
        fVar257 = fStack_658;
        fVar297 = fStack_654;
        fVar330 = fStack_650;
        fVar333 = fStack_64c;
        fVar181 = fStack_648;
        fVar183 = fStack_644;
        fVar367 = (float)local_7a0._0_4_;
        fVar372 = (float)local_7a0._4_4_;
        fVar373 = fStack_798;
        fVar374 = fStack_794;
        fVar268 = fStack_790;
        fVar270 = fStack_78c;
        fVar310 = fStack_788;
        fVar188 = (float)local_6c0._0_4_;
        fVar202 = (float)local_6c0._4_4_;
        fVar204 = fStack_6b8;
        fVar206 = fStack_6b4;
        fVar313 = fStack_6b0;
        fVar364 = fStack_6ac;
        fVar365 = fStack_6a8;
        if ((((((((auVar153 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar153 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar153 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar153 >> 0x7f,0) == '\0') &&
              (auVar153 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar153 >> 0xbf,0) == '\0') &&
            (auVar153 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar153[0x1f]) {
          auVar179 = ZEXT3264(local_500);
          auVar348 = ZEXT3264(local_7c0);
          auVar322 = ZEXT3264(auVar322._0_32_);
        }
        else {
          local_620._0_4_ = auVar127._0_4_;
          local_620._4_4_ = auVar127._4_4_;
          fStack_618 = auVar127._8_4_;
          fStack_614 = auVar127._12_4_;
          fStack_610 = auVar127._16_4_;
          fStack_60c = auVar127._20_4_;
          fStack_608 = auVar127._24_4_;
          local_640 = fVar332 * (float)local_4e0._0_4_ +
                      (float)local_e0._0_4_ * (float)local_620._0_4_ +
                      (float)local_100._0_4_ * fVar271 + (float)local_7e0._0_4_ * fVar221;
          fStack_63c = fVar224 * (float)local_4e0._4_4_ +
                       (float)local_e0._4_4_ * (float)local_620._4_4_ +
                       (float)local_100._4_4_ * fVar280 + (float)local_7e0._4_4_ * fVar226;
          fStack_638 = fVar334 * fStack_4d8 +
                       fStack_d8 * fStack_618 + fStack_f8 * fVar281 + fStack_7d8 * fVar140;
          fStack_634 = fVar185 * fStack_4d4 +
                       fStack_d4 * fStack_614 + fStack_f4 * fVar220 + fStack_7d4 * fVar159;
          fStack_630 = fVar335 * fStack_4d0 +
                       fStack_d0 * fStack_610 + fStack_f0 * fVar272 + fStack_7d0 * fVar161;
          fStack_62c = fVar269 * fStack_4cc +
                       fStack_cc * fStack_60c + fStack_ec * fVar289 + fStack_7cc * fVar186;
          fStack_628 = fVar337 * fStack_4c8 +
                       fStack_c8 * fStack_608 + fStack_e8 * fVar290 + fStack_7c8 * fVar164;
          fStack_624 = auVar322._28_4_ + pfVar1[7] + fStack_804 + 0.0;
          local_680._0_4_ = auVar125._0_4_;
          local_680._4_4_ = auVar125._4_4_;
          fStack_678 = auVar125._8_4_;
          fStack_674 = auVar125._12_4_;
          auStack_670._0_4_ = auVar125._16_4_;
          auStack_670._4_4_ = auVar125._20_4_;
          fStack_668 = auVar125._24_4_;
          local_720._0_4_ = auVar124._0_4_;
          local_720._4_4_ = auVar124._4_4_;
          auStack_718._0_4_ = auVar124._8_4_;
          auStack_718._4_4_ = auVar124._12_4_;
          fStack_710 = auVar124._16_4_;
          fStack_70c = auVar124._20_4_;
          fStack_708 = auVar124._24_4_;
          pfVar1 = (float *)(lVar137 + 0x2205e84 + lVar134 * 4);
          fVar331 = *pfVar1;
          fVar219 = pfVar1[1];
          fVar265 = pfVar1[2];
          fVar307 = pfVar1[3];
          fVar332 = pfVar1[4];
          fVar224 = pfVar1[5];
          fVar334 = pfVar1[6];
          pfVar2 = (float *)(lVar137 + 0x2206308 + lVar134 * 4);
          fVar185 = *pfVar2;
          fVar335 = pfVar2[1];
          fVar269 = pfVar2[2];
          fVar337 = pfVar2[3];
          fVar336 = pfVar2[4];
          fVar338 = pfVar2[5];
          fVar271 = pfVar2[6];
          pfVar3 = (float *)(lVar137 + 0x2205a00 + lVar134 * 4);
          fVar280 = *pfVar3;
          fVar281 = pfVar3[1];
          fVar220 = pfVar3[2];
          fVar272 = pfVar3[3];
          fVar289 = pfVar3[4];
          fVar290 = pfVar3[5];
          fVar221 = pfVar3[6];
          fVar165 = pfVar1[7] + pfVar2[7];
          fStack_424 = pfVar2[7] + fStack_844 + 0.0;
          fVar256 = fStack_844 + auVar322._28_4_ + fStack_844 + 0.0;
          pfVar1 = (float *)(lVar137 + 0x220557c + lVar134 * 4);
          fVar226 = *pfVar1;
          fVar140 = pfVar1[1];
          fVar159 = pfVar1[2];
          fVar161 = pfVar1[3];
          fVar186 = pfVar1[4];
          fVar164 = pfVar1[5];
          fVar243 = pfVar1[6];
          local_5a0 = (float)local_a0._0_4_ * fVar226 +
                      fVar280 * (float)local_7a0._0_4_ +
                      fVar167 * fVar331 + (float)local_420._0_4_ * fVar185;
          fStack_59c = (float)local_a0._4_4_ * fVar140 +
                       fVar281 * (float)local_7a0._4_4_ +
                       fVar180 * fVar219 + (float)local_420._4_4_ * fVar335;
          fStack_598 = fStack_98 * fVar159 +
                       fVar220 * fStack_798 + fVar182 * fVar265 + fStack_418 * fVar269;
          fStack_594 = fStack_94 * fVar161 +
                       fVar272 * fStack_794 + fVar184 * fVar307 + fStack_414 * fVar337;
          fStack_590 = fStack_90 * fVar186 +
                       fVar289 * fStack_790 + fVar167 * fVar332 + fStack_410 * fVar336;
          fStack_58c = fStack_8c * fVar164 +
                       fVar290 * fStack_78c + fVar180 * fVar224 + fStack_40c * fVar338;
          fStack_588 = fStack_88 * fVar243 +
                       fVar221 * fStack_788 + fVar182 * fVar334 + fStack_408 * fVar271;
          fStack_584 = fVar165 + fStack_424;
          local_440 = fVar226 * (float)local_6c0._0_4_ +
                      fVar331 * (float)local_800._0_4_ + (float)local_660._0_4_ * fVar185 +
                      (float)local_2e0._0_4_ * fVar280;
          fStack_43c = fVar140 * (float)local_6c0._4_4_ +
                       fVar219 * (float)local_800._4_4_ + (float)local_660._4_4_ * fVar335 +
                       (float)local_2e0._4_4_ * fVar281;
          fStack_438 = fVar159 * fStack_6b8 +
                       fVar265 * fStack_7f8 + fStack_658 * fVar269 + fStack_2d8 * fVar220;
          fStack_434 = fVar161 * fStack_6b4 +
                       fVar307 * fStack_7f4 + fStack_654 * fVar337 + fStack_2d4 * fVar272;
          fStack_430 = fVar186 * fStack_6b0 +
                       fVar332 * fStack_7f0 + fStack_650 * fVar336 + fStack_2d0 * fVar289;
          fStack_42c = fVar164 * fStack_6ac +
                       fVar224 * fStack_7ec + fStack_64c * fVar338 + fStack_2cc * fVar290;
          fStack_428 = fVar243 * fStack_6a8 +
                       fVar334 * fStack_7e8 + fStack_648 * fVar271 + fStack_2c8 * fVar221;
          fStack_424 = fStack_424 + fVar256;
          auVar329._0_4_ =
               fVar280 * (float)local_e0._0_4_ +
               (float)local_100._0_4_ * fVar331 + (float)local_7e0._0_4_ * fVar185 +
               fVar226 * (float)local_4e0._0_4_;
          auVar329._4_4_ =
               fVar281 * (float)local_e0._4_4_ +
               (float)local_100._4_4_ * fVar219 + (float)local_7e0._4_4_ * fVar335 +
               fVar140 * (float)local_4e0._4_4_;
          auVar329._8_4_ =
               fVar220 * fStack_d8 + fStack_f8 * fVar265 + fStack_7d8 * fVar269 +
               fVar159 * fStack_4d8;
          auVar329._12_4_ =
               fVar272 * fStack_d4 + fStack_f4 * fVar307 + fStack_7d4 * fVar337 +
               fVar161 * fStack_4d4;
          auVar329._16_4_ =
               fVar289 * fStack_d0 + fStack_f0 * fVar332 + fStack_7d0 * fVar336 +
               fVar186 * fStack_4d0;
          auVar329._20_4_ =
               fVar290 * fStack_cc + fStack_ec * fVar224 + fStack_7cc * fVar338 +
               fVar164 * fStack_4cc;
          auVar329._24_4_ =
               fVar221 * fStack_c8 + fStack_e8 * fVar334 + fStack_7c8 * fVar271 +
               fVar243 * fStack_4c8;
          auVar329._28_4_ = pfVar3[7] + fVar165 + fVar256;
          pfVar2 = (float *)(lVar137 + 0x22082a4 + lVar134 * 4);
          fVar331 = *pfVar2;
          fVar219 = pfVar2[1];
          fVar265 = pfVar2[2];
          fVar307 = pfVar2[3];
          fVar332 = pfVar2[4];
          fVar224 = pfVar2[5];
          fVar334 = pfVar2[6];
          pfVar3 = (float *)(lVar137 + 0x2208728 + lVar134 * 4);
          fVar185 = *pfVar3;
          fVar335 = pfVar3[1];
          fVar269 = pfVar3[2];
          fVar337 = pfVar3[3];
          fVar336 = pfVar3[4];
          fVar338 = pfVar3[5];
          fVar271 = pfVar3[6];
          pfVar4 = (float *)(lVar137 + 0x2207e20 + lVar134 * 4);
          fVar280 = *pfVar4;
          fVar281 = pfVar4[1];
          fVar220 = pfVar4[2];
          fVar272 = pfVar4[3];
          fVar289 = pfVar4[4];
          fVar290 = pfVar4[5];
          fVar221 = pfVar4[6];
          pfVar5 = (float *)(lVar137 + 0x220799c + lVar134 * 4);
          fVar226 = *pfVar5;
          fVar140 = pfVar5[1];
          fVar159 = pfVar5[2];
          fVar161 = pfVar5[3];
          fVar186 = pfVar5[4];
          fVar164 = pfVar5[5];
          fVar243 = pfVar5[6];
          auVar305._0_4_ =
               (float)local_a0._0_4_ * fVar226 +
               fVar280 * (float)local_7a0._0_4_ +
               fVar167 * fVar331 + (float)local_420._0_4_ * fVar185;
          auVar305._4_4_ =
               (float)local_a0._4_4_ * fVar140 +
               fVar281 * (float)local_7a0._4_4_ +
               fVar180 * fVar219 + (float)local_420._4_4_ * fVar335;
          auVar305._8_4_ =
               fStack_98 * fVar159 + fVar220 * fStack_798 + fVar182 * fVar265 + fStack_418 * fVar269
          ;
          auVar305._12_4_ =
               fStack_94 * fVar161 + fVar272 * fStack_794 + fVar184 * fVar307 + fStack_414 * fVar337
          ;
          auVar305._16_4_ =
               fStack_90 * fVar186 + fVar289 * fStack_790 + fVar167 * fVar332 + fStack_410 * fVar336
          ;
          auVar305._20_4_ =
               fStack_8c * fVar164 + fVar290 * fStack_78c + fVar180 * fVar224 + fStack_40c * fVar338
          ;
          auVar305._24_4_ =
               fStack_88 * fVar243 + fVar221 * fStack_788 + fVar182 * fVar334 + fStack_408 * fVar271
          ;
          auVar305._28_4_ = fStack_404 + fStack_404 + pfVar1[7] + fStack_404;
          auVar346._0_4_ =
               fVar226 * (float)local_6c0._0_4_ +
               (float)local_2e0._0_4_ * fVar280 +
               fVar331 * (float)local_800._0_4_ + (float)local_660._0_4_ * fVar185;
          auVar346._4_4_ =
               fVar140 * (float)local_6c0._4_4_ +
               (float)local_2e0._4_4_ * fVar281 +
               fVar219 * (float)local_800._4_4_ + (float)local_660._4_4_ * fVar335;
          auVar346._8_4_ =
               fVar159 * fStack_6b8 +
               fStack_2d8 * fVar220 + fVar265 * fStack_7f8 + fStack_658 * fVar269;
          auVar346._12_4_ =
               fVar161 * fStack_6b4 +
               fStack_2d4 * fVar272 + fVar307 * fStack_7f4 + fStack_654 * fVar337;
          auVar346._16_4_ =
               fVar186 * fStack_6b0 +
               fStack_2d0 * fVar289 + fVar332 * fStack_7f0 + fStack_650 * fVar336;
          auVar346._20_4_ =
               fVar164 * fStack_6ac +
               fStack_2cc * fVar290 + fVar224 * fStack_7ec + fStack_64c * fVar338;
          auVar346._24_4_ =
               fVar243 * fStack_6a8 +
               fStack_2c8 * fVar221 + fVar334 * fStack_7e8 + fStack_648 * fVar271;
          auVar346._28_4_ = fStack_404 + fStack_404 + fStack_644 + fStack_404;
          auVar248._8_4_ = 0x7fffffff;
          auVar248._0_8_ = 0x7fffffff7fffffff;
          auVar248._12_4_ = 0x7fffffff;
          auVar248._16_4_ = 0x7fffffff;
          auVar248._20_4_ = 0x7fffffff;
          auVar248._24_4_ = 0x7fffffff;
          auVar248._28_4_ = 0x7fffffff;
          auVar120._4_4_ = fStack_59c;
          auVar120._0_4_ = local_5a0;
          auVar120._8_4_ = fStack_598;
          auVar120._12_4_ = fStack_594;
          auVar120._16_4_ = fStack_590;
          auVar120._20_4_ = fStack_58c;
          auVar120._24_4_ = fStack_588;
          auVar120._28_4_ = fStack_584;
          auVar153 = vandps_avx(auVar120,auVar248);
          auVar123._4_4_ = fStack_43c;
          auVar123._0_4_ = local_440;
          auVar123._8_4_ = fStack_438;
          auVar123._12_4_ = fStack_434;
          auVar123._16_4_ = fStack_430;
          auVar123._20_4_ = fStack_42c;
          auVar123._24_4_ = fStack_428;
          auVar123._28_4_ = fStack_424;
          auVar24 = vandps_avx(auVar123,auVar248);
          auVar24 = vmaxps_avx(auVar153,auVar24);
          auVar153 = vandps_avx(auVar329,auVar248);
          auVar24 = vmaxps_avx(auVar24,auVar153);
          auVar24 = vcmpps_avx(auVar24,local_5c0,1);
          auVar25 = vblendvps_avx(auVar120,auVar17,auVar24);
          auVar154._0_4_ =
               fVar226 * (float)local_4e0._0_4_ +
               fVar280 * (float)local_e0._0_4_ +
               fVar185 * (float)local_7e0._0_4_ + (float)local_100._0_4_ * fVar331;
          auVar154._4_4_ =
               fVar140 * (float)local_4e0._4_4_ +
               fVar281 * (float)local_e0._4_4_ +
               fVar335 * (float)local_7e0._4_4_ + (float)local_100._4_4_ * fVar219;
          auVar154._8_4_ =
               fVar159 * fStack_4d8 +
               fVar220 * fStack_d8 + fVar269 * fStack_7d8 + fStack_f8 * fVar265;
          auVar154._12_4_ =
               fVar161 * fStack_4d4 +
               fVar272 * fStack_d4 + fVar337 * fStack_7d4 + fStack_f4 * fVar307;
          auVar154._16_4_ =
               fVar186 * fStack_4d0 +
               fVar289 * fStack_d0 + fVar336 * fStack_7d0 + fStack_f0 * fVar332;
          auVar154._20_4_ =
               fVar164 * fStack_4cc +
               fVar290 * fStack_cc + fVar338 * fStack_7cc + fStack_ec * fVar224;
          auVar154._24_4_ =
               fVar243 * fStack_4c8 +
               fVar221 * fStack_c8 + fVar271 * fStack_7c8 + fStack_e8 * fVar334;
          auVar154._28_4_ = auVar153._28_4_ + pfVar4[7] + pfVar3[7] + pfVar2[7];
          auVar32 = vblendvps_avx(auVar123,auVar26,auVar24);
          auVar153 = vandps_avx(auVar305,auVar248);
          auVar24 = vandps_avx(auVar346,auVar248);
          auVar18 = vmaxps_avx(auVar153,auVar24);
          auVar153 = vandps_avx(auVar154,auVar248);
          auVar153 = vmaxps_avx(auVar18,auVar153);
          local_600._0_4_ = auVar126._0_4_;
          local_600._4_4_ = auVar126._4_4_;
          fStack_5f8 = auVar126._8_4_;
          fStack_5f4 = auVar126._12_4_;
          auStack_5f0._0_4_ = auVar126._16_4_;
          auStack_5f0._4_4_ = auVar126._20_4_;
          fStack_5e8 = auVar126._24_4_;
          auVar24 = vcmpps_avx(auVar153,local_5c0,1);
          auVar153 = vblendvps_avx(auVar305,auVar17,auVar24);
          auVar155._0_4_ =
               (float)local_4e0._0_4_ * (float)local_600._0_4_ +
               (float)local_e0._0_4_ * (float)local_680._0_4_ +
               (float)local_100._0_4_ * (float)local_720._0_4_ + (float)local_7e0._0_4_ * fVar274;
          auVar155._4_4_ =
               (float)local_4e0._4_4_ * (float)local_600._4_4_ +
               (float)local_e0._4_4_ * (float)local_680._4_4_ +
               (float)local_100._4_4_ * (float)local_720._4_4_ + (float)local_7e0._4_4_ * fVar293;
          auVar155._8_4_ =
               fStack_4d8 * fStack_5f8 +
               fStack_d8 * fStack_678 + fStack_f8 * (float)auStack_718._0_4_ + fStack_7d8 * fVar294;
          auVar155._12_4_ =
               fStack_4d4 * fStack_5f4 +
               fStack_d4 * fStack_674 + fStack_f4 * (float)auStack_718._4_4_ + fStack_7d4 * fVar223;
          auVar155._16_4_ =
               fStack_4d0 * (float)auStack_5f0._0_4_ +
               fStack_d0 * (float)auStack_670._0_4_ + fStack_f0 * fStack_710 + fStack_7d0 * fVar276;
          auVar155._20_4_ =
               fStack_4cc * (float)auStack_5f0._4_4_ +
               fStack_cc * (float)auStack_670._4_4_ + fStack_ec * fStack_70c + fStack_7cc * fVar295;
          auVar155._24_4_ =
               fStack_4c8 * fStack_5e8 +
               fStack_c8 * fStack_668 + fStack_e8 * fStack_708 + fStack_7c8 * fVar296;
          auVar155._28_4_ = auVar18._28_4_ + fStack_624 + fStack_804 + 0.0;
          auVar17 = vblendvps_avx(auVar346,auVar26,auVar24);
          fVar165 = auVar25._0_4_;
          fVar256 = auVar25._4_4_;
          fVar222 = auVar25._8_4_;
          fVar225 = auVar25._12_4_;
          fVar279 = auVar25._16_4_;
          fVar288 = auVar25._20_4_;
          fVar291 = auVar25._24_4_;
          fVar292 = auVar25._28_4_;
          fVar280 = auVar153._0_4_;
          fVar220 = auVar153._4_4_;
          fVar289 = auVar153._8_4_;
          fVar221 = auVar153._12_4_;
          fVar293 = auVar153._16_4_;
          fVar223 = auVar153._20_4_;
          fVar295 = auVar153._24_4_;
          fVar331 = auVar32._0_4_;
          fVar265 = auVar32._4_4_;
          fVar332 = auVar32._8_4_;
          fVar334 = auVar32._12_4_;
          fVar335 = auVar32._16_4_;
          fVar337 = auVar32._20_4_;
          fVar338 = auVar32._24_4_;
          auVar320._0_4_ = fVar331 * fVar331 + fVar165 * fVar165;
          auVar320._4_4_ = fVar265 * fVar265 + fVar256 * fVar256;
          auVar320._8_4_ = fVar332 * fVar332 + fVar222 * fVar222;
          auVar320._12_4_ = fVar334 * fVar334 + fVar225 * fVar225;
          auVar320._16_4_ = fVar335 * fVar335 + fVar279 * fVar279;
          auVar320._20_4_ = fVar337 * fVar337 + fVar288 * fVar288;
          auVar320._24_4_ = fVar338 * fVar338 + fVar291 * fVar291;
          auVar320._28_4_ = auVar329._28_4_ + auVar26._28_4_;
          auVar26 = vrsqrtps_avx(auVar320);
          fVar219 = auVar26._0_4_;
          fVar307 = auVar26._4_4_;
          auVar67._4_4_ = fVar307 * 1.5;
          auVar67._0_4_ = fVar219 * 1.5;
          fVar224 = auVar26._8_4_;
          auVar67._8_4_ = fVar224 * 1.5;
          fVar185 = auVar26._12_4_;
          auVar67._12_4_ = fVar185 * 1.5;
          fVar269 = auVar26._16_4_;
          auVar67._16_4_ = fVar269 * 1.5;
          fVar336 = auVar26._20_4_;
          auVar67._20_4_ = fVar336 * 1.5;
          fVar271 = auVar26._24_4_;
          auVar67._24_4_ = fVar271 * 1.5;
          auVar67._28_4_ = auVar346._28_4_;
          auVar68._4_4_ = fVar307 * fVar307 * fVar307 * auVar320._4_4_ * 0.5;
          auVar68._0_4_ = fVar219 * fVar219 * fVar219 * auVar320._0_4_ * 0.5;
          auVar68._8_4_ = fVar224 * fVar224 * fVar224 * auVar320._8_4_ * 0.5;
          auVar68._12_4_ = fVar185 * fVar185 * fVar185 * auVar320._12_4_ * 0.5;
          auVar68._16_4_ = fVar269 * fVar269 * fVar269 * auVar320._16_4_ * 0.5;
          auVar68._20_4_ = fVar336 * fVar336 * fVar336 * auVar320._20_4_ * 0.5;
          auVar68._24_4_ = fVar271 * fVar271 * fVar271 * auVar320._24_4_ * 0.5;
          auVar68._28_4_ = auVar320._28_4_;
          auVar24 = vsubps_avx(auVar67,auVar68);
          fVar226 = auVar24._0_4_;
          fVar140 = auVar24._4_4_;
          fVar159 = auVar24._8_4_;
          fVar161 = auVar24._12_4_;
          fVar186 = auVar24._16_4_;
          fVar164 = auVar24._20_4_;
          fVar243 = auVar24._24_4_;
          fVar219 = auVar17._0_4_;
          fVar307 = auVar17._4_4_;
          fVar224 = auVar17._8_4_;
          fVar185 = auVar17._12_4_;
          fVar269 = auVar17._16_4_;
          fVar336 = auVar17._20_4_;
          fVar271 = auVar17._24_4_;
          auVar285._0_4_ = fVar219 * fVar219 + fVar280 * fVar280;
          auVar285._4_4_ = fVar307 * fVar307 + fVar220 * fVar220;
          auVar285._8_4_ = fVar224 * fVar224 + fVar289 * fVar289;
          auVar285._12_4_ = fVar185 * fVar185 + fVar221 * fVar221;
          auVar285._16_4_ = fVar269 * fVar269 + fVar293 * fVar293;
          auVar285._20_4_ = fVar336 * fVar336 + fVar223 * fVar223;
          auVar285._24_4_ = fVar271 * fVar271 + fVar295 * fVar295;
          auVar285._28_4_ = auVar26._28_4_ + auVar153._28_4_;
          auVar153 = vrsqrtps_avx(auVar285);
          fVar281 = auVar153._0_4_;
          fVar272 = auVar153._4_4_;
          auVar69._4_4_ = fVar272 * 1.5;
          auVar69._0_4_ = fVar281 * 1.5;
          fVar290 = auVar153._8_4_;
          auVar69._8_4_ = fVar290 * 1.5;
          fVar274 = auVar153._12_4_;
          auVar69._12_4_ = fVar274 * 1.5;
          fVar294 = auVar153._16_4_;
          auVar69._16_4_ = fVar294 * 1.5;
          fVar276 = auVar153._20_4_;
          auVar69._20_4_ = fVar276 * 1.5;
          fVar296 = auVar153._24_4_;
          auVar69._24_4_ = fVar296 * 1.5;
          auVar69._28_4_ = auVar346._28_4_;
          auVar70._4_4_ = fVar272 * fVar272 * fVar272 * auVar285._4_4_ * 0.5;
          auVar70._0_4_ = fVar281 * fVar281 * fVar281 * auVar285._0_4_ * 0.5;
          auVar70._8_4_ = fVar290 * fVar290 * fVar290 * auVar285._8_4_ * 0.5;
          auVar70._12_4_ = fVar274 * fVar274 * fVar274 * auVar285._12_4_ * 0.5;
          auVar70._16_4_ = fVar294 * fVar294 * fVar294 * auVar285._16_4_ * 0.5;
          auVar70._20_4_ = fVar276 * fVar276 * fVar276 * auVar285._20_4_ * 0.5;
          auVar70._24_4_ = fVar296 * fVar296 * fVar296 * auVar285._24_4_ * 0.5;
          auVar70._28_4_ = auVar285._28_4_;
          auVar17 = vsubps_avx(auVar69,auVar70);
          fVar281 = auVar17._0_4_;
          fVar272 = auVar17._4_4_;
          fVar290 = auVar17._8_4_;
          fVar274 = auVar17._12_4_;
          fVar294 = auVar17._16_4_;
          fVar276 = auVar17._20_4_;
          fVar296 = auVar17._24_4_;
          fVar331 = fVar141 * fVar226 * fVar331;
          fVar265 = fVar160 * fVar140 * fVar265;
          auVar71._4_4_ = fVar265;
          auVar71._0_4_ = fVar331;
          fVar332 = fVar162 * fVar159 * fVar332;
          auVar71._8_4_ = fVar332;
          fVar334 = fVar163 * fVar161 * fVar334;
          auVar71._12_4_ = fVar334;
          fVar335 = fStack_810 * fVar186 * fVar335;
          auVar71._16_4_ = fVar335;
          fVar337 = fStack_80c * fVar164 * fVar337;
          auVar71._20_4_ = fVar337;
          fVar338 = fStack_808 * fVar243 * fVar338;
          auVar71._24_4_ = fVar338;
          auVar71._28_4_ = auVar153._28_4_;
          local_600._4_4_ = fVar265 + (float)local_860._4_4_;
          local_600._0_4_ = fVar331 + (float)local_860._0_4_;
          fStack_5f8 = fVar332 + fStack_858;
          fStack_5f4 = fVar334 + fStack_854;
          auStack_5f0._0_4_ = fVar335 + fStack_850;
          auStack_5f0._4_4_ = fVar337 + fStack_84c;
          fStack_5e8 = fVar338 + fStack_848;
          fStack_5e4 = auVar153._28_4_ + fStack_844;
          fVar331 = fVar141 * fVar226 * -fVar165;
          fVar265 = fVar160 * fVar140 * -fVar256;
          auVar72._4_4_ = fVar265;
          auVar72._0_4_ = fVar331;
          fVar332 = fVar162 * fVar159 * -fVar222;
          auVar72._8_4_ = fVar332;
          fVar334 = fVar163 * fVar161 * -fVar225;
          auVar72._12_4_ = fVar334;
          fVar335 = fStack_810 * fVar186 * -fVar279;
          auVar72._16_4_ = fVar335;
          fVar337 = fStack_80c * fVar164 * -fVar288;
          auVar72._20_4_ = fVar337;
          fVar338 = fStack_808 * fVar243 * -fVar291;
          auVar72._24_4_ = fVar338;
          auVar72._28_4_ = -fVar292;
          local_720._4_4_ = local_6e0._4_4_ + fVar265;
          local_720._0_4_ = (float)local_6e0._0_4_ + fVar331;
          auStack_718._0_4_ = local_6e0._8_4_ + fVar332;
          auStack_718._4_4_ = local_6e0._12_4_ + fVar334;
          fStack_710 = local_6e0._16_4_ + fVar335;
          fStack_70c = local_6e0._20_4_ + fVar337;
          fStack_708 = local_6e0._24_4_ + fVar338;
          fStack_704 = local_6e0._28_4_ + -fVar292;
          fVar331 = fVar226 * 0.0 * fVar141;
          fVar265 = fVar140 * 0.0 * fVar160;
          auVar73._4_4_ = fVar265;
          auVar73._0_4_ = fVar331;
          fVar332 = fVar159 * 0.0 * fVar162;
          auVar73._8_4_ = fVar332;
          fVar334 = fVar161 * 0.0 * fVar163;
          auVar73._12_4_ = fVar334;
          fVar335 = fVar186 * 0.0 * fStack_810;
          auVar73._16_4_ = fVar335;
          fVar337 = fVar164 * 0.0 * fStack_80c;
          auVar73._20_4_ = fVar337;
          fVar338 = fVar243 * 0.0 * fStack_808;
          auVar73._24_4_ = fVar338;
          auVar73._28_4_ = fVar292;
          auVar153 = vsubps_avx(_local_860,auVar71);
          auVar370._0_4_ = fVar331 + auVar155._0_4_;
          auVar370._4_4_ = fVar265 + auVar155._4_4_;
          auVar370._8_4_ = fVar332 + auVar155._8_4_;
          auVar370._12_4_ = fVar334 + auVar155._12_4_;
          auVar370._16_4_ = fVar335 + auVar155._16_4_;
          auVar370._20_4_ = fVar337 + auVar155._20_4_;
          auVar370._24_4_ = fVar338 + auVar155._24_4_;
          auVar370._28_4_ = fVar292 + auVar155._28_4_;
          fVar331 = auVar328._0_4_ * fVar281 * fVar219;
          fVar219 = auVar328._4_4_ * fVar272 * fVar307;
          auVar74._4_4_ = fVar219;
          auVar74._0_4_ = fVar331;
          fVar265 = auVar328._8_4_ * fVar290 * fVar224;
          auVar74._8_4_ = fVar265;
          fVar307 = auVar328._12_4_ * fVar274 * fVar185;
          auVar74._12_4_ = fVar307;
          fVar332 = auVar328._16_4_ * fVar294 * fVar269;
          auVar74._16_4_ = fVar332;
          fVar224 = auVar328._20_4_ * fVar276 * fVar336;
          auVar74._20_4_ = fVar224;
          fVar334 = auVar328._24_4_ * fVar296 * fVar271;
          auVar74._24_4_ = fVar334;
          auVar74._28_4_ = fStack_844;
          auVar246 = vsubps_avx(local_6e0,auVar72);
          auVar352._0_4_ = local_580._0_4_ + fVar331;
          auVar352._4_4_ = local_580._4_4_ + fVar219;
          auVar352._8_4_ = local_580._8_4_ + fVar265;
          auVar352._12_4_ = local_580._12_4_ + fVar307;
          auVar352._16_4_ = local_580._16_4_ + fVar332;
          auVar352._20_4_ = local_580._20_4_ + fVar224;
          auVar352._24_4_ = local_580._24_4_ + fVar334;
          auVar352._28_4_ = local_580._28_4_ + fStack_844;
          fVar331 = fVar281 * -fVar280 * auVar328._0_4_;
          fVar219 = fVar272 * -fVar220 * auVar328._4_4_;
          auVar75._4_4_ = fVar219;
          auVar75._0_4_ = fVar331;
          fVar265 = fVar290 * -fVar289 * auVar328._8_4_;
          auVar75._8_4_ = fVar265;
          fVar307 = fVar274 * -fVar221 * auVar328._12_4_;
          auVar75._12_4_ = fVar307;
          fVar332 = fVar294 * -fVar293 * auVar328._16_4_;
          auVar75._16_4_ = fVar332;
          fVar224 = fVar276 * -fVar223 * auVar328._20_4_;
          auVar75._20_4_ = fVar224;
          fVar334 = fVar296 * -fVar295 * auVar328._24_4_;
          auVar75._24_4_ = fVar334;
          auVar75._28_4_ = fStack_804;
          auVar284 = vsubps_avx(auVar155,auVar73);
          auVar238._0_4_ = auVar247._0_4_ + fVar331;
          auVar238._4_4_ = auVar247._4_4_ + fVar219;
          auVar238._8_4_ = auVar247._8_4_ + fVar265;
          auVar238._12_4_ = auVar247._12_4_ + fVar307;
          auVar238._16_4_ = auVar247._16_4_ + fVar332;
          auVar238._20_4_ = auVar247._20_4_ + fVar224;
          auVar238._24_4_ = auVar247._24_4_ + fVar334;
          auVar238._28_4_ = auVar247._28_4_ + fStack_804;
          fVar331 = fVar281 * 0.0 * auVar328._0_4_;
          fVar219 = fVar272 * 0.0 * auVar328._4_4_;
          auVar76._4_4_ = fVar219;
          auVar76._0_4_ = fVar331;
          fVar265 = fVar290 * 0.0 * auVar328._8_4_;
          auVar76._8_4_ = fVar265;
          fVar307 = fVar274 * 0.0 * auVar328._12_4_;
          auVar76._12_4_ = fVar307;
          fVar332 = fVar294 * 0.0 * auVar328._16_4_;
          auVar76._16_4_ = fVar332;
          fVar224 = fVar276 * 0.0 * auVar328._20_4_;
          auVar76._20_4_ = fVar224;
          fVar334 = fVar296 * 0.0 * auVar328._24_4_;
          auVar76._24_4_ = fVar334;
          auVar76._28_4_ = auVar155._28_4_;
          auVar26 = vsubps_avx(local_580,auVar74);
          auVar118._4_4_ = fStack_63c;
          auVar118._0_4_ = local_640;
          auVar118._8_4_ = fStack_638;
          auVar118._12_4_ = fStack_634;
          auVar118._16_4_ = fStack_630;
          auVar118._20_4_ = fStack_62c;
          auVar118._24_4_ = fStack_628;
          auVar118._28_4_ = fStack_624;
          auVar306._0_4_ = local_640 + fVar331;
          auVar306._4_4_ = fStack_63c + fVar219;
          auVar306._8_4_ = fStack_638 + fVar265;
          auVar306._12_4_ = fStack_634 + fVar307;
          auVar306._16_4_ = fStack_630 + fVar332;
          auVar306._20_4_ = fStack_62c + fVar224;
          auVar306._24_4_ = fStack_628 + fVar334;
          auVar306._28_4_ = fStack_624 + auVar155._28_4_;
          auVar24 = vsubps_avx(auVar247,auVar75);
          auVar25 = vsubps_avx(auVar118,auVar76);
          auVar32 = vsubps_avx(auVar238,auVar246);
          auVar18 = vsubps_avx(auVar306,auVar284);
          auVar77._4_4_ = auVar284._4_4_ * auVar32._4_4_;
          auVar77._0_4_ = auVar284._0_4_ * auVar32._0_4_;
          auVar77._8_4_ = auVar284._8_4_ * auVar32._8_4_;
          auVar77._12_4_ = auVar284._12_4_ * auVar32._12_4_;
          auVar77._16_4_ = auVar284._16_4_ * auVar32._16_4_;
          auVar77._20_4_ = auVar284._20_4_ * auVar32._20_4_;
          auVar77._24_4_ = auVar284._24_4_ * auVar32._24_4_;
          auVar77._28_4_ = auVar346._28_4_;
          auVar78._4_4_ = auVar246._4_4_ * auVar18._4_4_;
          auVar78._0_4_ = auVar246._0_4_ * auVar18._0_4_;
          auVar78._8_4_ = auVar246._8_4_ * auVar18._8_4_;
          auVar78._12_4_ = auVar246._12_4_ * auVar18._12_4_;
          auVar78._16_4_ = auVar246._16_4_ * auVar18._16_4_;
          auVar78._20_4_ = auVar246._20_4_ * auVar18._20_4_;
          auVar78._24_4_ = auVar246._24_4_ * auVar18._24_4_;
          auVar78._28_4_ = auVar247._28_4_;
          auVar148 = vsubps_avx(auVar78,auVar77);
          auVar79._4_4_ = auVar153._4_4_ * auVar18._4_4_;
          auVar79._0_4_ = auVar153._0_4_ * auVar18._0_4_;
          auVar79._8_4_ = auVar153._8_4_ * auVar18._8_4_;
          auVar79._12_4_ = auVar153._12_4_ * auVar18._12_4_;
          auVar79._16_4_ = auVar153._16_4_ * auVar18._16_4_;
          auVar79._20_4_ = auVar153._20_4_ * auVar18._20_4_;
          auVar79._24_4_ = auVar153._24_4_ * auVar18._24_4_;
          auVar79._28_4_ = auVar18._28_4_;
          auVar18 = vsubps_avx(auVar352,auVar153);
          auVar80._4_4_ = auVar284._4_4_ * auVar18._4_4_;
          auVar80._0_4_ = auVar284._0_4_ * auVar18._0_4_;
          auVar80._8_4_ = auVar284._8_4_ * auVar18._8_4_;
          auVar80._12_4_ = auVar284._12_4_ * auVar18._12_4_;
          auVar80._16_4_ = auVar284._16_4_ * auVar18._16_4_;
          auVar80._20_4_ = auVar284._20_4_ * auVar18._20_4_;
          auVar80._24_4_ = auVar284._24_4_ * auVar18._24_4_;
          auVar80._28_4_ = auVar17._28_4_;
          auVar213 = vsubps_avx(auVar80,auVar79);
          auVar81._4_4_ = auVar246._4_4_ * auVar18._4_4_;
          auVar81._0_4_ = auVar246._0_4_ * auVar18._0_4_;
          auVar81._8_4_ = auVar246._8_4_ * auVar18._8_4_;
          auVar81._12_4_ = auVar246._12_4_ * auVar18._12_4_;
          auVar81._16_4_ = auVar246._16_4_ * auVar18._16_4_;
          auVar81._20_4_ = auVar246._20_4_ * auVar18._20_4_;
          auVar81._24_4_ = auVar246._24_4_ * auVar18._24_4_;
          auVar81._28_4_ = auVar17._28_4_;
          auVar82._4_4_ = auVar153._4_4_ * auVar32._4_4_;
          auVar82._0_4_ = auVar153._0_4_ * auVar32._0_4_;
          auVar82._8_4_ = auVar153._8_4_ * auVar32._8_4_;
          auVar82._12_4_ = auVar153._12_4_ * auVar32._12_4_;
          auVar82._16_4_ = auVar153._16_4_ * auVar32._16_4_;
          auVar82._20_4_ = auVar153._20_4_ * auVar32._20_4_;
          auVar82._24_4_ = auVar153._24_4_ * auVar32._24_4_;
          auVar82._28_4_ = auVar32._28_4_;
          auVar17 = vsubps_avx(auVar82,auVar81);
          auVar175._0_4_ = auVar148._0_4_ * 0.0 + auVar17._0_4_ + auVar213._0_4_ * 0.0;
          auVar175._4_4_ = auVar148._4_4_ * 0.0 + auVar17._4_4_ + auVar213._4_4_ * 0.0;
          auVar175._8_4_ = auVar148._8_4_ * 0.0 + auVar17._8_4_ + auVar213._8_4_ * 0.0;
          auVar175._12_4_ = auVar148._12_4_ * 0.0 + auVar17._12_4_ + auVar213._12_4_ * 0.0;
          auVar175._16_4_ = auVar148._16_4_ * 0.0 + auVar17._16_4_ + auVar213._16_4_ * 0.0;
          auVar175._20_4_ = auVar148._20_4_ * 0.0 + auVar17._20_4_ + auVar213._20_4_ * 0.0;
          auVar175._24_4_ = auVar148._24_4_ * 0.0 + auVar17._24_4_ + auVar213._24_4_ * 0.0;
          auVar175._28_4_ = auVar148._28_4_ + auVar17._28_4_ + auVar213._28_4_;
          auVar234 = vcmpps_avx(auVar175,ZEXT832(0) << 0x20,2);
          auVar17 = vblendvps_avx(auVar26,_local_600,auVar234);
          auVar26 = vblendvps_avx(auVar24,_local_720,auVar234);
          auVar24 = vblendvps_avx(auVar25,auVar370,auVar234);
          auVar25 = vblendvps_avx(auVar153,auVar352,auVar234);
          auVar32 = vblendvps_avx(auVar246,auVar238,auVar234);
          auVar18 = vblendvps_avx(auVar284,auVar306,auVar234);
          auVar148 = vblendvps_avx(auVar352,auVar153,auVar234);
          auVar213 = vblendvps_avx(auVar238,auVar246,auVar234);
          auVar214 = vblendvps_avx(auVar306,auVar284,auVar234);
          auVar153 = vandps_avx(auVar200,_local_4a0);
          auVar148 = vsubps_avx(auVar148,auVar17);
          auVar327 = vsubps_avx(auVar213,auVar26);
          auVar214 = vsubps_avx(auVar214,auVar24);
          auVar31 = vsubps_avx(auVar26,auVar32);
          fVar331 = auVar327._0_4_;
          fVar259 = auVar24._0_4_;
          fVar185 = auVar327._4_4_;
          fVar267 = auVar24._4_4_;
          auVar83._4_4_ = fVar267 * fVar185;
          auVar83._0_4_ = fVar259 * fVar331;
          fVar280 = auVar327._8_4_;
          fVar339 = auVar24._8_4_;
          auVar83._8_4_ = fVar339 * fVar280;
          fVar274 = auVar327._12_4_;
          fVar349 = auVar24._12_4_;
          auVar83._12_4_ = fVar349 * fVar274;
          fVar226 = auVar327._16_4_;
          fVar273 = auVar24._16_4_;
          auVar83._16_4_ = fVar273 * fVar226;
          fVar165 = auVar327._20_4_;
          fVar275 = auVar24._20_4_;
          auVar83._20_4_ = fVar275 * fVar165;
          fVar292 = auVar327._24_4_;
          fVar277 = auVar24._24_4_;
          auVar83._24_4_ = fVar277 * fVar292;
          auVar83._28_4_ = auVar213._28_4_;
          fVar219 = auVar26._0_4_;
          fVar300 = auVar214._0_4_;
          fVar335 = auVar26._4_4_;
          fVar356 = auVar214._4_4_;
          auVar84._4_4_ = fVar356 * fVar335;
          auVar84._0_4_ = fVar300 * fVar219;
          fVar281 = auVar26._8_4_;
          fVar312 = auVar214._8_4_;
          auVar84._8_4_ = fVar312 * fVar281;
          fVar293 = auVar26._12_4_;
          fVar360 = auVar214._12_4_;
          auVar84._12_4_ = fVar360 * fVar293;
          fVar140 = auVar26._16_4_;
          fVar315 = auVar214._16_4_;
          auVar84._16_4_ = fVar315 * fVar140;
          fVar256 = auVar26._20_4_;
          fVar316 = auVar214._20_4_;
          auVar84._20_4_ = fVar316 * fVar256;
          fVar187 = auVar26._24_4_;
          fVar317 = auVar214._24_4_;
          uVar138 = auVar246._28_4_;
          auVar84._24_4_ = fVar317 * fVar187;
          auVar84._28_4_ = uVar138;
          auVar213 = vsubps_avx(auVar84,auVar83);
          fVar265 = auVar17._0_4_;
          fVar269 = auVar17._4_4_;
          auVar85._4_4_ = fVar356 * fVar269;
          auVar85._0_4_ = fVar300 * fVar265;
          fVar220 = auVar17._8_4_;
          auVar85._8_4_ = fVar312 * fVar220;
          fVar294 = auVar17._12_4_;
          auVar85._12_4_ = fVar360 * fVar294;
          fVar159 = auVar17._16_4_;
          auVar85._16_4_ = fVar315 * fVar159;
          fVar222 = auVar17._20_4_;
          auVar85._20_4_ = fVar316 * fVar222;
          fVar201 = auVar17._24_4_;
          auVar85._24_4_ = fVar317 * fVar201;
          auVar85._28_4_ = uVar138;
          fVar307 = auVar148._0_4_;
          fVar337 = auVar148._4_4_;
          auVar86._4_4_ = fVar267 * fVar337;
          auVar86._0_4_ = fVar259 * fVar307;
          fVar272 = auVar148._8_4_;
          auVar86._8_4_ = fVar339 * fVar272;
          fVar223 = auVar148._12_4_;
          auVar86._12_4_ = fVar349 * fVar223;
          fVar161 = auVar148._16_4_;
          auVar86._16_4_ = fVar273 * fVar161;
          fVar225 = auVar148._20_4_;
          auVar86._20_4_ = fVar275 * fVar225;
          fVar203 = auVar148._24_4_;
          auVar86._24_4_ = fVar277 * fVar203;
          auVar86._28_4_ = auVar352._28_4_;
          auVar246 = vsubps_avx(auVar86,auVar85);
          auVar87._4_4_ = fVar335 * fVar337;
          auVar87._0_4_ = fVar219 * fVar307;
          auVar87._8_4_ = fVar281 * fVar272;
          auVar87._12_4_ = fVar293 * fVar223;
          auVar87._16_4_ = fVar140 * fVar161;
          auVar87._20_4_ = fVar256 * fVar225;
          auVar87._24_4_ = fVar187 * fVar203;
          auVar87._28_4_ = uVar138;
          auVar88._4_4_ = fVar269 * fVar185;
          auVar88._0_4_ = fVar265 * fVar331;
          auVar88._8_4_ = fVar220 * fVar280;
          auVar88._12_4_ = fVar294 * fVar274;
          auVar88._16_4_ = fVar159 * fVar226;
          auVar88._20_4_ = fVar222 * fVar165;
          auVar88._24_4_ = fVar201 * fVar292;
          auVar88._28_4_ = auVar284._28_4_;
          auVar284 = vsubps_avx(auVar88,auVar87);
          auVar24 = vsubps_avx(auVar24,auVar18);
          fVar224 = auVar284._28_4_ + auVar246._28_4_;
          auVar321._0_4_ = auVar284._0_4_ + auVar246._0_4_ * 0.0 + auVar213._0_4_ * 0.0;
          auVar321._4_4_ = auVar284._4_4_ + auVar246._4_4_ * 0.0 + auVar213._4_4_ * 0.0;
          auVar321._8_4_ = auVar284._8_4_ + auVar246._8_4_ * 0.0 + auVar213._8_4_ * 0.0;
          auVar321._12_4_ = auVar284._12_4_ + auVar246._12_4_ * 0.0 + auVar213._12_4_ * 0.0;
          auVar321._16_4_ = auVar284._16_4_ + auVar246._16_4_ * 0.0 + auVar213._16_4_ * 0.0;
          auVar321._20_4_ = auVar284._20_4_ + auVar246._20_4_ * 0.0 + auVar213._20_4_ * 0.0;
          auVar321._24_4_ = auVar284._24_4_ + auVar246._24_4_ * 0.0 + auVar213._24_4_ * 0.0;
          auVar321._28_4_ = fVar224 + auVar213._28_4_;
          fVar332 = auVar31._0_4_;
          fVar336 = auVar31._4_4_;
          auVar89._4_4_ = auVar18._4_4_ * fVar336;
          auVar89._0_4_ = auVar18._0_4_ * fVar332;
          fVar289 = auVar31._8_4_;
          auVar89._8_4_ = auVar18._8_4_ * fVar289;
          fVar276 = auVar31._12_4_;
          auVar89._12_4_ = auVar18._12_4_ * fVar276;
          fVar186 = auVar31._16_4_;
          auVar89._16_4_ = auVar18._16_4_ * fVar186;
          fVar279 = auVar31._20_4_;
          auVar89._20_4_ = auVar18._20_4_ * fVar279;
          fVar205 = auVar31._24_4_;
          auVar89._24_4_ = auVar18._24_4_ * fVar205;
          auVar89._28_4_ = fVar224;
          fVar224 = auVar24._0_4_;
          fVar338 = auVar24._4_4_;
          auVar90._4_4_ = auVar32._4_4_ * fVar338;
          auVar90._0_4_ = auVar32._0_4_ * fVar224;
          fVar290 = auVar24._8_4_;
          auVar90._8_4_ = auVar32._8_4_ * fVar290;
          fVar295 = auVar24._12_4_;
          auVar90._12_4_ = auVar32._12_4_ * fVar295;
          fVar164 = auVar24._16_4_;
          auVar90._16_4_ = auVar32._16_4_ * fVar164;
          fVar288 = auVar24._20_4_;
          auVar90._20_4_ = auVar32._20_4_ * fVar288;
          fVar298 = auVar24._24_4_;
          auVar90._24_4_ = auVar32._24_4_ * fVar298;
          auVar90._28_4_ = auVar284._28_4_;
          auVar246 = vsubps_avx(auVar90,auVar89);
          auVar284 = vsubps_avx(auVar17,auVar25);
          fVar334 = auVar284._0_4_;
          fVar271 = auVar284._4_4_;
          auVar91._4_4_ = auVar18._4_4_ * fVar271;
          auVar91._0_4_ = auVar18._0_4_ * fVar334;
          fVar221 = auVar284._8_4_;
          auVar91._8_4_ = auVar18._8_4_ * fVar221;
          fVar296 = auVar284._12_4_;
          auVar91._12_4_ = auVar18._12_4_ * fVar296;
          fVar243 = auVar284._16_4_;
          auVar91._16_4_ = auVar18._16_4_ * fVar243;
          fVar291 = auVar284._20_4_;
          auVar91._20_4_ = auVar18._20_4_ * fVar291;
          fVar308 = auVar284._24_4_;
          auVar91._24_4_ = auVar18._24_4_ * fVar308;
          auVar91._28_4_ = auVar18._28_4_;
          auVar92._4_4_ = fVar338 * auVar25._4_4_;
          auVar92._0_4_ = fVar224 * auVar25._0_4_;
          auVar92._8_4_ = fVar290 * auVar25._8_4_;
          auVar92._12_4_ = fVar295 * auVar25._12_4_;
          auVar92._16_4_ = fVar164 * auVar25._16_4_;
          auVar92._20_4_ = fVar288 * auVar25._20_4_;
          auVar92._24_4_ = fVar298 * auVar25._24_4_;
          auVar92._28_4_ = auVar213._28_4_;
          auVar17 = vsubps_avx(auVar91,auVar92);
          auVar93._4_4_ = auVar32._4_4_ * fVar271;
          auVar93._0_4_ = auVar32._0_4_ * fVar334;
          auVar93._8_4_ = auVar32._8_4_ * fVar221;
          auVar93._12_4_ = auVar32._12_4_ * fVar296;
          auVar93._16_4_ = auVar32._16_4_ * fVar243;
          auVar93._20_4_ = auVar32._20_4_ * fVar291;
          auVar93._24_4_ = auVar32._24_4_ * fVar308;
          auVar93._28_4_ = auVar32._28_4_;
          auVar94._4_4_ = fVar336 * auVar25._4_4_;
          auVar94._0_4_ = fVar332 * auVar25._0_4_;
          auVar94._8_4_ = fVar289 * auVar25._8_4_;
          auVar94._12_4_ = fVar276 * auVar25._12_4_;
          auVar94._16_4_ = fVar186 * auVar25._16_4_;
          auVar94._20_4_ = fVar279 * auVar25._20_4_;
          auVar94._24_4_ = fVar205 * auVar25._24_4_;
          auVar94._28_4_ = auVar25._28_4_;
          auVar25 = vsubps_avx(auVar94,auVar93);
          auVar156._0_4_ = auVar246._0_4_ * 0.0 + auVar25._0_4_ + auVar17._0_4_ * 0.0;
          auVar156._4_4_ = auVar246._4_4_ * 0.0 + auVar25._4_4_ + auVar17._4_4_ * 0.0;
          auVar156._8_4_ = auVar246._8_4_ * 0.0 + auVar25._8_4_ + auVar17._8_4_ * 0.0;
          auVar156._12_4_ = auVar246._12_4_ * 0.0 + auVar25._12_4_ + auVar17._12_4_ * 0.0;
          auVar156._16_4_ = auVar246._16_4_ * 0.0 + auVar25._16_4_ + auVar17._16_4_ * 0.0;
          auVar156._20_4_ = auVar246._20_4_ * 0.0 + auVar25._20_4_ + auVar17._20_4_ * 0.0;
          auVar156._24_4_ = auVar246._24_4_ * 0.0 + auVar25._24_4_ + auVar17._24_4_ * 0.0;
          auVar156._28_4_ = auVar17._28_4_ + auVar25._28_4_ + auVar17._28_4_;
          auVar17 = vmaxps_avx(auVar321,auVar156);
          auVar17 = vcmpps_avx(auVar17,ZEXT1232(ZEXT412(0)) << 0x20,2);
          auVar239 = ZEXT3264(auVar153);
          auVar25 = auVar153 & auVar17;
          if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar25 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar25 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar25 >> 0x7f,0) == '\0') &&
                (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar25 >> 0xbf,0) == '\0') &&
              (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar25[0x1f]) {
LAB_0093aa3f:
            auVar179 = ZEXT3264(CONCAT824(uStack_508,
                                          CONCAT816(uStack_510,CONCAT88(uStack_518,local_520))));
            auVar287._4_4_ = fVar160;
            auVar287._0_4_ = fVar141;
            auVar287._8_4_ = fVar162;
            auVar287._12_4_ = fVar163;
            auVar287._16_4_ = fStack_810;
            auVar287._20_4_ = fStack_80c;
            auVar287._24_4_ = fStack_808;
            auVar287._28_4_ = fStack_804;
          }
          else {
            auVar25 = vandps_avx(auVar17,auVar153);
            auVar95._4_4_ = fVar338 * fVar185;
            auVar95._0_4_ = fVar224 * fVar331;
            auVar95._8_4_ = fVar290 * fVar280;
            auVar95._12_4_ = fVar295 * fVar274;
            auVar95._16_4_ = fVar164 * fVar226;
            auVar95._20_4_ = fVar288 * fVar165;
            auVar95._24_4_ = fVar298 * fVar292;
            auVar95._28_4_ = auVar153._28_4_;
            auVar96._4_4_ = fVar336 * fVar356;
            auVar96._0_4_ = fVar332 * fVar300;
            auVar96._8_4_ = fVar289 * fVar312;
            auVar96._12_4_ = fVar276 * fVar360;
            auVar96._16_4_ = fVar186 * fVar315;
            auVar96._20_4_ = fVar279 * fVar316;
            auVar96._24_4_ = fVar205 * fVar317;
            auVar96._28_4_ = auVar17._28_4_;
            auVar17 = vsubps_avx(auVar96,auVar95);
            auVar97._4_4_ = fVar271 * fVar356;
            auVar97._0_4_ = fVar334 * fVar300;
            auVar97._8_4_ = fVar221 * fVar312;
            auVar97._12_4_ = fVar296 * fVar360;
            auVar97._16_4_ = fVar243 * fVar315;
            auVar97._20_4_ = fVar291 * fVar316;
            auVar97._24_4_ = fVar308 * fVar317;
            auVar97._28_4_ = auVar214._28_4_;
            auVar98._4_4_ = fVar338 * fVar337;
            auVar98._0_4_ = fVar224 * fVar307;
            auVar98._8_4_ = fVar290 * fVar272;
            auVar98._12_4_ = fVar295 * fVar223;
            auVar98._16_4_ = fVar164 * fVar161;
            auVar98._20_4_ = fVar288 * fVar225;
            auVar98._24_4_ = fVar298 * fVar203;
            auVar98._28_4_ = auVar24._28_4_;
            auVar32 = vsubps_avx(auVar98,auVar97);
            auVar99._4_4_ = fVar336 * fVar337;
            auVar99._0_4_ = fVar332 * fVar307;
            auVar99._8_4_ = fVar289 * fVar272;
            auVar99._12_4_ = fVar276 * fVar223;
            auVar99._16_4_ = fVar186 * fVar161;
            auVar99._20_4_ = fVar279 * fVar225;
            auVar99._24_4_ = fVar205 * fVar203;
            auVar99._28_4_ = auVar148._28_4_;
            auVar100._4_4_ = fVar271 * fVar185;
            auVar100._0_4_ = fVar334 * fVar331;
            auVar100._8_4_ = fVar221 * fVar280;
            auVar100._12_4_ = fVar296 * fVar274;
            auVar100._16_4_ = fVar243 * fVar226;
            auVar100._20_4_ = fVar291 * fVar165;
            auVar100._24_4_ = fVar308 * fVar292;
            auVar100._28_4_ = auVar327._28_4_;
            auVar18 = vsubps_avx(auVar100,auVar99);
            auVar286._0_4_ = auVar17._0_4_ * 0.0 + auVar18._0_4_ + auVar32._0_4_ * 0.0;
            auVar286._4_4_ = auVar17._4_4_ * 0.0 + auVar18._4_4_ + auVar32._4_4_ * 0.0;
            auVar286._8_4_ = auVar17._8_4_ * 0.0 + auVar18._8_4_ + auVar32._8_4_ * 0.0;
            auVar286._12_4_ = auVar17._12_4_ * 0.0 + auVar18._12_4_ + auVar32._12_4_ * 0.0;
            auVar286._16_4_ = auVar17._16_4_ * 0.0 + auVar18._16_4_ + auVar32._16_4_ * 0.0;
            auVar286._20_4_ = auVar17._20_4_ * 0.0 + auVar18._20_4_ + auVar32._20_4_ * 0.0;
            auVar286._24_4_ = auVar17._24_4_ * 0.0 + auVar18._24_4_ + auVar32._24_4_ * 0.0;
            auVar286._28_4_ = auVar31._28_4_ + auVar18._28_4_ + auVar148._28_4_;
            auVar153 = vrcpps_avx(auVar286);
            fVar331 = auVar153._0_4_;
            fVar307 = auVar153._4_4_;
            auVar101._4_4_ = auVar286._4_4_ * fVar307;
            auVar101._0_4_ = auVar286._0_4_ * fVar331;
            fVar332 = auVar153._8_4_;
            auVar101._8_4_ = auVar286._8_4_ * fVar332;
            fVar224 = auVar153._12_4_;
            auVar101._12_4_ = auVar286._12_4_ * fVar224;
            fVar334 = auVar153._16_4_;
            auVar101._16_4_ = auVar286._16_4_ * fVar334;
            fVar185 = auVar153._20_4_;
            auVar101._20_4_ = auVar286._20_4_ * fVar185;
            fVar337 = auVar153._24_4_;
            auVar101._24_4_ = auVar286._24_4_ * fVar337;
            auVar101._28_4_ = auVar24._28_4_;
            auVar347._8_4_ = 0x3f800000;
            auVar347._0_8_ = 0x3f8000003f800000;
            auVar347._12_4_ = 0x3f800000;
            auVar347._16_4_ = 0x3f800000;
            auVar347._20_4_ = 0x3f800000;
            auVar347._24_4_ = 0x3f800000;
            auVar347._28_4_ = 0x3f800000;
            auVar153 = vsubps_avx(auVar347,auVar101);
            fVar331 = auVar153._0_4_ * fVar331 + fVar331;
            fVar307 = auVar153._4_4_ * fVar307 + fVar307;
            fVar332 = auVar153._8_4_ * fVar332 + fVar332;
            fVar224 = auVar153._12_4_ * fVar224 + fVar224;
            fVar334 = auVar153._16_4_ * fVar334 + fVar334;
            fVar185 = auVar153._20_4_ * fVar185 + fVar185;
            fVar337 = auVar153._24_4_ * fVar337 + fVar337;
            auVar102._4_4_ =
                 (fVar269 * auVar17._4_4_ + auVar32._4_4_ * fVar335 + fVar267 * auVar18._4_4_) *
                 fVar307;
            auVar102._0_4_ =
                 (fVar265 * auVar17._0_4_ + auVar32._0_4_ * fVar219 + fVar259 * auVar18._0_4_) *
                 fVar331;
            auVar102._8_4_ =
                 (fVar220 * auVar17._8_4_ + auVar32._8_4_ * fVar281 + fVar339 * auVar18._8_4_) *
                 fVar332;
            auVar102._12_4_ =
                 (fVar294 * auVar17._12_4_ + auVar32._12_4_ * fVar293 + fVar349 * auVar18._12_4_) *
                 fVar224;
            auVar102._16_4_ =
                 (fVar159 * auVar17._16_4_ + auVar32._16_4_ * fVar140 + fVar273 * auVar18._16_4_) *
                 fVar334;
            auVar102._20_4_ =
                 (fVar222 * auVar17._20_4_ + auVar32._20_4_ * fVar256 + fVar275 * auVar18._20_4_) *
                 fVar185;
            auVar102._24_4_ =
                 (fVar201 * auVar17._24_4_ + auVar32._24_4_ * fVar187 + fVar277 * auVar18._24_4_) *
                 fVar337;
            auVar102._28_4_ = auVar26._28_4_ + auVar18._28_4_;
            uVar138 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar218._4_4_ = uVar138;
            auVar218._0_4_ = uVar138;
            auVar218._8_4_ = uVar138;
            auVar218._12_4_ = uVar138;
            auVar218._16_4_ = uVar138;
            auVar218._20_4_ = uVar138;
            auVar218._24_4_ = uVar138;
            auVar218._28_4_ = uVar138;
            auVar17 = vcmpps_avx(local_300,auVar102,2);
            auVar239 = ZEXT3264(auVar17);
            auVar153 = vcmpps_avx(auVar102,auVar218,2);
            auVar153 = vandps_avx(auVar17,auVar153);
            auVar26 = auVar25 & auVar153;
            if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar26 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar26 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar26 >> 0x7f,0) == '\0') &&
                  (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar26 >> 0xbf,0) == '\0') &&
                (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar26[0x1f]) goto LAB_0093aa3f;
            auVar153 = vandps_avx(auVar25,auVar153);
            auVar26 = vcmpps_avx(auVar286,ZEXT1232(ZEXT412(0)) << 0x20,4);
            auVar24 = auVar153 & auVar26;
            auVar179 = ZEXT3264(CONCAT824(uStack_508,
                                          CONCAT816(uStack_510,CONCAT88(uStack_518,local_520))));
            auVar287._4_4_ = fVar160;
            auVar287._0_4_ = fVar141;
            auVar287._8_4_ = fVar162;
            auVar287._12_4_ = fVar163;
            auVar287._16_4_ = fStack_810;
            auVar287._20_4_ = fStack_80c;
            auVar287._24_4_ = fStack_808;
            auVar287._28_4_ = fStack_804;
            if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar24 >> 0x7f,0) != '\0') ||
                  (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar24 >> 0xbf,0) != '\0') ||
                (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar24[0x1f] < '\0') {
              auVar153 = vandps_avx(auVar26,auVar153);
              auVar179 = ZEXT3264(auVar153);
              auVar103._4_4_ = auVar321._4_4_ * fVar307;
              auVar103._0_4_ = auVar321._0_4_ * fVar331;
              auVar103._8_4_ = auVar321._8_4_ * fVar332;
              auVar103._12_4_ = auVar321._12_4_ * fVar224;
              auVar103._16_4_ = auVar321._16_4_ * fVar334;
              auVar103._20_4_ = auVar321._20_4_ * fVar185;
              auVar103._24_4_ = auVar321._24_4_ * fVar337;
              auVar103._28_4_ = auVar17._28_4_;
              auVar239 = ZEXT3264(auVar103);
              auVar104._4_4_ = auVar156._4_4_ * fVar307;
              auVar104._0_4_ = auVar156._0_4_ * fVar331;
              auVar104._8_4_ = auVar156._8_4_ * fVar332;
              auVar104._12_4_ = auVar156._12_4_ * fVar224;
              auVar104._16_4_ = auVar156._16_4_ * fVar334;
              auVar104._20_4_ = auVar156._20_4_ * fVar185;
              auVar104._24_4_ = auVar156._24_4_ * fVar337;
              auVar104._28_4_ = auVar156._28_4_;
              auVar255._8_4_ = 0x3f800000;
              auVar255._0_8_ = 0x3f8000003f800000;
              auVar255._12_4_ = 0x3f800000;
              auVar255._16_4_ = 0x3f800000;
              auVar255._20_4_ = 0x3f800000;
              auVar255._24_4_ = 0x3f800000;
              auVar255._28_4_ = 0x3f800000;
              auVar153 = vsubps_avx(auVar255,auVar103);
              local_500 = vblendvps_avx(auVar153,auVar103,auVar234);
              auVar153 = vsubps_avx(auVar255,auVar104);
              _local_360 = vblendvps_avx(auVar153,auVar104,auVar234);
              local_4c0 = auVar102;
            }
          }
          auVar348 = ZEXT3264(local_7c0);
          auVar153 = auVar179._0_32_;
          auVar322 = ZEXT3264(_local_800);
          if ((((((((auVar153 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar153 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar153 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar153 >> 0x7f,0) != '\0') ||
                (auVar179 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
               SUB321(auVar153 >> 0xbf,0) != '\0') ||
              (auVar179 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
              auVar179[0x1f] < '\0') {
            auVar17 = vsubps_avx(auVar328,auVar287);
            auVar239 = ZEXT3264(local_500);
            fVar219 = auVar287._0_4_ + auVar17._0_4_ * local_500._0_4_;
            fVar265 = auVar287._4_4_ + auVar17._4_4_ * local_500._4_4_;
            fVar307 = auVar287._8_4_ + auVar17._8_4_ * local_500._8_4_;
            fVar332 = auVar287._12_4_ + auVar17._12_4_ * local_500._12_4_;
            fVar224 = auVar287._16_4_ + auVar17._16_4_ * local_500._16_4_;
            fVar334 = auVar287._20_4_ + auVar17._20_4_ * local_500._20_4_;
            fVar185 = auVar287._24_4_ + auVar17._24_4_ * local_500._24_4_;
            fVar335 = auVar287._28_4_ + auVar17._28_4_;
            fVar331 = *(float *)((long)local_688->ray_space + k * 4 + -0x10);
            auVar105._4_4_ = (fVar265 + fVar265) * fVar331;
            auVar105._0_4_ = (fVar219 + fVar219) * fVar331;
            auVar105._8_4_ = (fVar307 + fVar307) * fVar331;
            auVar105._12_4_ = (fVar332 + fVar332) * fVar331;
            auVar105._16_4_ = (fVar224 + fVar224) * fVar331;
            auVar105._20_4_ = (fVar334 + fVar334) * fVar331;
            auVar105._24_4_ = (fVar185 + fVar185) * fVar331;
            auVar105._28_4_ = fVar335 + fVar335;
            auVar17 = vcmpps_avx(local_4c0,auVar105,6);
            auVar26 = auVar153 & auVar17;
            if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar26 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar26 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar26 >> 0x7f,0) == '\0') &&
                  (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar26 >> 0xbf,0) == '\0') &&
                (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar26[0x1f]) {
              auVar179 = ZEXT3264(local_500);
              goto LAB_0093a74c;
            }
            local_360._0_4_ = (float)local_360._0_4_ + (float)local_360._0_4_ + -1.0;
            local_360._4_4_ = (float)local_360._4_4_ + (float)local_360._4_4_ + -1.0;
            uStack_358._0_4_ = (float)uStack_358 + (float)uStack_358 + -1.0;
            uStack_358._4_4_ = uStack_358._4_4_ + uStack_358._4_4_ + -1.0;
            uStack_350._0_4_ = (float)uStack_350 + (float)uStack_350 + -1.0;
            uStack_350._4_4_ = uStack_350._4_4_ + uStack_350._4_4_ + -1.0;
            uStack_348._0_4_ = (float)uStack_348 + (float)uStack_348 + -1.0;
            uStack_348._4_4_ = uStack_348._4_4_ + uStack_348._4_4_ + -1.0;
            local_2a0 = local_500;
            auVar128 = _local_360;
            auVar26 = _local_360;
            local_280 = (float)local_360._0_4_;
            fStack_27c = (float)local_360._4_4_;
            fStack_278 = (float)uStack_358;
            fStack_274 = uStack_358._4_4_;
            fStack_270 = (float)uStack_350;
            fStack_26c = uStack_350._4_4_;
            fStack_268 = (float)uStack_348;
            fStack_264 = uStack_348._4_4_;
            local_260 = local_4c0;
            local_23c = uVar136;
            local_230 = auVar262._0_8_;
            uStack_228 = uStack_838;
            local_220 = local_760;
            uStack_218 = uStack_758;
            local_210 = local_770;
            uStack_208 = uStack_768;
            local_200 = local_780;
            uStack_1f8 = uStack_778;
            pGVar11 = (context->scene->geometries).items[local_6a0].ptr;
            _local_360 = auVar26;
            if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              local_560 = vandps_avx(auVar17,auVar153);
              auVar194._0_4_ = (float)(int)local_240;
              auVar194._4_12_ = auVar284._4_12_;
              auVar170 = vshufps_avx(auVar194,auVar194,0);
              local_1c0[0] = (auVar170._0_4_ + local_500._0_4_ + 0.0) * (float)local_120._0_4_;
              local_1c0[1] = (auVar170._4_4_ + local_500._4_4_ + 1.0) * (float)local_120._4_4_;
              local_1c0[2] = (auVar170._8_4_ + local_500._8_4_ + 2.0) * fStack_118;
              local_1c0[3] = (auVar170._12_4_ + local_500._12_4_ + 3.0) * fStack_114;
              fStack_1b0 = (auVar170._0_4_ + local_500._16_4_ + 4.0) * fStack_110;
              fStack_1ac = (auVar170._4_4_ + local_500._20_4_ + 5.0) * fStack_10c;
              fStack_1a8 = (auVar170._8_4_ + local_500._24_4_ + 6.0) * fStack_108;
              fStack_1a4 = auVar170._12_4_ + local_500._28_4_ + 7.0;
              uStack_350 = auVar128._16_8_;
              uStack_348 = auVar26._24_8_;
              local_1a0 = local_360;
              uStack_198 = uStack_358;
              uStack_190 = uStack_350;
              uStack_188 = uStack_348;
              local_180 = local_4c0;
              auVar176._8_4_ = 0x7f800000;
              auVar176._0_8_ = 0x7f8000007f800000;
              auVar176._12_4_ = 0x7f800000;
              auVar176._16_4_ = 0x7f800000;
              auVar176._20_4_ = 0x7f800000;
              auVar176._24_4_ = 0x7f800000;
              auVar176._28_4_ = 0x7f800000;
              auVar153 = vblendvps_avx(auVar176,local_4c0,local_560);
              auVar17 = vshufps_avx(auVar153,auVar153,0xb1);
              auVar17 = vminps_avx(auVar153,auVar17);
              auVar26 = vshufpd_avx(auVar17,auVar17,5);
              auVar17 = vminps_avx(auVar17,auVar26);
              auVar26 = vperm2f128_avx(auVar17,auVar17,1);
              auVar17 = vminps_avx(auVar17,auVar26);
              auVar17 = vcmpps_avx(auVar153,auVar17,0);
              auVar26 = local_560 & auVar17;
              auVar153 = local_560;
              if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar26 >> 0x7f,0) != '\0') ||
                    (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar26 >> 0xbf,0) != '\0') ||
                  (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar26[0x1f] < '\0') {
                auVar153 = vandps_avx(auVar17,local_560);
              }
              uVar130 = vmovmskps_avx(auVar153);
              uVar132 = 0;
              if (uVar130 != 0) {
                for (; (uVar130 >> uVar132 & 1) == 0; uVar132 = uVar132 + 1) {
                }
              }
              uVar133 = (ulong)uVar132;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar323 = local_1c0[uVar133];
                fVar333 = 1.0 - fVar323;
                fVar331 = fVar323 * 3.0;
                fVar330 = (fVar323 + fVar323) * (fVar331 + -5.0) + fVar323 * fVar331;
                auVar239 = ZEXT464((uint)fVar330);
                auVar170 = ZEXT416((uint)((fVar333 * -2.0 * fVar323 + fVar323 * fVar323) * 0.5));
                auVar170 = vshufps_avx(auVar170,auVar170,0);
                auVar195 = ZEXT416((uint)(((fVar333 + fVar333) * (fVar331 + 2.0) +
                                          fVar333 * fVar333 * -3.0) * 0.5));
                auVar195 = vshufps_avx(auVar195,auVar195,0);
                auVar196 = ZEXT416((uint)(fVar330 * 0.5));
                auVar196 = vshufps_avx(auVar196,auVar196,0);
                uVar138 = *(undefined4 *)((long)&local_1a0 + uVar133 * 4);
                auVar212 = ZEXT416((uint)((fVar323 * (fVar333 + fVar333) - fVar333 * fVar333) * 0.5)
                                  );
                auVar212 = vshufps_avx(auVar212,auVar212,0);
                auVar171._0_4_ =
                     auVar212._0_4_ * fVar258 +
                     auVar196._0_4_ * (float)local_760._0_4_ +
                     auVar170._0_4_ * (float)local_780._0_4_ +
                     auVar195._0_4_ * (float)local_770._0_4_;
                auVar171._4_4_ =
                     auVar212._4_4_ * fVar266 +
                     auVar196._4_4_ * (float)local_760._4_4_ +
                     auVar170._4_4_ * (float)local_780._4_4_ +
                     auVar195._4_4_ * (float)local_770._4_4_;
                auVar171._8_4_ =
                     auVar212._8_4_ * auVar262._8_4_ +
                     auVar196._8_4_ * (float)uStack_758 +
                     auVar170._8_4_ * (float)uStack_778 + auVar195._8_4_ * (float)uStack_768;
                auVar171._12_4_ =
                     auVar212._12_4_ * auVar262._12_4_ +
                     auVar196._12_4_ * uStack_758._4_4_ +
                     auVar170._12_4_ * uStack_778._4_4_ + auVar195._12_4_ * uStack_768._4_4_;
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_180 + uVar133 * 4);
                *(float *)(ray + k * 4 + 0xc0) = auVar171._0_4_;
                uVar10 = vextractps_avx(auVar171,1);
                *(undefined4 *)(ray + k * 4 + 0xd0) = uVar10;
                uVar10 = vextractps_avx(auVar171,2);
                *(undefined4 *)(ray + k * 4 + 0xe0) = uVar10;
                *(float *)(ray + k * 4 + 0xf0) = fVar323;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar138;
                *(int *)(ray + k * 4 + 0x110) = SUB84(auVar139,0);
                *(int *)(ray + k * 4 + 0x120) = (int)local_6a0;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              }
              else {
                stack0xfffffffffffff908 = auVar247._8_24_;
                local_6e0._0_4_ = uVar136;
                local_720 = auVar139;
                auVar170 = *local_690;
                local_820 = *(uint *)(ray + k * 4 + 0x80);
                uStack_81c = 0;
                uStack_818 = 0;
                uStack_814 = 0;
                _local_680 = auVar328;
                _local_620 = auVar200;
                while( true ) {
                  local_3c0 = local_1c0[uVar133];
                  local_3b0 = *(undefined4 *)((long)&local_1a0 + uVar133 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_180 + uVar133 * 4);
                  fVar330 = 1.0 - local_3c0;
                  fVar331 = local_3c0 * (fVar330 + fVar330) - fVar330 * fVar330;
                  auVar239 = ZEXT464((uint)fVar331);
                  fVar323 = local_3c0 * 3.0;
                  auVar195 = ZEXT416((uint)((fVar330 * -2.0 * local_3c0 + local_3c0 * local_3c0) *
                                           0.5));
                  auVar195 = vshufps_avx(auVar195,auVar195,0);
                  auVar196 = ZEXT416((uint)(((fVar330 + fVar330) * (fVar323 + 2.0) +
                                            fVar330 * fVar330 * -3.0) * 0.5));
                  auVar196 = vshufps_avx(auVar196,auVar196,0);
                  auVar212 = ZEXT416((uint)(((local_3c0 + local_3c0) * (fVar323 + -5.0) +
                                            local_3c0 * fVar323) * 0.5));
                  auVar212 = vshufps_avx(auVar212,auVar212,0);
                  local_750.context = context->user;
                  auVar233 = vshufps_avx(ZEXT416((uint)(fVar331 * 0.5)),
                                         ZEXT416((uint)(fVar331 * 0.5)),0);
                  auVar197._0_4_ =
                       auVar233._0_4_ * fVar258 +
                       auVar212._0_4_ * (float)local_760._0_4_ +
                       auVar195._0_4_ * (float)local_780._0_4_ +
                       auVar196._0_4_ * (float)local_770._0_4_;
                  auVar197._4_4_ =
                       auVar233._4_4_ * fVar266 +
                       auVar212._4_4_ * (float)local_760._4_4_ +
                       auVar195._4_4_ * (float)local_780._4_4_ +
                       auVar196._4_4_ * (float)local_770._4_4_;
                  auVar197._8_4_ =
                       auVar233._8_4_ * auVar262._8_4_ +
                       auVar212._8_4_ * (float)uStack_758 +
                       auVar195._8_4_ * (float)uStack_778 + auVar196._8_4_ * (float)uStack_768;
                  auVar197._12_4_ =
                       auVar233._12_4_ * auVar262._12_4_ +
                       auVar212._12_4_ * uStack_758._4_4_ +
                       auVar195._12_4_ * uStack_778._4_4_ + auVar196._12_4_ * uStack_768._4_4_;
                  auVar195 = vshufps_avx(auVar197,auVar197,0);
                  local_3f0[0] = (RTCHitN)auVar195[0];
                  local_3f0[1] = (RTCHitN)auVar195[1];
                  local_3f0[2] = (RTCHitN)auVar195[2];
                  local_3f0[3] = (RTCHitN)auVar195[3];
                  local_3f0[4] = (RTCHitN)auVar195[4];
                  local_3f0[5] = (RTCHitN)auVar195[5];
                  local_3f0[6] = (RTCHitN)auVar195[6];
                  local_3f0[7] = (RTCHitN)auVar195[7];
                  local_3f0[8] = (RTCHitN)auVar195[8];
                  local_3f0[9] = (RTCHitN)auVar195[9];
                  local_3f0[10] = (RTCHitN)auVar195[10];
                  local_3f0[0xb] = (RTCHitN)auVar195[0xb];
                  local_3f0[0xc] = (RTCHitN)auVar195[0xc];
                  local_3f0[0xd] = (RTCHitN)auVar195[0xd];
                  local_3f0[0xe] = (RTCHitN)auVar195[0xe];
                  local_3f0[0xf] = (RTCHitN)auVar195[0xf];
                  auVar195 = vshufps_avx(auVar197,auVar197,0x55);
                  local_3e0 = auVar195;
                  local_3d0 = vshufps_avx(auVar197,auVar197,0xaa);
                  fStack_3bc = local_3c0;
                  fStack_3b8 = local_3c0;
                  fStack_3b4 = local_3c0;
                  uStack_3ac = local_3b0;
                  uStack_3a8 = local_3b0;
                  uStack_3a4 = local_3b0;
                  local_3a0 = local_5d0._0_8_;
                  uStack_398 = local_5d0._8_8_;
                  local_390 = local_320._0_16_;
                  vcmpps_avx(ZEXT1632(local_320._0_16_),ZEXT1632(local_320._0_16_),0xf);
                  uStack_37c = (local_750.context)->instID[0];
                  local_380 = uStack_37c;
                  uStack_378 = uStack_37c;
                  uStack_374 = uStack_37c;
                  uStack_370 = (local_750.context)->instPrimID[0];
                  uStack_36c = uStack_370;
                  uStack_368 = uStack_370;
                  uStack_364 = uStack_370;
                  local_750.valid = (int *)local_830;
                  local_750.geometryUserPtr = pGVar11->userPtr;
                  local_750.hit = local_3f0;
                  local_750.N = 4;
                  local_830 = auVar170;
                  local_750.ray = (RTCRayN *)ray;
                  if (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar239 = ZEXT464((uint)fVar331);
                    (*pGVar11->intersectionFilterN)(&local_750);
                  }
                  if (local_830 == (undefined1  [16])0x0) {
                    auVar195 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                    auVar195 = auVar195 ^ _DAT_01f46b70;
                  }
                  else {
                    p_Var14 = context->args->filter;
                    if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar239 = ZEXT1664(auVar239._0_16_);
                      (*p_Var14)(&local_750);
                    }
                    auVar196 = vpcmpeqd_avx(local_830,_DAT_01f45a50);
                    auVar212 = vpcmpeqd_avx(auVar195,auVar195);
                    auVar195 = auVar196 ^ auVar212;
                    if (local_830 != (undefined1  [16])0x0) {
                      auVar196 = auVar196 ^ auVar212;
                      auVar212 = vmaskmovps_avx(auVar196,*(undefined1 (*) [16])local_750.hit);
                      *(undefined1 (*) [16])(local_750.ray + 0xc0) = auVar212;
                      auVar212 = vmaskmovps_avx(auVar196,*(undefined1 (*) [16])
                                                          (local_750.hit + 0x10));
                      *(undefined1 (*) [16])(local_750.ray + 0xd0) = auVar212;
                      auVar212 = vmaskmovps_avx(auVar196,*(undefined1 (*) [16])
                                                          (local_750.hit + 0x20));
                      *(undefined1 (*) [16])(local_750.ray + 0xe0) = auVar212;
                      auVar212 = vmaskmovps_avx(auVar196,*(undefined1 (*) [16])
                                                          (local_750.hit + 0x30));
                      *(undefined1 (*) [16])(local_750.ray + 0xf0) = auVar212;
                      auVar212 = vmaskmovps_avx(auVar196,*(undefined1 (*) [16])
                                                          (local_750.hit + 0x40));
                      *(undefined1 (*) [16])(local_750.ray + 0x100) = auVar212;
                      auVar212 = vmaskmovps_avx(auVar196,*(undefined1 (*) [16])
                                                          (local_750.hit + 0x50));
                      *(undefined1 (*) [16])(local_750.ray + 0x110) = auVar212;
                      auVar212 = vmaskmovps_avx(auVar196,*(undefined1 (*) [16])
                                                          (local_750.hit + 0x60));
                      *(undefined1 (*) [16])(local_750.ray + 0x120) = auVar212;
                      auVar212 = vmaskmovps_avx(auVar196,*(undefined1 (*) [16])
                                                          (local_750.hit + 0x70));
                      *(undefined1 (*) [16])(local_750.ray + 0x130) = auVar212;
                      auVar196 = vmaskmovps_avx(auVar196,*(undefined1 (*) [16])
                                                          (local_750.hit + 0x80));
                      *(undefined1 (*) [16])(local_750.ray + 0x140) = auVar196;
                    }
                  }
                  auVar153 = local_4c0;
                  auVar172._8_8_ = 0x100000001;
                  auVar172._0_8_ = 0x100000001;
                  if ((auVar172 & auVar195) == (undefined1  [16])0x0) {
                    auVar147._4_4_ = uStack_81c;
                    auVar147._0_4_ = local_820;
                    auVar147._8_4_ = uStack_818;
                    auVar147._12_4_ = uStack_814;
                    *(uint *)(ray + k * 4 + 0x80) = local_820;
                  }
                  else {
                    auVar147 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                  }
                  *(undefined4 *)(local_560 + uVar133 * 4) = 0;
                  local_820 = auVar147._0_4_;
                  uStack_81c = auVar147._4_4_;
                  uStack_818 = auVar147._8_4_;
                  uStack_814 = auVar147._12_4_;
                  auVar195 = vshufps_avx(auVar147,auVar147,0);
                  auVar157._16_16_ = auVar195;
                  auVar157._0_16_ = auVar195;
                  auVar26 = vcmpps_avx(auVar153,auVar157,2);
                  auVar17 = vandps_avx(auVar26,local_560);
                  local_560 = local_560 & auVar26;
                  if ((((((((local_560 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (local_560 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (local_560 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(local_560 >> 0x7f,0) == '\0') &&
                        (local_560 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(local_560 >> 0xbf,0) == '\0') &&
                      (local_560 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < local_560[0x1f]) break;
                  auVar177._8_4_ = 0x7f800000;
                  auVar177._0_8_ = 0x7f8000007f800000;
                  auVar177._12_4_ = 0x7f800000;
                  auVar177._16_4_ = 0x7f800000;
                  auVar177._20_4_ = 0x7f800000;
                  auVar177._24_4_ = 0x7f800000;
                  auVar177._28_4_ = 0x7f800000;
                  auVar153 = vblendvps_avx(auVar177,auVar153,auVar17);
                  auVar26 = vshufps_avx(auVar153,auVar153,0xb1);
                  auVar26 = vminps_avx(auVar153,auVar26);
                  auVar24 = vshufpd_avx(auVar26,auVar26,5);
                  auVar26 = vminps_avx(auVar26,auVar24);
                  auVar24 = vperm2f128_avx(auVar26,auVar26,1);
                  auVar26 = vminps_avx(auVar26,auVar24);
                  auVar26 = vcmpps_avx(auVar153,auVar26,0);
                  auVar24 = auVar17 & auVar26;
                  auVar153 = auVar17;
                  if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar24 >> 0x7f,0) != '\0') ||
                        (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar24 >> 0xbf,0) != '\0') ||
                      (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar24[0x1f] < '\0') {
                    auVar153 = vandps_avx(auVar26,auVar17);
                  }
                  uVar130 = vmovmskps_avx(auVar153);
                  uVar132 = 0;
                  if (uVar130 != 0) {
                    for (; (uVar130 >> uVar132 & 1) == 0; uVar132 = uVar132 + 1) {
                    }
                  }
                  uVar133 = (ulong)uVar132;
                  local_560 = auVar17;
                }
                auVar348 = ZEXT3264(local_7c0);
                auVar322 = ZEXT3264(_local_800);
                auVar139 = local_720;
                uVar136 = local_6e0._0_4_;
              }
            }
          }
          auVar179 = ZEXT3264(local_500);
          fVar323 = (float)local_660._0_4_;
          fVar166 = (float)local_660._4_4_;
          fVar257 = fStack_658;
          fVar297 = fStack_654;
          fVar330 = fStack_650;
          fVar333 = fStack_64c;
          fVar181 = fStack_648;
          fVar183 = fStack_644;
          fVar367 = (float)local_7a0._0_4_;
          fVar372 = (float)local_7a0._4_4_;
          fVar373 = fStack_798;
          fVar374 = fStack_794;
          fVar268 = fStack_790;
          fVar270 = fStack_78c;
          fVar310 = fStack_788;
          fVar188 = (float)local_6c0._0_4_;
          fVar202 = (float)local_6c0._4_4_;
          fVar204 = fStack_6b8;
          fVar206 = fStack_6b4;
          fVar313 = fStack_6b0;
          fVar364 = fStack_6ac;
          fVar365 = fStack_6a8;
        }
LAB_0093a74c:
      }
    }
    uVar138 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar145._4_4_ = uVar138;
    auVar145._0_4_ = uVar138;
    auVar145._8_4_ = uVar138;
    auVar145._12_4_ = uVar138;
    auVar170 = vcmpps_avx(local_2b0,auVar145,2);
    uVar132 = vmovmskps_avx(auVar170);
    uVar131 = (ulong)((uint)uVar131 & (uint)uVar131 + 0xf & uVar132);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }